

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Primitive PVar29;
  Geometry *pGVar30;
  __int_type_conflict _Var31;
  long lVar32;
  long lVar33;
  RTCFilterFunctionN p_Var34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  uint uVar91;
  uint uVar92;
  ulong uVar93;
  undefined1 (*pauVar94) [32];
  uint uVar95;
  uint uVar96;
  uint uVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  int iVar101;
  ulong uVar102;
  float fVar103;
  float fVar134;
  float fVar138;
  __m128 a;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar107;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar108;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar145;
  float fVar148;
  float fVar151;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar135;
  float fVar139;
  float fVar142;
  float fVar143;
  float fVar154;
  undefined1 auVar125 [32];
  float fVar136;
  float fVar137;
  float fVar140;
  float fVar141;
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar152;
  float fVar153;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar111 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar155;
  float fVar182;
  float fVar184;
  undefined1 auVar157 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar170 [32];
  undefined1 auVar158 [16];
  float fVar186;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar187;
  undefined1 auVar159 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar188;
  undefined1 auVar173 [32];
  float fVar156;
  float fVar183;
  float fVar185;
  float fVar189;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  float fVar211;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar196 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar212;
  float fVar239;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [28];
  float fVar238;
  float fVar240;
  float fVar241;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar242;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar243;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar266;
  float fVar285;
  float fVar287;
  undefined1 auVar267 [16];
  float fVar290;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar293;
  float fVar296;
  float fVar299;
  undefined1 auVar273 [32];
  float fVar288;
  float fVar291;
  float fVar294;
  float fVar297;
  float fVar300;
  undefined1 auVar274 [32];
  float fVar302;
  undefined1 auVar275 [32];
  float fVar286;
  float fVar289;
  float fVar292;
  float fVar295;
  float fVar298;
  float fVar301;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar303;
  float fVar304;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar309 [28];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar318;
  float fVar320;
  float fVar324;
  float fVar326;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  float fVar322;
  float fVar328;
  undefined1 auVar312 [32];
  float fVar319;
  undefined1 auVar313 [32];
  float fVar321;
  float fVar323;
  float fVar325;
  float fVar327;
  float fVar329;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [64];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float fVar356;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [64];
  undefined1 auVar357 [16];
  undefined1 auVar358 [28];
  float fVar366;
  float fVar367;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar365;
  float fVar368;
  undefined1 auVar364 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [64];
  float fVar378;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  float fVar393;
  undefined1 auVar384 [32];
  float fVar394;
  undefined1 auVar385 [32];
  undefined1 auVar386 [64];
  float fVar395;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  float in_register_0000151c;
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  float fVar409;
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [64];
  float fVar410;
  float fVar411;
  float fVar415;
  float fVar417;
  float fVar419;
  float fVar421;
  float fVar423;
  float fVar424;
  float fVar426;
  float fVar427;
  float fVar429;
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  float fVar416;
  float fVar418;
  float fVar420;
  float fVar422;
  float fVar425;
  float fVar428;
  float fVar430;
  undefined1 auVar414 [32];
  float in_register_0000159c;
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [64];
  undefined1 auVar435 [32];
  float in_register_000015dc;
  undefined1 auVar436 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_aec;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_a94;
  RTCFilterFunctionNArguments local_a78;
  int local_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 auStack_930 [16];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined8 local_8b0;
  float local_8a8;
  float local_8a4;
  undefined4 local_8a0;
  uint local_89c;
  uint local_898;
  uint local_894;
  uint local_890;
  undefined8 local_880;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  undefined1 auStack_810 [16];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_730 [16];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_450 [16];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar316 [32];
  undefined1 auVar317 [64];
  
  PVar29 = prim[1];
  uVar93 = (ulong)(byte)PVar29;
  lVar98 = uVar93 * 0x25;
  fVar212 = *(float *)(prim + lVar98 + 0x12);
  auVar39 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar98 + 6));
  auVar267._0_4_ = fVar212 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar267._4_4_ = fVar212 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar267._8_4_ = fVar212 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar267._12_4_ = fVar212 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar226 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 4 + 6)));
  auVar157._0_4_ = fVar212 * auVar39._0_4_;
  auVar157._4_4_ = fVar212 * auVar39._4_4_;
  auVar157._8_4_ = fVar212 * auVar39._8_4_;
  auVar157._12_4_ = fVar212 * auVar39._12_4_;
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 4 + 10)));
  auVar120._16_16_ = auVar39;
  auVar120._0_16_ = auVar226;
  auVar120 = vcvtdq2ps_avx(auVar120);
  lVar32 = uVar93 * 5;
  auVar226 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar32 + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar32 + 10)));
  auVar200._16_16_ = auVar39;
  auVar200._0_16_ = auVar226;
  auVar226 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 6 + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 6 + 10)));
  auVar176 = vcvtdq2ps_avx(auVar200);
  auVar230._16_16_ = auVar39;
  auVar230._0_16_ = auVar226;
  auVar35 = vcvtdq2ps_avx(auVar230);
  auVar226 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0xf + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0xf + 10)));
  auVar231._16_16_ = auVar39;
  auVar231._0_16_ = auVar226;
  auVar36 = vcvtdq2ps_avx(auVar231);
  lVar100 = (ulong)(byte)PVar29 * 0x10;
  auVar226 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar100 + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar100 + 10)));
  auVar310._16_16_ = auVar39;
  auVar310._0_16_ = auVar226;
  auVar226 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar100 + uVar93 + 6)));
  auVar351 = vcvtdq2ps_avx(auVar310);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar100 + uVar93 + 10)));
  auVar332._16_16_ = auVar39;
  auVar332._0_16_ = auVar226;
  auVar226 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1a + 6)));
  auVar37 = vcvtdq2ps_avx(auVar332);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1a + 10)));
  auVar333._16_16_ = auVar39;
  auVar333._0_16_ = auVar226;
  auVar376 = vcvtdq2ps_avx(auVar333);
  auVar226 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1b + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1b + 10)));
  auVar359._16_16_ = auVar39;
  auVar359._0_16_ = auVar226;
  auVar226 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1c + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1c + 10)));
  auVar352 = vcvtdq2ps_avx(auVar359);
  auVar369._16_16_ = auVar39;
  auVar369._0_16_ = auVar226;
  auVar38 = vcvtdq2ps_avx(auVar369);
  auVar226 = vshufps_avx(auVar267,auVar267,0);
  auVar39 = vshufps_avx(auVar267,auVar267,0x55);
  auVar113 = vshufps_avx(auVar267,auVar267,0xaa);
  fVar212 = auVar113._0_4_;
  fVar108 = auVar113._4_4_;
  fVar238 = auVar113._8_4_;
  fVar107 = auVar113._12_4_;
  fVar211 = auVar39._0_4_;
  fVar105 = auVar39._4_4_;
  fVar239 = auVar39._8_4_;
  fVar186 = auVar39._12_4_;
  fVar240 = auVar226._0_4_;
  fVar241 = auVar226._4_4_;
  fVar242 = auVar226._8_4_;
  fVar243 = auVar226._12_4_;
  auVar396._0_4_ = fVar240 * auVar120._0_4_ + fVar211 * auVar176._0_4_ + fVar212 * auVar35._0_4_;
  auVar396._4_4_ = fVar241 * auVar120._4_4_ + fVar105 * auVar176._4_4_ + fVar108 * auVar35._4_4_;
  auVar396._8_4_ = fVar242 * auVar120._8_4_ + fVar239 * auVar176._8_4_ + fVar238 * auVar35._8_4_;
  auVar396._12_4_ = fVar243 * auVar120._12_4_ + fVar186 * auVar176._12_4_ + fVar107 * auVar35._12_4_
  ;
  auVar396._16_4_ = fVar240 * auVar120._16_4_ + fVar211 * auVar176._16_4_ + fVar212 * auVar35._16_4_
  ;
  auVar396._20_4_ = fVar241 * auVar120._20_4_ + fVar105 * auVar176._20_4_ + fVar108 * auVar35._20_4_
  ;
  auVar396._24_4_ = fVar242 * auVar120._24_4_ + fVar239 * auVar176._24_4_ + fVar238 * auVar35._24_4_
  ;
  auVar396._28_4_ = fVar186 + in_register_000015dc + in_register_0000151c;
  auVar379._0_4_ = fVar240 * auVar36._0_4_ + fVar211 * auVar351._0_4_ + auVar37._0_4_ * fVar212;
  auVar379._4_4_ = fVar241 * auVar36._4_4_ + fVar105 * auVar351._4_4_ + auVar37._4_4_ * fVar108;
  auVar379._8_4_ = fVar242 * auVar36._8_4_ + fVar239 * auVar351._8_4_ + auVar37._8_4_ * fVar238;
  auVar379._12_4_ = fVar243 * auVar36._12_4_ + fVar186 * auVar351._12_4_ + auVar37._12_4_ * fVar107;
  auVar379._16_4_ = fVar240 * auVar36._16_4_ + fVar211 * auVar351._16_4_ + auVar37._16_4_ * fVar212;
  auVar379._20_4_ = fVar241 * auVar36._20_4_ + fVar105 * auVar351._20_4_ + auVar37._20_4_ * fVar108;
  auVar379._24_4_ = fVar242 * auVar36._24_4_ + fVar239 * auVar351._24_4_ + auVar37._24_4_ * fVar238;
  auVar379._28_4_ = fVar186 + in_register_000015dc + in_register_0000159c;
  auVar273._0_4_ = fVar240 * auVar376._0_4_ + fVar211 * auVar352._0_4_ + auVar38._0_4_ * fVar212;
  auVar273._4_4_ = fVar241 * auVar376._4_4_ + fVar105 * auVar352._4_4_ + auVar38._4_4_ * fVar108;
  auVar273._8_4_ = fVar242 * auVar376._8_4_ + fVar239 * auVar352._8_4_ + auVar38._8_4_ * fVar238;
  auVar273._12_4_ = fVar243 * auVar376._12_4_ + fVar186 * auVar352._12_4_ + auVar38._12_4_ * fVar107
  ;
  auVar273._16_4_ = fVar240 * auVar376._16_4_ + fVar211 * auVar352._16_4_ + auVar38._16_4_ * fVar212
  ;
  auVar273._20_4_ = fVar241 * auVar376._20_4_ + fVar105 * auVar352._20_4_ + auVar38._20_4_ * fVar108
  ;
  auVar273._24_4_ = fVar242 * auVar376._24_4_ + fVar239 * auVar352._24_4_ + auVar38._24_4_ * fVar238
  ;
  auVar273._28_4_ = fVar243 + fVar186 + fVar107;
  auVar226 = vshufps_avx(auVar157,auVar157,0);
  auVar39 = vshufps_avx(auVar157,auVar157,0x55);
  auVar113 = vshufps_avx(auVar157,auVar157,0xaa);
  fVar212 = auVar113._0_4_;
  fVar108 = auVar113._4_4_;
  fVar238 = auVar113._8_4_;
  fVar107 = auVar113._12_4_;
  fVar241 = auVar39._0_4_;
  fVar242 = auVar39._4_4_;
  fVar243 = auVar39._8_4_;
  fVar260 = auVar39._12_4_;
  fVar211 = auVar176._28_4_ + auVar35._28_4_;
  fVar105 = auVar226._0_4_;
  fVar239 = auVar226._4_4_;
  fVar186 = auVar226._8_4_;
  fVar240 = auVar226._12_4_;
  auVar170._0_4_ = fVar105 * auVar120._0_4_ + fVar241 * auVar176._0_4_ + fVar212 * auVar35._0_4_;
  auVar170._4_4_ = fVar239 * auVar120._4_4_ + fVar242 * auVar176._4_4_ + fVar108 * auVar35._4_4_;
  auVar170._8_4_ = fVar186 * auVar120._8_4_ + fVar243 * auVar176._8_4_ + fVar238 * auVar35._8_4_;
  auVar170._12_4_ = fVar240 * auVar120._12_4_ + fVar260 * auVar176._12_4_ + fVar107 * auVar35._12_4_
  ;
  auVar170._16_4_ = fVar105 * auVar120._16_4_ + fVar241 * auVar176._16_4_ + fVar212 * auVar35._16_4_
  ;
  auVar170._20_4_ = fVar239 * auVar120._20_4_ + fVar242 * auVar176._20_4_ + fVar108 * auVar35._20_4_
  ;
  auVar170._24_4_ = fVar186 * auVar120._24_4_ + fVar243 * auVar176._24_4_ + fVar238 * auVar35._24_4_
  ;
  auVar170._28_4_ = auVar120._28_4_ + fVar211;
  auVar121._0_4_ = fVar105 * auVar36._0_4_ + auVar37._0_4_ * fVar212 + fVar241 * auVar351._0_4_;
  auVar121._4_4_ = fVar239 * auVar36._4_4_ + auVar37._4_4_ * fVar108 + fVar242 * auVar351._4_4_;
  auVar121._8_4_ = fVar186 * auVar36._8_4_ + auVar37._8_4_ * fVar238 + fVar243 * auVar351._8_4_;
  auVar121._12_4_ = fVar240 * auVar36._12_4_ + auVar37._12_4_ * fVar107 + fVar260 * auVar351._12_4_;
  auVar121._16_4_ = fVar105 * auVar36._16_4_ + auVar37._16_4_ * fVar212 + fVar241 * auVar351._16_4_;
  auVar121._20_4_ = fVar239 * auVar36._20_4_ + auVar37._20_4_ * fVar108 + fVar242 * auVar351._20_4_;
  auVar121._24_4_ = fVar186 * auVar36._24_4_ + auVar37._24_4_ * fVar238 + fVar243 * auVar351._24_4_;
  auVar121._28_4_ = auVar120._28_4_ + auVar37._28_4_ + auVar35._28_4_;
  auVar334._8_4_ = 0x7fffffff;
  auVar334._0_8_ = 0x7fffffff7fffffff;
  auVar334._12_4_ = 0x7fffffff;
  auVar334._16_4_ = 0x7fffffff;
  auVar334._20_4_ = 0x7fffffff;
  auVar334._24_4_ = 0x7fffffff;
  auVar334._28_4_ = 0x7fffffff;
  auVar345._8_4_ = 0x219392ef;
  auVar345._0_8_ = 0x219392ef219392ef;
  auVar345._12_4_ = 0x219392ef;
  auVar345._16_4_ = 0x219392ef;
  auVar345._20_4_ = 0x219392ef;
  auVar345._24_4_ = 0x219392ef;
  auVar345._28_4_ = 0x219392ef;
  auVar120 = vandps_avx(auVar396,auVar334);
  auVar120 = vcmpps_avx(auVar120,auVar345,1);
  auVar176 = vblendvps_avx(auVar396,auVar345,auVar120);
  auVar120 = vandps_avx(auVar379,auVar334);
  auVar120 = vcmpps_avx(auVar120,auVar345,1);
  auVar35 = vblendvps_avx(auVar379,auVar345,auVar120);
  auVar120 = vandps_avx(auVar273,auVar334);
  auVar120 = vcmpps_avx(auVar120,auVar345,1);
  auVar120 = vblendvps_avx(auVar273,auVar345,auVar120);
  auVar201._0_4_ = fVar105 * auVar376._0_4_ + fVar241 * auVar352._0_4_ + auVar38._0_4_ * fVar212;
  auVar201._4_4_ = fVar239 * auVar376._4_4_ + fVar242 * auVar352._4_4_ + auVar38._4_4_ * fVar108;
  auVar201._8_4_ = fVar186 * auVar376._8_4_ + fVar243 * auVar352._8_4_ + auVar38._8_4_ * fVar238;
  auVar201._12_4_ = fVar240 * auVar376._12_4_ + fVar260 * auVar352._12_4_ + auVar38._12_4_ * fVar107
  ;
  auVar201._16_4_ = fVar105 * auVar376._16_4_ + fVar241 * auVar352._16_4_ + auVar38._16_4_ * fVar212
  ;
  auVar201._20_4_ = fVar239 * auVar376._20_4_ + fVar242 * auVar352._20_4_ + auVar38._20_4_ * fVar108
  ;
  auVar201._24_4_ = fVar186 * auVar376._24_4_ + fVar243 * auVar352._24_4_ + auVar38._24_4_ * fVar238
  ;
  auVar201._28_4_ = fVar211 + auVar351._28_4_ + fVar107;
  auVar36 = vrcpps_avx(auVar176);
  fVar212 = auVar36._0_4_;
  fVar238 = auVar36._4_4_;
  auVar351._4_4_ = auVar176._4_4_ * fVar238;
  auVar351._0_4_ = auVar176._0_4_ * fVar212;
  fVar211 = auVar36._8_4_;
  auVar351._8_4_ = auVar176._8_4_ * fVar211;
  fVar239 = auVar36._12_4_;
  auVar351._12_4_ = auVar176._12_4_ * fVar239;
  fVar240 = auVar36._16_4_;
  auVar351._16_4_ = auVar176._16_4_ * fVar240;
  fVar241 = auVar36._20_4_;
  auVar351._20_4_ = auVar176._20_4_ * fVar241;
  fVar242 = auVar36._24_4_;
  auVar351._24_4_ = auVar176._24_4_ * fVar242;
  auVar351._28_4_ = auVar176._28_4_;
  auVar346._8_4_ = 0x3f800000;
  auVar346._0_8_ = 0x3f8000003f800000;
  auVar346._12_4_ = 0x3f800000;
  auVar346._16_4_ = 0x3f800000;
  auVar346._20_4_ = 0x3f800000;
  auVar346._24_4_ = 0x3f800000;
  auVar346._28_4_ = 0x3f800000;
  auVar37 = vsubps_avx(auVar346,auVar351);
  auVar351 = vrcpps_avx(auVar35);
  fVar212 = fVar212 + fVar212 * auVar37._0_4_;
  fVar238 = fVar238 + fVar238 * auVar37._4_4_;
  fVar211 = fVar211 + fVar211 * auVar37._8_4_;
  fVar239 = fVar239 + fVar239 * auVar37._12_4_;
  fVar240 = fVar240 + fVar240 * auVar37._16_4_;
  fVar241 = fVar241 + fVar241 * auVar37._20_4_;
  fVar242 = fVar242 + fVar242 * auVar37._24_4_;
  fVar243 = auVar351._0_4_;
  fVar260 = auVar351._4_4_;
  auVar176._4_4_ = fVar260 * auVar35._4_4_;
  auVar176._0_4_ = fVar243 * auVar35._0_4_;
  fVar261 = auVar351._8_4_;
  auVar176._8_4_ = fVar261 * auVar35._8_4_;
  fVar262 = auVar351._12_4_;
  auVar176._12_4_ = fVar262 * auVar35._12_4_;
  fVar263 = auVar351._16_4_;
  auVar176._16_4_ = fVar263 * auVar35._16_4_;
  fVar264 = auVar351._20_4_;
  auVar176._20_4_ = fVar264 * auVar35._20_4_;
  fVar265 = auVar351._24_4_;
  auVar176._24_4_ = fVar265 * auVar35._24_4_;
  auVar176._28_4_ = auVar35._28_4_;
  auVar35 = vsubps_avx(auVar346,auVar176);
  fVar243 = fVar243 + fVar243 * auVar35._0_4_;
  fVar260 = fVar260 + fVar260 * auVar35._4_4_;
  fVar261 = fVar261 + fVar261 * auVar35._8_4_;
  fVar262 = fVar262 + fVar262 * auVar35._12_4_;
  fVar263 = fVar263 + fVar263 * auVar35._16_4_;
  fVar264 = fVar264 + fVar264 * auVar35._20_4_;
  fVar265 = fVar265 + fVar265 * auVar35._24_4_;
  auVar176 = vrcpps_avx(auVar120);
  fVar266 = auVar176._0_4_;
  fVar285 = auVar176._4_4_;
  auVar376._4_4_ = fVar285 * auVar120._4_4_;
  auVar376._0_4_ = fVar266 * auVar120._0_4_;
  fVar287 = auVar176._8_4_;
  auVar376._8_4_ = fVar287 * auVar120._8_4_;
  fVar290 = auVar176._12_4_;
  auVar376._12_4_ = fVar290 * auVar120._12_4_;
  fVar293 = auVar176._16_4_;
  auVar376._16_4_ = fVar293 * auVar120._16_4_;
  fVar296 = auVar176._20_4_;
  auVar376._20_4_ = fVar296 * auVar120._20_4_;
  fVar299 = auVar176._24_4_;
  auVar376._24_4_ = fVar299 * auVar120._24_4_;
  auVar376._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(auVar346,auVar376);
  fVar266 = fVar266 + fVar266 * auVar120._0_4_;
  fVar285 = fVar285 + fVar285 * auVar120._4_4_;
  fVar287 = fVar287 + fVar287 * auVar120._8_4_;
  fVar290 = fVar290 + fVar290 * auVar120._12_4_;
  fVar293 = fVar293 + fVar293 * auVar120._16_4_;
  fVar296 = fVar296 + fVar296 * auVar120._20_4_;
  fVar299 = fVar299 + fVar299 * auVar120._24_4_;
  auVar226 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar98 + 0x16)) * *(float *)(prim + lVar98 + 0x1a)));
  auVar197 = vshufps_avx(auVar226,auVar226,0);
  auVar226._8_8_ = 0;
  auVar226._0_8_ = *(ulong *)(prim + uVar93 * 7 + 6);
  auVar226 = vpmovsxwd_avx(auVar226);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar93 * 7 + 0xe);
  auVar39 = vpmovsxwd_avx(auVar39);
  auVar335._16_16_ = auVar39;
  auVar335._0_16_ = auVar226;
  auVar120 = vcvtdq2ps_avx(auVar335);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar93 * 0xb + 6);
  auVar226 = vpmovsxwd_avx(auVar113);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar93 * 0xb + 0xe);
  auVar39 = vpmovsxwd_avx(auVar117);
  auVar347._16_16_ = auVar39;
  auVar347._0_16_ = auVar226;
  auVar176 = vcvtdq2ps_avx(auVar347);
  auVar176 = vsubps_avx(auVar176,auVar120);
  fVar108 = auVar197._0_4_;
  fVar107 = auVar197._4_4_;
  fVar105 = auVar197._8_4_;
  fVar186 = auVar197._12_4_;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar93 * 9 + 6);
  auVar226 = vpmovsxwd_avx(auVar197);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar93 * 9 + 0xe);
  auVar39 = vpmovsxwd_avx(auVar223);
  auVar336._0_4_ = auVar176._0_4_ * fVar108 + auVar120._0_4_;
  auVar336._4_4_ = auVar176._4_4_ * fVar107 + auVar120._4_4_;
  auVar336._8_4_ = auVar176._8_4_ * fVar105 + auVar120._8_4_;
  auVar336._12_4_ = auVar176._12_4_ * fVar186 + auVar120._12_4_;
  auVar336._16_4_ = auVar176._16_4_ * fVar108 + auVar120._16_4_;
  auVar336._20_4_ = auVar176._20_4_ * fVar107 + auVar120._20_4_;
  auVar336._24_4_ = auVar176._24_4_ * fVar105 + auVar120._24_4_;
  auVar336._28_4_ = auVar176._28_4_ + auVar120._28_4_;
  auVar348._16_16_ = auVar39;
  auVar348._0_16_ = auVar226;
  auVar120 = vcvtdq2ps_avx(auVar348);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar93 * 0xd + 6);
  auVar226 = vpmovsxwd_avx(auVar115);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar93 * 0xd + 0xe);
  auVar39 = vpmovsxwd_avx(auVar13);
  auVar360._16_16_ = auVar39;
  auVar360._0_16_ = auVar226;
  auVar176 = vcvtdq2ps_avx(auVar360);
  auVar176 = vsubps_avx(auVar176,auVar120);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar93 * 0x12 + 6);
  auVar226 = vpmovsxwd_avx(auVar119);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar93 * 0x12 + 0xe);
  auVar39 = vpmovsxwd_avx(auVar14);
  auVar349._0_4_ = auVar120._0_4_ + auVar176._0_4_ * fVar108;
  auVar349._4_4_ = auVar120._4_4_ + auVar176._4_4_ * fVar107;
  auVar349._8_4_ = auVar120._8_4_ + auVar176._8_4_ * fVar105;
  auVar349._12_4_ = auVar120._12_4_ + auVar176._12_4_ * fVar186;
  auVar349._16_4_ = auVar120._16_4_ + auVar176._16_4_ * fVar108;
  auVar349._20_4_ = auVar120._20_4_ + auVar176._20_4_ * fVar107;
  auVar349._24_4_ = auVar120._24_4_ + auVar176._24_4_ * fVar105;
  auVar349._28_4_ = auVar120._28_4_ + auVar176._28_4_;
  auVar361._16_16_ = auVar39;
  auVar361._0_16_ = auVar226;
  auVar120 = vcvtdq2ps_avx(auVar361);
  uVar102 = (ulong)(uint)((int)lVar32 << 2);
  lVar98 = uVar93 * 2 + uVar102;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar98 + 6);
  auVar226 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + lVar98 + 0xe);
  auVar39 = vpmovsxwd_avx(auVar16);
  auVar370._16_16_ = auVar39;
  auVar370._0_16_ = auVar226;
  auVar176 = vcvtdq2ps_avx(auVar370);
  auVar176 = vsubps_avx(auVar176,auVar120);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar102 + 6);
  auVar226 = vpmovsxwd_avx(auVar17);
  auVar362._0_4_ = auVar120._0_4_ + auVar176._0_4_ * fVar108;
  auVar362._4_4_ = auVar120._4_4_ + auVar176._4_4_ * fVar107;
  auVar362._8_4_ = auVar120._8_4_ + auVar176._8_4_ * fVar105;
  auVar362._12_4_ = auVar120._12_4_ + auVar176._12_4_ * fVar186;
  auVar362._16_4_ = auVar120._16_4_ + auVar176._16_4_ * fVar108;
  auVar362._20_4_ = auVar120._20_4_ + auVar176._20_4_ * fVar107;
  auVar362._24_4_ = auVar120._24_4_ + auVar176._24_4_ * fVar105;
  auVar362._28_4_ = auVar120._28_4_ + auVar176._28_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar102 + 0xe);
  auVar39 = vpmovsxwd_avx(auVar18);
  auVar371._16_16_ = auVar39;
  auVar371._0_16_ = auVar226;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar93 * 0x18 + 6);
  auVar226 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar93 * 0x18 + 0xe);
  auVar39 = vpmovsxwd_avx(auVar20);
  auVar120 = vcvtdq2ps_avx(auVar371);
  auVar380._16_16_ = auVar39;
  auVar380._0_16_ = auVar226;
  auVar176 = vcvtdq2ps_avx(auVar380);
  auVar176 = vsubps_avx(auVar176,auVar120);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar93 * 0x1d + 6);
  auVar226 = vpmovsxwd_avx(auVar21);
  auVar372._0_4_ = auVar120._0_4_ + auVar176._0_4_ * fVar108;
  auVar372._4_4_ = auVar120._4_4_ + auVar176._4_4_ * fVar107;
  auVar372._8_4_ = auVar120._8_4_ + auVar176._8_4_ * fVar105;
  auVar372._12_4_ = auVar120._12_4_ + auVar176._12_4_ * fVar186;
  auVar372._16_4_ = auVar120._16_4_ + auVar176._16_4_ * fVar108;
  auVar372._20_4_ = auVar120._20_4_ + auVar176._20_4_ * fVar107;
  auVar372._24_4_ = auVar120._24_4_ + auVar176._24_4_ * fVar105;
  auVar372._28_4_ = auVar120._28_4_ + auVar176._28_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar93 * 0x1d + 0xe);
  auVar39 = vpmovsxwd_avx(auVar22);
  lVar98 = uVar93 + (ulong)(byte)PVar29 * 0x20;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + lVar98 + 6);
  auVar113 = vpmovsxwd_avx(auVar23);
  auVar381._16_16_ = auVar39;
  auVar381._0_16_ = auVar226;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar98 + 0xe);
  auVar226 = vpmovsxwd_avx(auVar24);
  auVar397._16_16_ = auVar226;
  auVar397._0_16_ = auVar113;
  auVar120 = vcvtdq2ps_avx(auVar381);
  auVar176 = vcvtdq2ps_avx(auVar397);
  auVar176 = vsubps_avx(auVar176,auVar120);
  auVar382._0_4_ = auVar120._0_4_ + auVar176._0_4_ * fVar108;
  auVar382._4_4_ = auVar120._4_4_ + auVar176._4_4_ * fVar107;
  auVar382._8_4_ = auVar120._8_4_ + auVar176._8_4_ * fVar105;
  auVar382._12_4_ = auVar120._12_4_ + auVar176._12_4_ * fVar186;
  auVar382._16_4_ = auVar120._16_4_ + auVar176._16_4_ * fVar108;
  auVar382._20_4_ = auVar120._20_4_ + auVar176._20_4_ * fVar107;
  auVar382._24_4_ = auVar120._24_4_ + auVar176._24_4_ * fVar105;
  auVar382._28_4_ = auVar120._28_4_ + auVar176._28_4_;
  lVar98 = (ulong)(byte)PVar29 * 0x20 - uVar93;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar98 + 6);
  auVar226 = vpmovsxwd_avx(auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar98 + 0xe);
  auVar39 = vpmovsxwd_avx(auVar26);
  auVar398._16_16_ = auVar39;
  auVar398._0_16_ = auVar226;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar93 * 0x23 + 6);
  auVar226 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar93 * 0x23 + 0xe);
  auVar39 = vpmovsxwd_avx(auVar28);
  auVar412._16_16_ = auVar39;
  auVar412._0_16_ = auVar226;
  auVar120 = vcvtdq2ps_avx(auVar398);
  auVar176 = vcvtdq2ps_avx(auVar412);
  auVar176 = vsubps_avx(auVar176,auVar120);
  auVar399._0_4_ = auVar120._0_4_ + auVar176._0_4_ * fVar108;
  auVar399._4_4_ = auVar120._4_4_ + auVar176._4_4_ * fVar107;
  auVar399._8_4_ = auVar120._8_4_ + auVar176._8_4_ * fVar105;
  auVar399._12_4_ = auVar120._12_4_ + auVar176._12_4_ * fVar186;
  auVar399._16_4_ = auVar120._16_4_ + auVar176._16_4_ * fVar108;
  auVar399._20_4_ = auVar120._20_4_ + auVar176._20_4_ * fVar107;
  auVar399._24_4_ = auVar120._24_4_ + auVar176._24_4_ * fVar105;
  auVar399._28_4_ = auVar120._28_4_ + fVar186;
  auVar120 = vsubps_avx(auVar336,auVar170);
  auVar305._0_4_ = fVar212 * auVar120._0_4_;
  auVar305._4_4_ = fVar238 * auVar120._4_4_;
  auVar305._8_4_ = fVar211 * auVar120._8_4_;
  auVar305._12_4_ = fVar239 * auVar120._12_4_;
  auVar352._16_4_ = fVar240 * auVar120._16_4_;
  auVar352._0_16_ = auVar305;
  auVar352._20_4_ = fVar241 * auVar120._20_4_;
  auVar352._24_4_ = fVar242 * auVar120._24_4_;
  auVar352._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(auVar349,auVar170);
  auVar213._0_4_ = fVar212 * auVar120._0_4_;
  auVar213._4_4_ = fVar238 * auVar120._4_4_;
  auVar213._8_4_ = fVar211 * auVar120._8_4_;
  auVar213._12_4_ = fVar239 * auVar120._12_4_;
  auVar38._16_4_ = fVar240 * auVar120._16_4_;
  auVar38._0_16_ = auVar213;
  auVar38._20_4_ = fVar241 * auVar120._20_4_;
  auVar38._24_4_ = fVar242 * auVar120._24_4_;
  auVar38._28_4_ = auVar36._28_4_ + auVar37._28_4_;
  auVar120 = vsubps_avx(auVar362,auVar121);
  auVar158._0_4_ = fVar243 * auVar120._0_4_;
  auVar158._4_4_ = fVar260 * auVar120._4_4_;
  auVar158._8_4_ = fVar261 * auVar120._8_4_;
  auVar158._12_4_ = fVar262 * auVar120._12_4_;
  auVar36._16_4_ = fVar263 * auVar120._16_4_;
  auVar36._0_16_ = auVar158;
  auVar36._20_4_ = fVar264 * auVar120._20_4_;
  auVar36._24_4_ = fVar265 * auVar120._24_4_;
  auVar36._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(auVar372,auVar121);
  auVar244._0_4_ = fVar243 * auVar120._0_4_;
  auVar244._4_4_ = fVar260 * auVar120._4_4_;
  auVar244._8_4_ = fVar261 * auVar120._8_4_;
  auVar244._12_4_ = fVar262 * auVar120._12_4_;
  auVar37._16_4_ = fVar263 * auVar120._16_4_;
  auVar37._0_16_ = auVar244;
  auVar37._20_4_ = fVar264 * auVar120._20_4_;
  auVar37._24_4_ = fVar265 * auVar120._24_4_;
  auVar37._28_4_ = auVar351._28_4_ + auVar35._28_4_;
  auVar120 = vsubps_avx(auVar382,auVar201);
  auVar109._0_4_ = fVar266 * auVar120._0_4_;
  auVar109._4_4_ = fVar285 * auVar120._4_4_;
  auVar109._8_4_ = fVar287 * auVar120._8_4_;
  auVar109._12_4_ = fVar290 * auVar120._12_4_;
  auVar35._16_4_ = fVar293 * auVar120._16_4_;
  auVar35._0_16_ = auVar109;
  auVar35._20_4_ = fVar296 * auVar120._20_4_;
  auVar35._24_4_ = fVar299 * auVar120._24_4_;
  auVar35._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(auVar399,auVar201);
  auVar193._0_4_ = fVar266 * auVar120._0_4_;
  auVar193._4_4_ = fVar285 * auVar120._4_4_;
  auVar193._8_4_ = fVar287 * auVar120._8_4_;
  auVar193._12_4_ = fVar290 * auVar120._12_4_;
  auVar40._16_4_ = fVar293 * auVar120._16_4_;
  auVar40._0_16_ = auVar193;
  auVar40._20_4_ = fVar296 * auVar120._20_4_;
  auVar40._24_4_ = fVar299 * auVar120._24_4_;
  auVar40._28_4_ = auVar120._28_4_;
  auVar226 = vpminsd_avx(auVar352._16_16_,auVar38._16_16_);
  auVar39 = vpminsd_avx(auVar305,auVar213);
  auVar350._16_16_ = auVar226;
  auVar350._0_16_ = auVar39;
  auVar226 = vpminsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar39 = vpminsd_avx(auVar158,auVar244);
  auVar383._16_16_ = auVar226;
  auVar383._0_16_ = auVar39;
  auVar120 = vmaxps_avx(auVar350,auVar383);
  auVar226 = vpminsd_avx(auVar35._16_16_,auVar40._16_16_);
  auVar39 = vpminsd_avx(auVar109,auVar193);
  auVar413._16_16_ = auVar226;
  auVar413._0_16_ = auVar39;
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar431._4_4_ = uVar8;
  auVar431._0_4_ = uVar8;
  auVar431._8_4_ = uVar8;
  auVar431._12_4_ = uVar8;
  auVar431._16_4_ = uVar8;
  auVar431._20_4_ = uVar8;
  auVar431._24_4_ = uVar8;
  auVar431._28_4_ = uVar8;
  auVar176 = vmaxps_avx(auVar413,auVar431);
  auVar120 = vmaxps_avx(auVar120,auVar176);
  local_320._4_4_ = auVar120._4_4_ * 0.99999964;
  local_320._0_4_ = auVar120._0_4_ * 0.99999964;
  local_320._8_4_ = auVar120._8_4_ * 0.99999964;
  local_320._12_4_ = auVar120._12_4_ * 0.99999964;
  local_320._16_4_ = auVar120._16_4_ * 0.99999964;
  local_320._20_4_ = auVar120._20_4_ * 0.99999964;
  local_320._24_4_ = auVar120._24_4_ * 0.99999964;
  local_320._28_4_ = auVar120._28_4_;
  auVar226 = vpmaxsd_avx(auVar352._16_16_,auVar38._16_16_);
  auVar39 = vpmaxsd_avx(auVar305,auVar213);
  auVar232._16_16_ = auVar226;
  auVar232._0_16_ = auVar39;
  auVar226 = vpmaxsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar39 = vpmaxsd_avx(auVar158,auVar244);
  auVar171._16_16_ = auVar226;
  auVar171._0_16_ = auVar39;
  auVar120 = vminps_avx(auVar232,auVar171);
  auVar226 = vpmaxsd_avx(auVar35._16_16_,auVar40._16_16_);
  auVar39 = vpmaxsd_avx(auVar109,auVar193);
  fVar212 = (ray->super_RayK<1>).tfar;
  auVar202._4_4_ = fVar212;
  auVar202._0_4_ = fVar212;
  auVar202._8_4_ = fVar212;
  auVar202._12_4_ = fVar212;
  auVar202._16_4_ = fVar212;
  auVar202._20_4_ = fVar212;
  auVar202._24_4_ = fVar212;
  auVar202._28_4_ = fVar212;
  auVar122._16_16_ = auVar226;
  auVar122._0_16_ = auVar39;
  auVar176 = vminps_avx(auVar122,auVar202);
  auVar120 = vminps_avx(auVar120,auVar176);
  auVar41._4_4_ = auVar120._4_4_ * 1.0000004;
  auVar41._0_4_ = auVar120._0_4_ * 1.0000004;
  auVar41._8_4_ = auVar120._8_4_ * 1.0000004;
  auVar41._12_4_ = auVar120._12_4_ * 1.0000004;
  auVar41._16_4_ = auVar120._16_4_ * 1.0000004;
  auVar41._20_4_ = auVar120._20_4_ * 1.0000004;
  auVar41._24_4_ = auVar120._24_4_ * 1.0000004;
  auVar41._28_4_ = auVar120._28_4_;
  auVar120 = vcmpps_avx(local_320,auVar41,2);
  auVar226 = vpshufd_avx(ZEXT116((byte)PVar29),0);
  auVar172._16_16_ = auVar226;
  auVar172._0_16_ = auVar226;
  auVar176 = vcvtdq2ps_avx(auVar172);
  auVar176 = vcmpps_avx(_DAT_01faff40,auVar176,1);
  auVar120 = vandps_avx(auVar120,auVar176);
  uVar91 = vmovmskps_avx(auVar120);
  if (uVar91 == 0) {
    return;
  }
  uVar91 = uVar91 & 0xff;
  auVar123._16_16_ = mm_lookupmask_ps._240_16_;
  auVar123._0_16_ = mm_lookupmask_ps._240_16_;
  local_380 = vblendps_avx(auVar123,ZEXT832(0) << 0x20,0x80);
LAB_011089cd:
  lVar98 = 0;
  if (uVar91 != 0) {
    for (; (uVar91 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
    }
  }
  uVar97 = *(uint *)(prim + 2);
  pGVar30 = (context->scene->geometries).items[uVar97].ptr;
  uVar93 = (ulong)*(uint *)(*(long *)&pGVar30->field_0x58 +
                           (ulong)*(uint *)(prim + lVar98 * 4 + 6) *
                           pGVar30[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar212 = (pGVar30->time_range).lower;
  fVar212 = pGVar30->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar212) /
            ((pGVar30->time_range).upper - fVar212));
  auVar226 = vroundss_avx(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),9);
  auVar226 = vminss_avx(auVar226,ZEXT416((uint)(pGVar30->fnumTimeSegments + -1.0)));
  auVar226 = vmaxss_avx(ZEXT816(0) << 0x20,auVar226);
  fVar212 = fVar212 - auVar226._0_4_;
  _Var31 = pGVar30[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar99 = (long)(int)auVar226._0_4_ * 0x38;
  lVar32 = *(long *)(_Var31 + 0x10 + lVar99);
  lVar100 = *(long *)(_Var31 + 0x38 + lVar99);
  lVar33 = *(long *)(_Var31 + 0x48 + lVar99);
  auVar226 = vshufps_avx(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),0);
  pfVar1 = (float *)(lVar100 + uVar93 * lVar33);
  fVar211 = auVar226._0_4_;
  fVar105 = auVar226._4_4_;
  fVar239 = auVar226._8_4_;
  fVar186 = auVar226._12_4_;
  pfVar2 = (float *)(lVar100 + (uVar93 + 1) * lVar33);
  pfVar3 = (float *)(lVar100 + (uVar93 + 2) * lVar33);
  pfVar4 = (float *)(lVar100 + lVar33 * (uVar93 + 3));
  lVar100 = *(long *)(_Var31 + lVar99);
  auVar226 = vshufps_avx(ZEXT416((uint)(1.0 - fVar212)),ZEXT416((uint)(1.0 - fVar212)),0);
  pfVar5 = (float *)(lVar100 + lVar32 * uVar93);
  fVar212 = auVar226._0_4_;
  fVar108 = auVar226._4_4_;
  fVar238 = auVar226._8_4_;
  fVar107 = auVar226._12_4_;
  pfVar6 = (float *)(lVar100 + lVar32 * (uVar93 + 1));
  pfVar7 = (float *)(lVar100 + lVar32 * (uVar93 + 2));
  auVar194._0_4_ = fVar211 * *pfVar1 + fVar212 * *pfVar5;
  auVar194._4_4_ = fVar105 * pfVar1[1] + fVar108 * pfVar5[1];
  auVar194._8_4_ = fVar239 * pfVar1[2] + fVar238 * pfVar5[2];
  auVar194._12_4_ = fVar186 * pfVar1[3] + fVar107 * pfVar5[3];
  auVar214._0_4_ = fVar212 * *pfVar6 + fVar211 * *pfVar2;
  auVar214._4_4_ = fVar108 * pfVar6[1] + fVar105 * pfVar2[1];
  auVar214._8_4_ = fVar238 * pfVar6[2] + fVar239 * pfVar2[2];
  auVar214._12_4_ = fVar107 * pfVar6[3] + fVar186 * pfVar2[3];
  auVar245._0_4_ = fVar212 * *pfVar7 + fVar211 * *pfVar3;
  auVar245._4_4_ = fVar108 * pfVar7[1] + fVar105 * pfVar3[1];
  auVar245._8_4_ = fVar238 * pfVar7[2] + fVar239 * pfVar3[2];
  auVar245._12_4_ = fVar107 * pfVar7[3] + fVar186 * pfVar3[3];
  pfVar1 = (float *)(lVar100 + lVar32 * (uVar93 + 3));
  auVar268._0_4_ = fVar212 * *pfVar1 + fVar211 * *pfVar4;
  auVar268._4_4_ = fVar108 * pfVar1[1] + fVar105 * pfVar4[1];
  auVar268._8_4_ = fVar238 * pfVar1[2] + fVar239 * pfVar4[2];
  auVar268._12_4_ = fVar107 * pfVar1[3] + fVar186 * pfVar4[3];
  auVar110._0_4_ = (auVar194._0_4_ + auVar214._0_4_ + auVar245._0_4_ + auVar268._0_4_) * 0.25;
  auVar110._4_4_ = (auVar194._4_4_ + auVar214._4_4_ + auVar245._4_4_ + auVar268._4_4_) * 0.25;
  auVar110._8_4_ = (auVar194._8_4_ + auVar214._8_4_ + auVar245._8_4_ + auVar268._8_4_) * 0.25;
  auVar110._12_4_ = (auVar194._12_4_ + auVar214._12_4_ + auVar245._12_4_ + auVar268._12_4_) * 0.25;
  aVar10 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar11 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar226 = vsubps_avx(auVar110,(undefined1  [16])aVar10);
  auVar226 = vdpps_avx(auVar226,(undefined1  [16])aVar11,0x7f);
  auVar39 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
  auVar113 = vrcpss_avx(auVar39,auVar39);
  fVar212 = auVar226._0_4_ * auVar113._0_4_ * (2.0 - auVar113._0_4_ * auVar39._0_4_);
  local_730 = ZEXT416((uint)fVar212);
  auVar39 = vshufps_avx(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),0);
  fVar212 = aVar11.x;
  fVar108 = aVar11.y;
  fVar238 = aVar11.z;
  aVar187 = aVar11.field_3;
  auVar306._0_4_ = aVar10.x + fVar212 * auVar39._0_4_;
  auVar306._4_4_ = aVar10.y + fVar108 * auVar39._4_4_;
  auVar306._8_4_ = aVar10.z + fVar238 * auVar39._8_4_;
  auVar306._12_4_ = aVar10.field_3.w + aVar187.w * auVar39._12_4_;
  auVar226 = vblendps_avx(auVar306,_DAT_01f7aa10,8);
  _local_950 = vsubps_avx(auVar194,auVar226);
  auVar344 = ZEXT1664(_local_950);
  _local_960 = vsubps_avx(auVar245,auVar226);
  _local_970 = vsubps_avx(auVar214,auVar226);
  _local_980 = vsubps_avx(auVar268,auVar226);
  auVar226 = vshufps_avx(_local_950,_local_950,0);
  local_9c0._16_16_ = auVar226;
  local_9c0._0_16_ = auVar226;
  auVar434 = ZEXT3264(local_9c0);
  auVar226 = vshufps_avx(_local_950,_local_950,0x55);
  local_9e0._16_16_ = auVar226;
  local_9e0._0_16_ = auVar226;
  auVar386 = ZEXT3264(local_9e0);
  auVar226 = vshufps_avx(_local_950,_local_950,0xaa);
  local_900._16_16_ = auVar226;
  local_900._0_16_ = auVar226;
  auVar436 = ZEXT3264(local_900);
  auVar226 = vshufps_avx(_local_950,_local_950,0xff);
  local_9a0._16_16_ = auVar226;
  local_9a0._0_16_ = auVar226;
  auVar377 = ZEXT3264(local_9a0);
  auVar226 = vshufps_avx(_local_970,_local_970,0);
  auVar311._16_16_ = auVar226;
  auVar311._0_16_ = auVar226;
  auVar317 = ZEXT3264(auVar311);
  auVar226 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001290 = auVar226;
  _local_1e0 = auVar226;
  auVar226 = vshufps_avx(_local_970,_local_970,0xaa);
  local_920._16_16_ = auVar226;
  local_920._0_16_ = auVar226;
  auVar402 = ZEXT3264(local_920);
  auVar159._0_4_ = fVar212 * fVar212;
  auVar159._4_4_ = fVar108 * fVar108;
  auVar159._8_4_ = fVar238 * fVar238;
  auVar159._12_4_ = aVar187.w * aVar187.w;
  auVar226 = vshufps_avx(auVar159,auVar159,0xaa);
  auVar113 = vshufps_avx(auVar159,auVar159,0x55);
  auVar117 = vshufps_avx(_local_970,_local_970,0xff);
  local_8e0._16_16_ = auVar117;
  local_8e0._0_16_ = auVar117;
  auVar355 = ZEXT3264(local_8e0);
  auVar117 = vshufps_avx(auVar159,auVar159,0);
  local_200._0_4_ = auVar117._0_4_ + auVar113._0_4_ + auVar226._0_4_;
  local_200._4_4_ = auVar117._4_4_ + auVar113._4_4_ + auVar226._4_4_;
  local_200._8_4_ = auVar117._8_4_ + auVar113._8_4_ + auVar226._8_4_;
  local_200._12_4_ = auVar117._12_4_ + auVar113._12_4_ + auVar226._12_4_;
  local_200._16_4_ = auVar117._0_4_ + auVar113._0_4_ + auVar226._0_4_;
  local_200._20_4_ = auVar117._4_4_ + auVar113._4_4_ + auVar226._4_4_;
  local_200._24_4_ = auVar117._8_4_ + auVar113._8_4_ + auVar226._8_4_;
  local_200._28_4_ = auVar117._12_4_ + auVar113._12_4_ + auVar226._12_4_;
  auVar226 = vshufps_avx(_local_960,_local_960,0);
  register0x00001250 = auVar226;
  _local_220 = auVar226;
  auVar226 = vshufps_avx(_local_960,_local_960,0x55);
  register0x00001250 = auVar226;
  _local_240 = auVar226;
  auVar226 = vshufps_avx(_local_960,_local_960,0xaa);
  register0x00001250 = auVar226;
  _local_260 = auVar226;
  auVar226 = vshufps_avx(_local_960,_local_960,0xff);
  register0x00001250 = auVar226;
  _local_280 = auVar226;
  auVar226 = vshufps_avx(_local_980,_local_980,0);
  register0x00001250 = auVar226;
  _local_2a0 = auVar226;
  auVar226 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001250 = auVar226;
  _local_2c0 = auVar226;
  auVar226 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001250 = auVar226;
  _local_2e0 = auVar226;
  auVar226 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001250 = auVar226;
  _local_300 = auVar226;
  register0x00001210 = auVar39;
  _local_620 = auVar39;
  local_aec = 1;
  uVar102 = 0;
  local_6a0 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_69c = local_6a0;
  fStack_698 = local_6a0;
  fStack_694 = local_6a0;
  fStack_690 = local_6a0;
  fStack_68c = local_6a0;
  fStack_688 = local_6a0;
  fStack_684 = local_6a0;
  local_6c0 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_6bc = local_6c0;
  fStack_6b8 = local_6c0;
  fStack_6b4 = local_6c0;
  fStack_6b0 = local_6c0;
  fStack_6ac = local_6c0;
  fStack_6a8 = local_6c0;
  fStack_6a4 = local_6c0;
  local_4a0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_49c = local_4a0;
  fStack_498 = local_4a0;
  fStack_494 = local_4a0;
  fStack_490 = local_4a0;
  fStack_48c = local_4a0;
  fStack_488 = local_4a0;
  fStack_484 = local_4a0;
  auVar124._8_4_ = 0x7fffffff;
  auVar124._0_8_ = 0x7fffffff7fffffff;
  auVar124._12_4_ = 0x7fffffff;
  auVar124._16_4_ = 0x7fffffff;
  auVar124._20_4_ = 0x7fffffff;
  auVar124._24_4_ = 0x7fffffff;
  auVar124._28_4_ = 0x7fffffff;
  local_3c0 = vandps_avx(local_200,auVar124);
  local_450 = ZEXT816(0x3f80000000000000);
  local_3a0 = auVar311;
  uVar93 = (ulong)*(uint *)(prim + lVar98 * 4 + 6);
  do {
    auVar233._8_4_ = 0x3f800000;
    auVar233._0_8_ = 0x3f8000003f800000;
    auVar233._12_4_ = 0x3f800000;
    auVar233._16_4_ = 0x3f800000;
    auVar233._20_4_ = 0x3f800000;
    auVar233._24_4_ = 0x3f800000;
    auVar233._28_4_ = 0x3f800000;
    iVar101 = (int)uVar102;
    auVar226 = vmovshdup_avx(local_450);
    auVar113 = vsubps_avx(auVar226,local_450);
    auVar226 = vshufps_avx(local_450,local_450,0);
    register0x00001210 = auVar226;
    _local_7c0 = auVar226;
    auVar39 = vshufps_avx(auVar113,auVar113,0);
    local_7a0._16_16_ = auVar39;
    local_7a0._0_16_ = auVar39;
    fVar155 = auVar39._0_4_;
    fVar182 = auVar39._4_4_;
    fVar184 = auVar39._8_4_;
    fVar188 = auVar39._12_4_;
    fVar103 = auVar226._0_4_;
    auVar173._0_4_ = fVar103 + fVar155 * 0.0;
    fVar134 = auVar226._4_4_;
    auVar173._4_4_ = fVar134 + fVar182 * 0.14285715;
    fVar138 = auVar226._8_4_;
    auVar173._8_4_ = fVar138 + fVar184 * 0.2857143;
    fVar142 = auVar226._12_4_;
    auVar173._12_4_ = fVar142 + fVar188 * 0.42857146;
    auVar173._16_4_ = fVar103 + fVar155 * 0.5714286;
    auVar173._20_4_ = fVar134 + fVar182 * 0.71428573;
    auVar173._24_4_ = fVar138 + fVar184 * 0.8571429;
    auVar173._28_4_ = fVar142 + fVar188;
    auVar120 = vsubps_avx(auVar233,auVar173);
    fVar186 = auVar311._28_4_;
    fVar212 = auVar120._0_4_;
    fVar108 = auVar120._4_4_;
    fVar238 = auVar120._8_4_;
    fVar107 = auVar120._12_4_;
    fVar211 = auVar120._16_4_;
    fVar105 = auVar120._20_4_;
    fVar239 = auVar120._24_4_;
    fVar263 = auVar344._28_4_ + 1.0 + 1.0;
    fVar356 = fVar186 + fVar263;
    fVar263 = auVar317._28_4_ + fVar263;
    fVar303 = (float)local_220._0_4_ * auVar173._0_4_ + auVar311._0_4_ * fVar212;
    fVar318 = (float)local_220._4_4_ * auVar173._4_4_ + auVar311._4_4_ * fVar108;
    fVar320 = fStack_218 * auVar173._8_4_ + auVar311._8_4_ * fVar238;
    fVar322 = fStack_214 * auVar173._12_4_ + auVar311._12_4_ * fVar107;
    fVar324 = fStack_210 * auVar173._16_4_ + auVar311._16_4_ * fVar211;
    fVar326 = fStack_20c * auVar173._20_4_ + auVar311._20_4_ * fVar105;
    fVar328 = fStack_208 * auVar173._24_4_ + auVar311._24_4_ * fVar239;
    fVar240 = (float)local_240._0_4_ * auVar173._0_4_ + (float)local_1e0._0_4_ * fVar212;
    fVar241 = (float)local_240._4_4_ * auVar173._4_4_ + (float)local_1e0._4_4_ * fVar108;
    fVar242 = fStack_238 * auVar173._8_4_ + fStack_1d8 * fVar238;
    fVar243 = fStack_234 * auVar173._12_4_ + fStack_1d4 * fVar107;
    fVar260 = fStack_230 * auVar173._16_4_ + fStack_1d0 * fVar211;
    fVar261 = fStack_22c * auVar173._20_4_ + fStack_1cc * fVar105;
    fVar262 = fStack_228 * auVar173._24_4_ + fStack_1c8 * fVar239;
    fVar264 = (float)local_260._0_4_ * auVar173._0_4_ + auVar402._0_4_ * fVar212;
    fVar265 = (float)local_260._4_4_ * auVar173._4_4_ + auVar402._4_4_ * fVar108;
    fVar266 = fStack_258 * auVar173._8_4_ + auVar402._8_4_ * fVar238;
    fVar285 = fStack_254 * auVar173._12_4_ + auVar402._12_4_ * fVar107;
    fVar287 = fStack_250 * auVar173._16_4_ + auVar402._16_4_ * fVar211;
    fVar290 = fStack_24c * auVar173._20_4_ + auVar402._20_4_ * fVar105;
    fVar293 = fStack_248 * auVar173._24_4_ + auVar402._24_4_ * fVar239;
    fVar296 = (float)local_280._0_4_ * auVar173._0_4_ + auVar355._0_4_ * fVar212;
    fVar299 = (float)local_280._4_4_ * auVar173._4_4_ + auVar355._4_4_ * fVar108;
    fVar288 = fStack_278 * auVar173._8_4_ + auVar355._8_4_ * fVar238;
    fVar291 = fStack_274 * auVar173._12_4_ + auVar355._12_4_ * fVar107;
    fVar294 = fStack_270 * auVar173._16_4_ + auVar355._16_4_ * fVar211;
    fVar297 = fStack_26c * auVar173._20_4_ + auVar355._20_4_ * fVar105;
    fVar300 = fStack_268 * auVar173._24_4_ + auVar355._24_4_ * fVar239;
    fVar393 = auVar386._28_4_;
    fVar430 = fVar393 + fVar186;
    fVar409 = auVar402._28_4_ + fVar393;
    auVar363._0_4_ =
         fVar212 * (auVar311._0_4_ * auVar173._0_4_ + auVar434._0_4_ * fVar212) +
         auVar173._0_4_ * fVar303;
    auVar363._4_4_ =
         fVar108 * (auVar311._4_4_ * auVar173._4_4_ + auVar434._4_4_ * fVar108) +
         auVar173._4_4_ * fVar318;
    auVar363._8_4_ =
         fVar238 * (auVar311._8_4_ * auVar173._8_4_ + auVar434._8_4_ * fVar238) +
         auVar173._8_4_ * fVar320;
    auVar363._12_4_ =
         fVar107 * (auVar311._12_4_ * auVar173._12_4_ + auVar434._12_4_ * fVar107) +
         auVar173._12_4_ * fVar322;
    auVar363._16_4_ =
         fVar211 * (auVar311._16_4_ * auVar173._16_4_ + auVar434._16_4_ * fVar211) +
         auVar173._16_4_ * fVar324;
    auVar363._20_4_ =
         fVar105 * (auVar311._20_4_ * auVar173._20_4_ + auVar434._20_4_ * fVar105) +
         auVar173._20_4_ * fVar326;
    auVar363._24_4_ =
         fVar239 * (auVar311._24_4_ * auVar173._24_4_ + auVar434._24_4_ * fVar239) +
         auVar173._24_4_ * fVar328;
    auVar363._28_4_ = auVar402._28_4_ + fVar393;
    auVar373._0_4_ =
         fVar212 * ((float)local_1e0._0_4_ * auVar173._0_4_ + auVar386._0_4_ * fVar212) +
         auVar173._0_4_ * fVar240;
    auVar373._4_4_ =
         fVar108 * ((float)local_1e0._4_4_ * auVar173._4_4_ + auVar386._4_4_ * fVar108) +
         auVar173._4_4_ * fVar241;
    auVar373._8_4_ =
         fVar238 * (fStack_1d8 * auVar173._8_4_ + auVar386._8_4_ * fVar238) +
         auVar173._8_4_ * fVar242;
    auVar373._12_4_ =
         fVar107 * (fStack_1d4 * auVar173._12_4_ + auVar386._12_4_ * fVar107) +
         auVar173._12_4_ * fVar243;
    auVar373._16_4_ =
         fVar211 * (fStack_1d0 * auVar173._16_4_ + auVar386._16_4_ * fVar211) +
         auVar173._16_4_ * fVar260;
    auVar373._20_4_ =
         fVar105 * (fStack_1cc * auVar173._20_4_ + auVar386._20_4_ * fVar105) +
         auVar173._20_4_ * fVar261;
    auVar373._24_4_ =
         fVar239 * (fStack_1c8 * auVar173._24_4_ + auVar386._24_4_ * fVar239) +
         auVar173._24_4_ * fVar262;
    auVar373._28_4_ = fStack_204 + fVar393;
    auVar384._0_4_ =
         (auVar402._0_4_ * auVar173._0_4_ + auVar436._0_4_ * fVar212) * fVar212 +
         auVar173._0_4_ * fVar264;
    auVar384._4_4_ =
         (auVar402._4_4_ * auVar173._4_4_ + auVar436._4_4_ * fVar108) * fVar108 +
         auVar173._4_4_ * fVar265;
    auVar384._8_4_ =
         (auVar402._8_4_ * auVar173._8_4_ + auVar436._8_4_ * fVar238) * fVar238 +
         auVar173._8_4_ * fVar266;
    auVar384._12_4_ =
         (auVar402._12_4_ * auVar173._12_4_ + auVar436._12_4_ * fVar107) * fVar107 +
         auVar173._12_4_ * fVar285;
    auVar384._16_4_ =
         (auVar402._16_4_ * auVar173._16_4_ + auVar436._16_4_ * fVar211) * fVar211 +
         auVar173._16_4_ * fVar287;
    auVar384._20_4_ =
         (auVar402._20_4_ * auVar173._20_4_ + auVar436._20_4_ * fVar105) * fVar105 +
         auVar173._20_4_ * fVar290;
    auVar384._24_4_ =
         (auVar402._24_4_ * auVar173._24_4_ + auVar436._24_4_ * fVar239) * fVar239 +
         auVar173._24_4_ * fVar293;
    auVar384._28_4_ = fVar356 + fVar393;
    auVar337._0_4_ =
         auVar173._0_4_ * fVar296 +
         fVar212 * (auVar355._0_4_ * auVar173._0_4_ + auVar377._0_4_ * fVar212);
    auVar337._4_4_ =
         auVar173._4_4_ * fVar299 +
         fVar108 * (auVar355._4_4_ * auVar173._4_4_ + auVar377._4_4_ * fVar108);
    auVar337._8_4_ =
         auVar173._8_4_ * fVar288 +
         fVar238 * (auVar355._8_4_ * auVar173._8_4_ + auVar377._8_4_ * fVar238);
    auVar337._12_4_ =
         auVar173._12_4_ * fVar291 +
         fVar107 * (auVar355._12_4_ * auVar173._12_4_ + auVar377._12_4_ * fVar107);
    auVar337._16_4_ =
         auVar173._16_4_ * fVar294 +
         fVar211 * (auVar355._16_4_ * auVar173._16_4_ + auVar377._16_4_ * fVar211);
    auVar337._20_4_ =
         auVar173._20_4_ * fVar297 +
         fVar105 * (auVar355._20_4_ * auVar173._20_4_ + auVar377._20_4_ * fVar105);
    auVar337._24_4_ =
         auVar173._24_4_ * fVar300 +
         fVar239 * (auVar355._24_4_ * auVar173._24_4_ + auVar377._24_4_ * fVar239);
    auVar337._28_4_ = fVar356 + fStack_264;
    auVar312._0_4_ =
         (auVar173._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar212) *
         auVar173._0_4_ + fVar212 * fVar303;
    auVar312._4_4_ =
         (auVar173._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar108) *
         auVar173._4_4_ + fVar108 * fVar318;
    auVar312._8_4_ =
         (auVar173._8_4_ * fStack_298 + fStack_218 * fVar238) * auVar173._8_4_ + fVar238 * fVar320;
    auVar312._12_4_ =
         (auVar173._12_4_ * fStack_294 + fStack_214 * fVar107) * auVar173._12_4_ + fVar107 * fVar322
    ;
    auVar312._16_4_ =
         (auVar173._16_4_ * fStack_290 + fStack_210 * fVar211) * auVar173._16_4_ + fVar211 * fVar324
    ;
    auVar312._20_4_ =
         (auVar173._20_4_ * fStack_28c + fStack_20c * fVar105) * auVar173._20_4_ + fVar105 * fVar326
    ;
    auVar312._24_4_ =
         (auVar173._24_4_ * fStack_288 + fStack_208 * fVar239) * auVar173._24_4_ + fVar239 * fVar328
    ;
    auVar312._28_4_ = fVar356 + fVar263 + auVar317._28_4_;
    auVar234._0_4_ =
         (auVar173._0_4_ * (float)local_2c0._0_4_ + (float)local_240._0_4_ * fVar212) *
         auVar173._0_4_ + fVar212 * fVar240;
    auVar234._4_4_ =
         (auVar173._4_4_ * (float)local_2c0._4_4_ + (float)local_240._4_4_ * fVar108) *
         auVar173._4_4_ + fVar108 * fVar241;
    auVar234._8_4_ =
         (auVar173._8_4_ * fStack_2b8 + fStack_238 * fVar238) * auVar173._8_4_ + fVar238 * fVar242;
    auVar234._12_4_ =
         (auVar173._12_4_ * fStack_2b4 + fStack_234 * fVar107) * auVar173._12_4_ + fVar107 * fVar243
    ;
    auVar234._16_4_ =
         (auVar173._16_4_ * fStack_2b0 + fStack_230 * fVar211) * auVar173._16_4_ + fVar211 * fVar260
    ;
    auVar234._20_4_ =
         (auVar173._20_4_ * fStack_2ac + fStack_22c * fVar105) * auVar173._20_4_ + fVar105 * fVar261
    ;
    auVar234._24_4_ =
         (auVar173._24_4_ * fStack_2a8 + fStack_228 * fVar239) * auVar173._24_4_ + fVar239 * fVar262
    ;
    auVar234._28_4_ = fVar356 + fVar263 + 1.0;
    auVar254._0_4_ =
         (auVar173._0_4_ * (float)local_2e0._0_4_ + (float)local_260._0_4_ * fVar212) *
         auVar173._0_4_ + fVar212 * fVar264;
    auVar254._4_4_ =
         (auVar173._4_4_ * (float)local_2e0._4_4_ + (float)local_260._4_4_ * fVar108) *
         auVar173._4_4_ + fVar108 * fVar265;
    auVar254._8_4_ =
         (auVar173._8_4_ * fStack_2d8 + fStack_258 * fVar238) * auVar173._8_4_ + fVar238 * fVar266;
    auVar254._12_4_ =
         (auVar173._12_4_ * fStack_2d4 + fStack_254 * fVar107) * auVar173._12_4_ + fVar107 * fVar285
    ;
    auVar254._16_4_ =
         (auVar173._16_4_ * fStack_2d0 + fStack_250 * fVar211) * auVar173._16_4_ + fVar211 * fVar287
    ;
    auVar254._20_4_ =
         (auVar173._20_4_ * fStack_2cc + fStack_24c * fVar105) * auVar173._20_4_ + fVar105 * fVar290
    ;
    auVar254._24_4_ =
         (auVar173._24_4_ * fStack_2c8 + fStack_248 * fVar239) * auVar173._24_4_ + fVar239 * fVar293
    ;
    auVar254._28_4_ = fVar409 + fVar186 + 1.0;
    auVar274._0_4_ =
         (auVar173._0_4_ * (float)local_300._0_4_ + (float)local_280._0_4_ * fVar212) *
         auVar173._0_4_ + fVar212 * fVar296;
    auVar274._4_4_ =
         (auVar173._4_4_ * (float)local_300._4_4_ + (float)local_280._4_4_ * fVar108) *
         auVar173._4_4_ + fVar108 * fVar299;
    auVar274._8_4_ =
         (auVar173._8_4_ * fStack_2f8 + fStack_278 * fVar238) * auVar173._8_4_ + fVar238 * fVar288;
    auVar274._12_4_ =
         (auVar173._12_4_ * fStack_2f4 + fStack_274 * fVar107) * auVar173._12_4_ + fVar107 * fVar291
    ;
    auVar274._16_4_ =
         (auVar173._16_4_ * fStack_2f0 + fStack_270 * fVar211) * auVar173._16_4_ + fVar211 * fVar294
    ;
    auVar274._20_4_ =
         (auVar173._20_4_ * fStack_2ec + fStack_26c * fVar105) * auVar173._20_4_ + fVar105 * fVar297
    ;
    auVar274._24_4_ =
         (auVar173._24_4_ * fStack_2e8 + fStack_268 * fVar239) * auVar173._24_4_ + fVar239 * fVar300
    ;
    auVar274._28_4_ = fVar430 + fVar393 + fVar186;
    fVar104 = auVar363._0_4_ * fVar212 + auVar173._0_4_ * auVar312._0_4_;
    fVar135 = auVar363._4_4_ * fVar108 + auVar173._4_4_ * auVar312._4_4_;
    fVar139 = auVar363._8_4_ * fVar238 + auVar173._8_4_ * auVar312._8_4_;
    fVar143 = auVar363._12_4_ * fVar107 + auVar173._12_4_ * auVar312._12_4_;
    fVar145 = auVar363._16_4_ * fVar211 + auVar173._16_4_ * auVar312._16_4_;
    fVar148 = auVar363._20_4_ * fVar105 + auVar173._20_4_ * auVar312._20_4_;
    fVar151 = auVar363._24_4_ * fVar239 + auVar173._24_4_ * auVar312._24_4_;
    fVar154 = fVar430 + fVar356;
    local_4e0._0_4_ = auVar373._0_4_ * fVar212 + auVar173._0_4_ * auVar234._0_4_;
    local_4e0._4_4_ = auVar373._4_4_ * fVar108 + auVar173._4_4_ * auVar234._4_4_;
    local_4e0._8_4_ = auVar373._8_4_ * fVar238 + auVar173._8_4_ * auVar234._8_4_;
    local_4e0._12_4_ = auVar373._12_4_ * fVar107 + auVar173._12_4_ * auVar234._12_4_;
    local_4e0._16_4_ = auVar373._16_4_ * fVar211 + auVar173._16_4_ * auVar234._16_4_;
    local_4e0._20_4_ = auVar373._20_4_ * fVar105 + auVar173._20_4_ * auVar234._20_4_;
    local_4e0._24_4_ = auVar373._24_4_ * fVar239 + auVar173._24_4_ * auVar234._24_4_;
    local_4e0._28_4_ = fVar356 + fVar409;
    local_4c0._0_4_ = auVar384._0_4_ * fVar212 + auVar173._0_4_ * auVar254._0_4_;
    local_4c0._4_4_ = auVar384._4_4_ * fVar108 + auVar173._4_4_ * auVar254._4_4_;
    local_4c0._8_4_ = auVar384._8_4_ * fVar238 + auVar173._8_4_ * auVar254._8_4_;
    local_4c0._12_4_ = auVar384._12_4_ * fVar107 + auVar173._12_4_ * auVar254._12_4_;
    local_4c0._16_4_ = auVar384._16_4_ * fVar211 + auVar173._16_4_ * auVar254._16_4_;
    local_4c0._20_4_ = auVar384._20_4_ * fVar105 + auVar173._20_4_ * auVar254._20_4_;
    local_4c0._24_4_ = auVar384._24_4_ * fVar239 + auVar173._24_4_ * auVar254._24_4_;
    local_4c0._28_4_ = fVar409 + fVar356;
    local_ae0._0_4_ = auVar113._0_4_;
    local_640._0_4_ = fVar212 * auVar337._0_4_ + auVar173._0_4_ * auVar274._0_4_;
    local_640._4_4_ = fVar108 * auVar337._4_4_ + auVar173._4_4_ * auVar274._4_4_;
    local_640._8_4_ = fVar238 * auVar337._8_4_ + auVar173._8_4_ * auVar274._8_4_;
    local_640._12_4_ = fVar107 * auVar337._12_4_ + auVar173._12_4_ * auVar274._12_4_;
    local_640._16_4_ = fVar211 * auVar337._16_4_ + auVar173._16_4_ * auVar274._16_4_;
    local_640._20_4_ = fVar105 * auVar337._20_4_ + auVar173._20_4_ * auVar274._20_4_;
    local_640._24_4_ = fVar239 * auVar337._24_4_ + auVar173._24_4_ * auVar274._24_4_;
    local_640._28_4_ = auVar120._28_4_ + auVar173._28_4_;
    auVar120 = vsubps_avx(auVar312,auVar363);
    auVar176 = vsubps_avx(auVar234,auVar373);
    auVar35 = vsubps_avx(auVar254,auVar384);
    auVar36 = vsubps_avx(auVar274,auVar337);
    auVar226 = vshufps_avx(ZEXT416((uint)((float)local_ae0._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_ae0._0_4_ * 0.04761905)),0);
    fVar211 = auVar226._0_4_;
    fVar395 = fVar211 * auVar120._0_4_ * 3.0;
    fVar239 = auVar226._4_4_;
    fVar403 = fVar239 * auVar120._4_4_ * 3.0;
    local_820._4_4_ = fVar403;
    local_820._0_4_ = fVar395;
    fVar243 = auVar226._8_4_;
    fVar404 = fVar243 * auVar120._8_4_ * 3.0;
    fStack_818 = fVar404;
    fVar264 = auVar226._12_4_;
    fVar405 = fVar264 * auVar120._12_4_ * 3.0;
    fStack_814 = fVar405;
    fVar406 = fVar211 * auVar120._16_4_ * 3.0;
    unique0x1000c33c = fVar406;
    fVar407 = fVar239 * auVar120._20_4_ * 3.0;
    unique0x1000c340 = fVar407;
    fVar408 = fVar243 * auVar120._24_4_ * 3.0;
    unique0x1000c344 = fVar408;
    unique0x1000c348 = fVar409;
    fVar378 = fVar211 * auVar176._0_4_ * 3.0;
    fVar387 = fVar239 * auVar176._4_4_ * 3.0;
    local_a00._4_4_ = fVar387;
    local_a00._0_4_ = fVar378;
    fVar388 = fVar243 * auVar176._8_4_ * 3.0;
    local_a00._8_4_ = fVar388;
    fVar389 = fVar264 * auVar176._12_4_ * 3.0;
    local_a00._12_4_ = fVar389;
    fVar390 = fVar211 * auVar176._16_4_ * 3.0;
    local_a00._16_4_ = fVar390;
    fVar391 = fVar239 * auVar176._20_4_ * 3.0;
    local_a00._20_4_ = fVar391;
    fVar392 = fVar243 * auVar176._24_4_ * 3.0;
    local_a00._24_4_ = fVar392;
    local_a00._28_4_ = auVar384._28_4_;
    fVar410 = fVar211 * auVar35._0_4_ * 3.0;
    fVar415 = fVar239 * auVar35._4_4_ * 3.0;
    local_600._4_4_ = fVar415;
    local_600._0_4_ = fVar410;
    fVar417 = fVar243 * auVar35._8_4_ * 3.0;
    local_600._8_4_ = fVar417;
    fVar419 = fVar264 * auVar35._12_4_ * 3.0;
    local_600._12_4_ = fVar419;
    fVar421 = fVar211 * auVar35._16_4_ * 3.0;
    local_600._16_4_ = fVar421;
    fVar424 = fVar239 * auVar35._20_4_ * 3.0;
    local_600._20_4_ = fVar424;
    fVar427 = fVar243 * auVar35._24_4_ * 3.0;
    local_600._24_4_ = fVar427;
    local_600._28_4_ = fVar430;
    fVar105 = fVar211 * auVar36._0_4_ * 3.0;
    fVar242 = fVar239 * auVar36._4_4_ * 3.0;
    auVar42._4_4_ = fVar242;
    auVar42._0_4_ = fVar105;
    fVar260 = fVar243 * auVar36._8_4_ * 3.0;
    auVar42._8_4_ = fVar260;
    fVar265 = fVar264 * auVar36._12_4_ * 3.0;
    auVar42._12_4_ = fVar265;
    fVar211 = fVar211 * auVar36._16_4_ * 3.0;
    auVar42._16_4_ = fVar211;
    fVar239 = fVar239 * auVar36._20_4_ * 3.0;
    auVar42._20_4_ = fVar239;
    fVar243 = fVar243 * auVar36._24_4_ * 3.0;
    auVar42._24_4_ = fVar243;
    auVar42._28_4_ = fVar264;
    auVar120 = vperm2f128_avx(local_4e0,local_4e0,1);
    auVar120 = vshufps_avx(auVar120,local_4e0,0x30);
    _local_940 = vshufps_avx(local_4e0,auVar120,0x29);
    auVar120 = vperm2f128_avx(local_4c0,local_4c0,1);
    auVar120 = vshufps_avx(auVar120,local_4c0,0x30);
    local_840 = vshufps_avx(local_4c0,auVar120,0x29);
    auVar176 = vsubps_avx(local_640,auVar42);
    auVar120 = vperm2f128_avx(auVar176,auVar176,1);
    auVar120 = vshufps_avx(auVar120,auVar176,0x30);
    local_660 = vshufps_avx(auVar176,auVar120,0x29);
    _local_580 = vsubps_avx(_local_940,local_4e0);
    _local_500 = vsubps_avx(local_840,local_4c0);
    fVar108 = local_580._0_4_;
    fVar186 = local_580._4_4_;
    auVar43._4_4_ = fVar415 * fVar186;
    auVar43._0_4_ = fVar410 * fVar108;
    fVar261 = local_580._8_4_;
    auVar43._8_4_ = fVar417 * fVar261;
    fVar285 = local_580._12_4_;
    auVar43._12_4_ = fVar419 * fVar285;
    fVar288 = local_580._16_4_;
    auVar43._16_4_ = fVar421 * fVar288;
    fVar318 = local_580._20_4_;
    auVar43._20_4_ = fVar424 * fVar318;
    fVar356 = local_580._24_4_;
    auVar43._24_4_ = fVar427 * fVar356;
    auVar43._28_4_ = auVar176._28_4_;
    fVar238 = local_500._0_4_;
    fVar240 = local_500._4_4_;
    auVar44._4_4_ = fVar387 * fVar240;
    auVar44._0_4_ = fVar378 * fVar238;
    fVar262 = local_500._8_4_;
    auVar44._8_4_ = fVar388 * fVar262;
    fVar287 = local_500._12_4_;
    auVar44._12_4_ = fVar389 * fVar287;
    fVar291 = local_500._16_4_;
    auVar44._16_4_ = fVar390 * fVar291;
    fVar320 = local_500._20_4_;
    auVar44._20_4_ = fVar391 * fVar320;
    fVar393 = local_500._24_4_;
    auVar44._24_4_ = fVar392 * fVar393;
    auVar44._28_4_ = auVar120._28_4_;
    auVar35 = vsubps_avx(auVar44,auVar43);
    auVar89._4_4_ = fVar135;
    auVar89._0_4_ = fVar104;
    auVar89._8_4_ = fVar139;
    auVar89._12_4_ = fVar143;
    auVar89._16_4_ = fVar145;
    auVar89._20_4_ = fVar148;
    auVar89._24_4_ = fVar151;
    auVar89._28_4_ = fVar154;
    auVar120 = vperm2f128_avx(auVar89,auVar89,1);
    auVar120 = vshufps_avx(auVar120,auVar89,0x30);
    local_a20 = vshufps_avx(auVar89,auVar120,0x29);
    _local_700 = vsubps_avx(local_a20,auVar89);
    auVar45._4_4_ = fVar403 * fVar240;
    auVar45._0_4_ = fVar395 * fVar238;
    auVar45._8_4_ = fVar404 * fVar262;
    auVar45._12_4_ = fVar405 * fVar287;
    auVar45._16_4_ = fVar406 * fVar291;
    auVar45._20_4_ = fVar407 * fVar320;
    auVar45._24_4_ = fVar408 * fVar393;
    auVar45._28_4_ = auVar120._28_4_;
    fVar107 = local_700._0_4_;
    fVar241 = local_700._4_4_;
    auVar46._4_4_ = fVar415 * fVar241;
    auVar46._0_4_ = fVar410 * fVar107;
    fVar263 = local_700._8_4_;
    auVar46._8_4_ = fVar417 * fVar263;
    fVar290 = local_700._12_4_;
    auVar46._12_4_ = fVar419 * fVar290;
    fVar294 = local_700._16_4_;
    auVar46._16_4_ = fVar421 * fVar294;
    fVar322 = local_700._20_4_;
    auVar46._20_4_ = fVar424 * fVar322;
    fVar430 = local_700._24_4_;
    auVar46._24_4_ = fVar427 * fVar430;
    auVar46._28_4_ = local_840._28_4_;
    auVar36 = vsubps_avx(auVar46,auVar45);
    auVar47._4_4_ = fVar387 * fVar241;
    auVar47._0_4_ = fVar378 * fVar107;
    auVar47._8_4_ = fVar388 * fVar263;
    auVar47._12_4_ = fVar389 * fVar290;
    auVar47._16_4_ = fVar390 * fVar294;
    auVar47._20_4_ = fVar391 * fVar322;
    auVar47._24_4_ = fVar392 * fVar430;
    auVar47._28_4_ = local_840._28_4_;
    auVar48._4_4_ = fVar403 * fVar186;
    auVar48._0_4_ = fVar395 * fVar108;
    auVar48._8_4_ = fVar404 * fVar261;
    auVar48._12_4_ = fVar405 * fVar285;
    auVar48._16_4_ = fVar406 * fVar288;
    auVar48._20_4_ = fVar407 * fVar318;
    auVar48._24_4_ = fVar408 * fVar356;
    auVar48._28_4_ = auVar373._28_4_;
    auVar351 = vsubps_avx(auVar48,auVar47);
    fVar212 = auVar351._28_4_;
    auVar203._0_4_ = fVar107 * fVar107 + fVar108 * fVar108 + fVar238 * fVar238;
    auVar203._4_4_ = fVar241 * fVar241 + fVar186 * fVar186 + fVar240 * fVar240;
    auVar203._8_4_ = fVar263 * fVar263 + fVar261 * fVar261 + fVar262 * fVar262;
    auVar203._12_4_ = fVar290 * fVar290 + fVar285 * fVar285 + fVar287 * fVar287;
    auVar203._16_4_ = fVar294 * fVar294 + fVar288 * fVar288 + fVar291 * fVar291;
    auVar203._20_4_ = fVar322 * fVar322 + fVar318 * fVar318 + fVar320 * fVar320;
    auVar203._24_4_ = fVar430 * fVar430 + fVar356 * fVar356 + fVar393 * fVar393;
    auVar203._28_4_ = fVar212 + fVar212 + auVar35._28_4_;
    auVar120 = vrcpps_avx(auVar203);
    fVar266 = auVar120._0_4_;
    fVar293 = auVar120._4_4_;
    auVar49._4_4_ = fVar293 * auVar203._4_4_;
    auVar49._0_4_ = fVar266 * auVar203._0_4_;
    fVar296 = auVar120._8_4_;
    auVar49._8_4_ = fVar296 * auVar203._8_4_;
    fVar299 = auVar120._12_4_;
    auVar49._12_4_ = fVar299 * auVar203._12_4_;
    fVar297 = auVar120._16_4_;
    auVar49._16_4_ = fVar297 * auVar203._16_4_;
    fVar300 = auVar120._20_4_;
    auVar49._20_4_ = fVar300 * auVar203._20_4_;
    fVar303 = auVar120._24_4_;
    auVar49._24_4_ = fVar303 * auVar203._24_4_;
    auVar49._28_4_ = auVar373._28_4_;
    auVar125._8_4_ = 0x3f800000;
    auVar125._0_8_ = 0x3f8000003f800000;
    auVar125._12_4_ = 0x3f800000;
    auVar125._16_4_ = 0x3f800000;
    auVar125._20_4_ = 0x3f800000;
    auVar125._24_4_ = 0x3f800000;
    auVar125._28_4_ = 0x3f800000;
    auVar37 = vsubps_avx(auVar125,auVar49);
    fVar266 = auVar37._0_4_ * fVar266 + fVar266;
    fVar293 = auVar37._4_4_ * fVar293 + fVar293;
    fVar296 = auVar37._8_4_ * fVar296 + fVar296;
    fVar299 = auVar37._12_4_ * fVar299 + fVar299;
    fVar297 = auVar37._16_4_ * fVar297 + fVar297;
    fVar300 = auVar37._20_4_ * fVar300 + fVar300;
    fVar303 = auVar37._24_4_ * fVar303 + fVar303;
    auVar176 = vperm2f128_avx(local_a00,local_a00,1);
    auVar176 = vshufps_avx(auVar176,local_a00,0x30);
    local_a40 = vshufps_avx(local_a00,auVar176,0x29);
    auVar176 = vperm2f128_avx(local_600,local_600,1);
    auVar176 = vshufps_avx(auVar176,local_600,0x30);
    local_780 = vshufps_avx(local_600,auVar176,0x29);
    fVar106 = local_780._0_4_;
    fVar136 = local_780._4_4_;
    auVar50._4_4_ = fVar136 * fVar186;
    auVar50._0_4_ = fVar106 * fVar108;
    fVar140 = local_780._8_4_;
    auVar50._8_4_ = fVar140 * fVar261;
    fVar144 = local_780._12_4_;
    auVar50._12_4_ = fVar144 * fVar285;
    fVar146 = local_780._16_4_;
    auVar50._16_4_ = fVar146 * fVar288;
    fVar149 = local_780._20_4_;
    auVar50._20_4_ = fVar149 * fVar318;
    fVar152 = local_780._24_4_;
    auVar50._24_4_ = fVar152 * fVar356;
    auVar50._28_4_ = auVar176._28_4_;
    fVar156 = local_a40._0_4_;
    fVar183 = local_a40._4_4_;
    auVar51._4_4_ = fVar183 * fVar240;
    auVar51._0_4_ = fVar156 * fVar238;
    fVar185 = local_a40._8_4_;
    auVar51._8_4_ = fVar185 * fVar262;
    fVar189 = local_a40._12_4_;
    auVar51._12_4_ = fVar189 * fVar287;
    fVar190 = local_a40._16_4_;
    auVar51._16_4_ = fVar190 * fVar291;
    fVar191 = local_a40._20_4_;
    auVar51._20_4_ = fVar191 * fVar320;
    fVar192 = local_a40._24_4_;
    auVar51._24_4_ = fVar192 * fVar393;
    auVar51._28_4_ = auVar384._28_4_;
    auVar376 = vsubps_avx(auVar51,auVar50);
    auVar176 = vperm2f128_avx(_local_820,_local_820,1);
    auVar176 = vshufps_avx(auVar176,_local_820,0x30);
    local_760 = vshufps_avx(_local_820,auVar176,0x29);
    fVar411 = local_760._0_4_;
    fVar416 = local_760._4_4_;
    auVar52._4_4_ = fVar416 * fVar240;
    auVar52._0_4_ = fVar411 * fVar238;
    fVar418 = local_760._8_4_;
    auVar52._8_4_ = fVar418 * fVar262;
    fVar420 = local_760._12_4_;
    auVar52._12_4_ = fVar420 * fVar287;
    fVar422 = local_760._16_4_;
    auVar52._16_4_ = fVar422 * fVar291;
    fVar425 = local_760._20_4_;
    auVar52._20_4_ = fVar425 * fVar320;
    fVar428 = local_760._24_4_;
    auVar52._24_4_ = fVar428 * fVar393;
    auVar52._28_4_ = auVar176._28_4_;
    auVar38 = local_780;
    auVar53._4_4_ = fVar241 * fVar136;
    auVar53._0_4_ = fVar107 * fVar106;
    auVar53._8_4_ = fVar263 * fVar140;
    auVar53._12_4_ = fVar290 * fVar144;
    auVar53._16_4_ = fVar294 * fVar146;
    auVar53._20_4_ = fVar322 * fVar149;
    auVar53._24_4_ = fVar430 * fVar152;
    auVar53._28_4_ = fVar409;
    auVar176 = vsubps_avx(auVar53,auVar52);
    auVar54._4_4_ = fVar241 * fVar183;
    auVar54._0_4_ = fVar107 * fVar156;
    auVar54._8_4_ = fVar263 * fVar185;
    auVar54._12_4_ = fVar290 * fVar189;
    auVar54._16_4_ = fVar294 * fVar190;
    auVar54._20_4_ = fVar322 * fVar191;
    auVar54._24_4_ = fVar430 * fVar192;
    auVar54._28_4_ = fVar409;
    auVar55._4_4_ = fVar416 * fVar186;
    auVar55._0_4_ = fVar411 * fVar108;
    auVar55._8_4_ = fVar418 * fVar261;
    auVar55._12_4_ = fVar420 * fVar285;
    auVar55._16_4_ = fVar422 * fVar288;
    auVar55._20_4_ = fVar425 * fVar318;
    fVar137 = local_760._28_4_;
    auVar55._24_4_ = fVar428 * fVar356;
    auVar55._28_4_ = fVar137;
    auVar352 = vsubps_avx(auVar55,auVar54);
    fVar141 = auVar352._28_4_;
    fVar394 = auVar176._28_4_ + fVar141;
    auVar56._4_4_ =
         (auVar35._4_4_ * auVar35._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar351._4_4_ * auVar351._4_4_) * fVar293;
    auVar56._0_4_ =
         (auVar35._0_4_ * auVar35._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar351._0_4_ * auVar351._0_4_) * fVar266;
    auVar56._8_4_ =
         (auVar35._8_4_ * auVar35._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar351._8_4_ * auVar351._8_4_) * fVar296;
    auVar56._12_4_ =
         (auVar35._12_4_ * auVar35._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar351._12_4_ * auVar351._12_4_) * fVar299;
    auVar56._16_4_ =
         (auVar35._16_4_ * auVar35._16_4_ +
         auVar36._16_4_ * auVar36._16_4_ + auVar351._16_4_ * auVar351._16_4_) * fVar297;
    auVar56._20_4_ =
         (auVar35._20_4_ * auVar35._20_4_ +
         auVar36._20_4_ * auVar36._20_4_ + auVar351._20_4_ * auVar351._20_4_) * fVar300;
    auVar56._24_4_ =
         (auVar35._24_4_ * auVar35._24_4_ +
         auVar36._24_4_ * auVar36._24_4_ + auVar351._24_4_ * auVar351._24_4_) * fVar303;
    auVar56._28_4_ = auVar35._28_4_ + auVar36._28_4_ + fVar212;
    auVar57._4_4_ =
         (auVar376._4_4_ * auVar376._4_4_ +
         auVar176._4_4_ * auVar176._4_4_ + auVar352._4_4_ * auVar352._4_4_) * fVar293;
    auVar57._0_4_ =
         (auVar376._0_4_ * auVar376._0_4_ +
         auVar176._0_4_ * auVar176._0_4_ + auVar352._0_4_ * auVar352._0_4_) * fVar266;
    auVar57._8_4_ =
         (auVar376._8_4_ * auVar376._8_4_ +
         auVar176._8_4_ * auVar176._8_4_ + auVar352._8_4_ * auVar352._8_4_) * fVar296;
    auVar57._12_4_ =
         (auVar376._12_4_ * auVar376._12_4_ +
         auVar176._12_4_ * auVar176._12_4_ + auVar352._12_4_ * auVar352._12_4_) * fVar299;
    auVar57._16_4_ =
         (auVar376._16_4_ * auVar376._16_4_ +
         auVar176._16_4_ * auVar176._16_4_ + auVar352._16_4_ * auVar352._16_4_) * fVar297;
    auVar57._20_4_ =
         (auVar376._20_4_ * auVar376._20_4_ +
         auVar176._20_4_ * auVar176._20_4_ + auVar352._20_4_ * auVar352._20_4_) * fVar300;
    auVar57._24_4_ =
         (auVar376._24_4_ * auVar376._24_4_ +
         auVar176._24_4_ * auVar176._24_4_ + auVar352._24_4_ * auVar352._24_4_) * fVar303;
    auVar57._28_4_ = auVar37._28_4_ + auVar120._28_4_;
    auVar120 = vmaxps_avx(auVar56,auVar57);
    auVar176 = vperm2f128_avx(local_640,local_640,1);
    auVar176 = vshufps_avx(auVar176,local_640,0x30);
    local_7e0 = vshufps_avx(local_640,auVar176,0x29);
    local_680._0_4_ = (float)local_640._0_4_ + fVar105;
    local_680._4_4_ = local_640._4_4_ + fVar242;
    fStack_678 = local_640._8_4_ + fVar260;
    fStack_674 = local_640._12_4_ + fVar265;
    fStack_670 = local_640._16_4_ + fVar211;
    fStack_66c = local_640._20_4_ + fVar239;
    fStack_668 = local_640._24_4_ + fVar243;
    fStack_664 = local_640._28_4_ + fVar264;
    auVar176 = vmaxps_avx(local_640,_local_680);
    auVar35 = vmaxps_avx(local_660,local_7e0);
    auVar176 = vmaxps_avx(auVar176,auVar35);
    auVar35 = vrsqrtps_avx(auVar203);
    fVar212 = auVar35._0_4_;
    fVar211 = auVar35._4_4_;
    fVar105 = auVar35._8_4_;
    fVar239 = auVar35._12_4_;
    fVar242 = auVar35._16_4_;
    fVar243 = auVar35._20_4_;
    fVar260 = auVar35._24_4_;
    local_5a0._0_4_ = fVar212 * 1.5 + fVar212 * fVar212 * fVar212 * auVar203._0_4_ * -0.5;
    local_5a0._4_4_ = fVar211 * 1.5 + fVar211 * fVar211 * fVar211 * auVar203._4_4_ * -0.5;
    fStack_598 = fVar105 * 1.5 + fVar105 * fVar105 * fVar105 * auVar203._8_4_ * -0.5;
    fStack_594 = fVar239 * 1.5 + fVar239 * fVar239 * fVar239 * auVar203._12_4_ * -0.5;
    fStack_590 = fVar242 * 1.5 + fVar242 * fVar242 * fVar242 * auVar203._16_4_ * -0.5;
    fStack_58c = fVar243 * 1.5 + fVar243 * fVar243 * fVar243 * auVar203._20_4_ * -0.5;
    fStack_588 = fVar260 * 1.5 + fVar260 * fVar260 * fVar260 * auVar203._24_4_ * -0.5;
    auVar351 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar36 = vsubps_avx(auVar351,local_4e0);
    local_860 = vsubps_avx(auVar351,local_4c0);
    fVar211 = local_860._0_4_;
    fVar242 = local_860._4_4_;
    fVar264 = local_860._8_4_;
    fVar293 = local_860._12_4_;
    fVar297 = local_860._16_4_;
    fVar324 = local_860._20_4_;
    fVar423 = local_860._24_4_;
    fVar105 = auVar36._0_4_;
    fVar243 = auVar36._4_4_;
    fVar265 = auVar36._8_4_;
    fVar296 = auVar36._12_4_;
    fVar300 = auVar36._16_4_;
    fVar326 = auVar36._20_4_;
    fVar426 = auVar36._24_4_;
    auVar90._4_4_ = fVar135;
    auVar90._0_4_ = fVar104;
    auVar90._8_4_ = fVar139;
    auVar90._12_4_ = fVar143;
    auVar90._16_4_ = fVar145;
    auVar90._20_4_ = fVar148;
    auVar90._24_4_ = fVar151;
    auVar90._28_4_ = fVar154;
    auVar352 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar351 = vsubps_avx(auVar352,auVar90);
    fVar239 = auVar351._0_4_;
    fVar260 = auVar351._4_4_;
    fVar266 = auVar351._8_4_;
    fVar299 = auVar351._12_4_;
    fVar303 = auVar351._16_4_;
    fVar328 = auVar351._20_4_;
    fVar429 = auVar351._24_4_;
    auVar374._0_4_ = local_6a0 * fVar239 + local_6c0 * fVar105 + local_4a0 * fVar211;
    auVar374._4_4_ = fStack_69c * fVar260 + fStack_6bc * fVar243 + fStack_49c * fVar242;
    auVar374._8_4_ = fStack_698 * fVar266 + fStack_6b8 * fVar265 + fStack_498 * fVar264;
    auVar374._12_4_ = fStack_694 * fVar299 + fStack_6b4 * fVar296 + fStack_494 * fVar293;
    auVar374._16_4_ = fStack_690 * fVar303 + fStack_6b0 * fVar300 + fStack_490 * fVar297;
    auVar374._20_4_ = fStack_68c * fVar328 + fStack_6ac * fVar326 + fStack_48c * fVar324;
    auVar374._24_4_ = fStack_688 * fVar429 + fStack_6a8 * fVar426 + fStack_488 * fVar423;
    auVar374._28_4_ = fVar141 + fVar394 + auVar376._28_4_ + fVar394;
    auVar400._0_4_ = fVar239 * fVar239 + fVar105 * fVar105 + fVar211 * fVar211;
    auVar400._4_4_ = fVar260 * fVar260 + fVar243 * fVar243 + fVar242 * fVar242;
    auVar400._8_4_ = fVar266 * fVar266 + fVar265 * fVar265 + fVar264 * fVar264;
    auVar400._12_4_ = fVar299 * fVar299 + fVar296 * fVar296 + fVar293 * fVar293;
    auVar400._16_4_ = fVar303 * fVar303 + fVar300 * fVar300 + fVar297 * fVar297;
    auVar400._20_4_ = fVar328 * fVar328 + fVar326 * fVar326 + fVar324 * fVar324;
    auVar400._24_4_ = fVar429 * fVar429 + fVar426 * fVar426 + fVar423 * fVar423;
    auVar400._28_4_ = fVar137 + fVar137 + fVar141;
    fVar302 = local_500._28_4_ + fStack_484;
    local_720._0_4_ =
         local_6a0 * fVar107 * (float)local_5a0._0_4_ +
         fVar108 * (float)local_5a0._0_4_ * local_6c0 + fVar238 * (float)local_5a0._0_4_ * local_4a0
    ;
    local_720._4_4_ =
         fStack_69c * fVar241 * (float)local_5a0._4_4_ +
         fVar186 * (float)local_5a0._4_4_ * fStack_6bc +
         fVar240 * (float)local_5a0._4_4_ * fStack_49c;
    fStack_718 = fStack_698 * fVar263 * fStack_598 +
                 fVar261 * fStack_598 * fStack_6b8 + fVar262 * fStack_598 * fStack_498;
    fStack_714 = fStack_694 * fVar290 * fStack_594 +
                 fVar285 * fStack_594 * fStack_6b4 + fVar287 * fStack_594 * fStack_494;
    fStack_710 = fStack_690 * fVar294 * fStack_590 +
                 fVar288 * fStack_590 * fStack_6b0 + fVar291 * fStack_590 * fStack_490;
    fStack_70c = fStack_68c * fVar322 * fStack_58c +
                 fVar318 * fStack_58c * fStack_6ac + fVar320 * fStack_58c * fStack_48c;
    fStack_708 = fStack_688 * fVar430 * fStack_588 +
                 fVar356 * fStack_588 * fStack_6a8 + fVar393 * fStack_588 * fStack_488;
    fVar212 = local_580._28_4_ + fVar302;
    fVar304 = fVar239 * fVar107 * (float)local_5a0._0_4_ +
              fVar108 * (float)local_5a0._0_4_ * fVar105 +
              fVar238 * (float)local_5a0._0_4_ * fVar211;
    fVar319 = fVar260 * fVar241 * (float)local_5a0._4_4_ +
              fVar186 * (float)local_5a0._4_4_ * fVar243 +
              fVar240 * (float)local_5a0._4_4_ * fVar242;
    fStack_878 = fVar266 * fVar263 * fStack_598 +
                 fVar261 * fStack_598 * fVar265 + fVar262 * fStack_598 * fVar264;
    fStack_874 = fVar299 * fVar290 * fStack_594 +
                 fVar285 * fStack_594 * fVar296 + fVar287 * fStack_594 * fVar293;
    fStack_870 = fVar303 * fVar294 * fStack_590 +
                 fVar288 * fStack_590 * fVar300 + fVar291 * fStack_590 * fVar297;
    fStack_86c = fVar328 * fVar322 * fStack_58c +
                 fVar318 * fStack_58c * fVar326 + fVar320 * fStack_58c * fVar324;
    fStack_868 = fVar429 * fVar430 * fStack_588 +
                 fVar356 * fStack_588 * fVar426 + fVar393 * fStack_588 * fVar423;
    fStack_864 = local_500._28_4_ + fVar212;
    auVar58._4_4_ = (float)local_720._4_4_ * fVar319;
    auVar58._0_4_ = (float)local_720._0_4_ * fVar304;
    auVar58._8_4_ = fStack_718 * fStack_878;
    auVar58._12_4_ = fStack_714 * fStack_874;
    auVar58._16_4_ = fStack_710 * fStack_870;
    auVar58._20_4_ = fStack_70c * fStack_86c;
    auVar58._24_4_ = fStack_708 * fStack_868;
    auVar58._28_4_ = fVar212;
    auVar351 = vsubps_avx(auVar374,auVar58);
    auVar59._4_4_ = fVar319 * fVar319;
    auVar59._0_4_ = fVar304 * fVar304;
    auVar59._8_4_ = fStack_878 * fStack_878;
    auVar59._12_4_ = fStack_874 * fStack_874;
    auVar59._16_4_ = fStack_870 * fStack_870;
    auVar59._20_4_ = fStack_86c * fStack_86c;
    auVar59._24_4_ = fStack_868 * fStack_868;
    auVar59._28_4_ = fStack_864;
    auVar37 = vsubps_avx(auVar400,auVar59);
    auVar317 = ZEXT3264(auVar37);
    _local_560 = vsqrtps_avx(auVar120);
    fVar212 = (local_560._0_4_ + auVar176._0_4_) * 1.0000002;
    fVar137 = (local_560._4_4_ + auVar176._4_4_) * 1.0000002;
    fVar141 = (local_560._8_4_ + auVar176._8_4_) * 1.0000002;
    fVar394 = (local_560._12_4_ + auVar176._12_4_) * 1.0000002;
    fVar147 = (local_560._16_4_ + auVar176._16_4_) * 1.0000002;
    fVar150 = (local_560._20_4_ + auVar176._20_4_) * 1.0000002;
    fVar153 = (local_560._24_4_ + auVar176._24_4_) * 1.0000002;
    auVar60._4_4_ = fVar137 * fVar137;
    auVar60._0_4_ = fVar212 * fVar212;
    auVar60._8_4_ = fVar141 * fVar141;
    auVar60._12_4_ = fVar394 * fVar394;
    auVar60._16_4_ = fVar147 * fVar147;
    auVar60._20_4_ = fVar150 * fVar150;
    auVar60._24_4_ = fVar153 * fVar153;
    auVar60._28_4_ = local_560._28_4_ + auVar176._28_4_;
    fVar141 = auVar351._0_4_ + auVar351._0_4_;
    fVar394 = auVar351._4_4_ + auVar351._4_4_;
    local_360._0_8_ = CONCAT44(fVar394,fVar141);
    local_360._8_4_ = auVar351._8_4_ + auVar351._8_4_;
    local_360._12_4_ = auVar351._12_4_ + auVar351._12_4_;
    local_360._16_4_ = auVar351._16_4_ + auVar351._16_4_;
    local_360._20_4_ = auVar351._20_4_ + auVar351._20_4_;
    local_360._24_4_ = auVar351._24_4_ + auVar351._24_4_;
    local_360._28_4_ = auVar351._28_4_ + auVar351._28_4_;
    auVar176 = vsubps_avx(auVar37,auVar60);
    local_340._4_4_ = (float)local_720._4_4_ * (float)local_720._4_4_;
    local_340._0_4_ = (float)local_720._0_4_ * (float)local_720._0_4_;
    local_340._8_4_ = fStack_718 * fStack_718;
    local_340._12_4_ = fStack_714 * fStack_714;
    local_340._16_4_ = fStack_710 * fStack_710;
    local_340._20_4_ = fStack_70c * fStack_70c;
    fVar137 = auVar36._28_4_;
    local_340._24_4_ = fStack_708 * fStack_708;
    local_340._28_4_ = fVar137;
    local_5c0 = vsubps_avx(local_200,local_340);
    local_800._4_4_ = fVar394 * fVar394;
    local_800._0_4_ = fVar141 * fVar141;
    fStack_7f8 = local_360._8_4_ * local_360._8_4_;
    fStack_7f4 = local_360._12_4_ * local_360._12_4_;
    fStack_7f0 = local_360._16_4_ * local_360._16_4_;
    fStack_7ec = local_360._20_4_ * local_360._20_4_;
    fStack_7e8 = local_360._24_4_ * local_360._24_4_;
    fStack_7e4 = 1.0000002;
    fVar147 = local_5c0._0_4_;
    local_6e0._0_4_ = fVar147 * 4.0;
    fVar150 = local_5c0._4_4_;
    local_6e0._4_4_ = fVar150 * 4.0;
    fVar153 = local_5c0._8_4_;
    fStack_6d8 = fVar153 * 4.0;
    fVar365 = local_5c0._12_4_;
    fStack_6d4 = fVar365 * 4.0;
    fVar366 = local_5c0._16_4_;
    fStack_6d0 = fVar366 * 4.0;
    fVar367 = local_5c0._20_4_;
    fStack_6cc = fVar367 * 4.0;
    fVar368 = local_5c0._24_4_;
    fStack_6c8 = fVar368 * 4.0;
    fStack_6c4 = 4.0;
    auVar61._4_4_ = auVar176._4_4_ * (float)local_6e0._4_4_;
    auVar61._0_4_ = auVar176._0_4_ * (float)local_6e0._0_4_;
    auVar61._8_4_ = auVar176._8_4_ * fStack_6d8;
    auVar61._12_4_ = auVar176._12_4_ * fStack_6d4;
    auVar61._16_4_ = auVar176._16_4_ * fStack_6d0;
    auVar61._20_4_ = auVar176._20_4_ * fStack_6cc;
    auVar61._24_4_ = auVar176._24_4_ * fStack_6c8;
    auVar61._28_4_ = 0x40800000;
    auVar36 = vsubps_avx(_local_800,auVar61);
    auVar120 = vcmpps_avx(auVar36,auVar352,5);
    fStack_704 = local_580._28_4_ + fVar302;
    local_880 = CONCAT44(fVar319,fVar304);
    fVar212 = local_5c0._28_4_;
    if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar120 >> 0x7f,0) == '\0') &&
          (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar120 >> 0xbf,0) == '\0') &&
        (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar120[0x1f])
    {
      auVar414._8_4_ = 0x7f800000;
      auVar414._0_8_ = 0x7f8000007f800000;
      auVar414._12_4_ = 0x7f800000;
      auVar414._16_4_ = 0x7f800000;
      auVar414._20_4_ = 0x7f800000;
      auVar414._24_4_ = 0x7f800000;
      auVar414._28_4_ = 0x7f800000;
      auVar255._8_4_ = 0xff800000;
      auVar255._0_8_ = 0xff800000ff800000;
      auVar255._12_4_ = 0xff800000;
      auVar255._16_4_ = 0xff800000;
      auVar255._20_4_ = 0xff800000;
      auVar255._24_4_ = 0xff800000;
      auVar255._28_4_ = 0xff800000;
    }
    else {
      auVar351 = vcmpps_avx(auVar36,auVar352,5);
      auVar376 = vsqrtps_avx(auVar36);
      auVar275._0_4_ = fVar147 + fVar147;
      auVar275._4_4_ = fVar150 + fVar150;
      auVar275._8_4_ = fVar153 + fVar153;
      auVar275._12_4_ = fVar365 + fVar365;
      auVar275._16_4_ = fVar366 + fVar366;
      auVar275._20_4_ = fVar367 + fVar367;
      auVar275._24_4_ = fVar368 + fVar368;
      auVar275._28_4_ = fVar212 + fVar212;
      auVar36 = vrcpps_avx(auVar275);
      fVar302 = auVar36._0_4_;
      fVar286 = auVar36._4_4_;
      auVar62._4_4_ = auVar275._4_4_ * fVar286;
      auVar62._0_4_ = auVar275._0_4_ * fVar302;
      fVar289 = auVar36._8_4_;
      auVar62._8_4_ = auVar275._8_4_ * fVar289;
      fVar292 = auVar36._12_4_;
      auVar62._12_4_ = auVar275._12_4_ * fVar292;
      fVar295 = auVar36._16_4_;
      auVar62._16_4_ = auVar275._16_4_ * fVar295;
      fVar298 = auVar36._20_4_;
      auVar62._20_4_ = auVar275._20_4_ * fVar298;
      fVar301 = auVar36._24_4_;
      auVar62._24_4_ = auVar275._24_4_ * fVar301;
      auVar62._28_4_ = auVar275._28_4_;
      auVar338._8_4_ = 0x3f800000;
      auVar338._0_8_ = 0x3f8000003f800000;
      auVar338._12_4_ = 0x3f800000;
      auVar338._16_4_ = 0x3f800000;
      auVar338._20_4_ = 0x3f800000;
      auVar338._24_4_ = 0x3f800000;
      auVar338._28_4_ = 0x3f800000;
      auVar352 = vsubps_avx(auVar338,auVar62);
      fVar302 = fVar302 + fVar302 * auVar352._0_4_;
      fVar286 = fVar286 + fVar286 * auVar352._4_4_;
      fVar289 = fVar289 + fVar289 * auVar352._8_4_;
      fVar292 = fVar292 + fVar292 * auVar352._12_4_;
      fVar295 = fVar295 + fVar295 * auVar352._16_4_;
      fVar298 = fVar298 + fVar298 * auVar352._20_4_;
      fVar301 = fVar301 + fVar301 * auVar352._24_4_;
      auVar313._0_8_ = CONCAT44(fVar394,fVar141) ^ 0x8000000080000000;
      auVar313._8_4_ = -local_360._8_4_;
      auVar313._12_4_ = -local_360._12_4_;
      auVar313._16_4_ = -local_360._16_4_;
      auVar313._20_4_ = -local_360._20_4_;
      auVar313._24_4_ = -local_360._24_4_;
      auVar313._28_4_ = -local_360._28_4_;
      auVar40 = vsubps_avx(auVar313,auVar376);
      fVar141 = auVar40._0_4_ * fVar302;
      fVar394 = auVar40._4_4_ * fVar286;
      auVar63._4_4_ = fVar394;
      auVar63._0_4_ = fVar141;
      fVar321 = auVar40._8_4_ * fVar289;
      auVar63._8_4_ = fVar321;
      fVar323 = auVar40._12_4_ * fVar292;
      auVar63._12_4_ = fVar323;
      fVar325 = auVar40._16_4_ * fVar295;
      auVar63._16_4_ = fVar325;
      fVar327 = auVar40._20_4_ * fVar298;
      auVar63._20_4_ = fVar327;
      fVar329 = auVar40._24_4_ * fVar301;
      auVar63._24_4_ = fVar329;
      auVar63._28_4_ = auVar40._28_4_;
      auVar317 = ZEXT3264(auVar63);
      auVar376 = vsubps_avx(auVar376,local_360);
      fVar302 = auVar376._0_4_ * fVar302;
      fVar286 = auVar376._4_4_ * fVar286;
      auVar64._4_4_ = fVar286;
      auVar64._0_4_ = fVar302;
      fVar289 = auVar376._8_4_ * fVar289;
      auVar64._8_4_ = fVar289;
      fVar292 = auVar376._12_4_ * fVar292;
      auVar64._12_4_ = fVar292;
      fVar295 = auVar376._16_4_ * fVar295;
      auVar64._16_4_ = fVar295;
      fVar298 = auVar376._20_4_ * fVar298;
      auVar64._20_4_ = fVar298;
      fVar301 = auVar376._24_4_ * fVar301;
      auVar64._24_4_ = fVar301;
      auVar64._28_4_ = auVar376._28_4_;
      local_520._4_4_ = (float)local_5a0._4_4_ * (fVar319 + (float)local_720._4_4_ * fVar394);
      local_520._0_4_ = (float)local_5a0._0_4_ * (fVar304 + (float)local_720._0_4_ * fVar141);
      fStack_518 = fStack_598 * (fStack_878 + fStack_718 * fVar321);
      fStack_514 = fStack_594 * (fStack_874 + fStack_714 * fVar323);
      fStack_510 = fStack_590 * (fStack_870 + fStack_710 * fVar325);
      fStack_50c = fStack_58c * (fStack_86c + fStack_70c * fVar327);
      fStack_508 = fStack_588 * (fStack_868 + fStack_708 * fVar329);
      fStack_504 = fStack_864 + auVar36._28_4_ + auVar352._28_4_;
      auVar339._8_4_ = 0x7fffffff;
      auVar339._0_8_ = 0x7fffffff7fffffff;
      auVar339._12_4_ = 0x7fffffff;
      auVar339._16_4_ = 0x7fffffff;
      auVar339._20_4_ = 0x7fffffff;
      auVar339._24_4_ = 0x7fffffff;
      auVar339._28_4_ = 0x7fffffff;
      auVar36 = vandps_avx(local_340,auVar339);
      auVar376 = vmaxps_avx(local_3c0,auVar36);
      auVar65._4_4_ = auVar376._4_4_ * 1.9073486e-06;
      auVar65._0_4_ = auVar376._0_4_ * 1.9073486e-06;
      auVar65._8_4_ = auVar376._8_4_ * 1.9073486e-06;
      auVar65._12_4_ = auVar376._12_4_ * 1.9073486e-06;
      auVar65._16_4_ = auVar376._16_4_ * 1.9073486e-06;
      auVar65._20_4_ = auVar376._20_4_ * 1.9073486e-06;
      auVar65._24_4_ = auVar376._24_4_ * 1.9073486e-06;
      auVar65._28_4_ = auVar376._28_4_;
      auVar36 = vandps_avx(local_5c0,auVar339);
      auVar36 = vcmpps_avx(auVar36,auVar65,1);
      auVar340._8_4_ = 0x7f800000;
      auVar340._0_8_ = 0x7f8000007f800000;
      auVar340._12_4_ = 0x7f800000;
      auVar340._16_4_ = 0x7f800000;
      auVar340._20_4_ = 0x7f800000;
      auVar340._24_4_ = 0x7f800000;
      auVar340._28_4_ = 0x7f800000;
      auVar414 = vblendvps_avx(auVar340,auVar63,auVar351);
      local_540._4_4_ = (float)local_5a0._4_4_ * (fVar319 + (float)local_720._4_4_ * fVar286);
      local_540._0_4_ = (float)local_5a0._0_4_ * (fVar304 + (float)local_720._0_4_ * fVar302);
      fStack_538 = fStack_598 * (fStack_878 + fStack_718 * fVar289);
      fStack_534 = fStack_594 * (fStack_874 + fStack_714 * fVar292);
      fStack_530 = fStack_590 * (fStack_870 + fStack_710 * fVar295);
      fStack_52c = fStack_58c * (fStack_86c + fStack_70c * fVar298);
      fStack_528 = fStack_588 * (fStack_868 + fStack_708 * fVar301);
      fStack_524 = fStack_864 + auVar376._28_4_;
      auVar276._8_4_ = 0xff800000;
      auVar276._0_8_ = 0xff800000ff800000;
      auVar276._12_4_ = 0xff800000;
      auVar276._16_4_ = 0xff800000;
      auVar276._20_4_ = 0xff800000;
      auVar276._24_4_ = 0xff800000;
      auVar276._28_4_ = 0xff800000;
      auVar255 = vblendvps_avx(auVar276,auVar64,auVar351);
      auVar376 = auVar351 & auVar36;
      if ((((((((auVar376 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar376 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar376 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar376 >> 0x7f,0) != '\0') ||
            (auVar376 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar376 >> 0xbf,0) != '\0') ||
          (auVar376 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar376[0x1f] < '\0') {
        auVar120 = vandps_avx(auVar36,auVar351);
        auVar226 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
        auVar36 = vcmpps_avx(auVar176,ZEXT832(0) << 0x20,2);
        auVar317 = ZEXT3264(auVar36);
        auVar401._8_4_ = 0xff800000;
        auVar401._0_8_ = 0xff800000ff800000;
        auVar401._12_4_ = 0xff800000;
        auVar401._16_4_ = 0xff800000;
        auVar401._20_4_ = 0xff800000;
        auVar401._24_4_ = 0xff800000;
        auVar401._28_4_ = 0xff800000;
        auVar354._8_4_ = 0x7f800000;
        auVar354._0_8_ = 0x7f8000007f800000;
        auVar354._12_4_ = 0x7f800000;
        auVar354._16_4_ = 0x7f800000;
        auVar354._20_4_ = 0x7f800000;
        auVar354._24_4_ = 0x7f800000;
        auVar354._28_4_ = 0x7f800000;
        auVar176 = vblendvps_avx(auVar354,auVar401,auVar36);
        auVar39 = vpmovsxwd_avx(auVar226);
        auVar226 = vpunpckhwd_avx(auVar226,auVar226);
        auVar284._16_16_ = auVar226;
        auVar284._0_16_ = auVar39;
        auVar414 = vblendvps_avx(auVar414,auVar176,auVar284);
        auVar176 = vblendvps_avx(auVar401,auVar354,auVar36);
        auVar255 = vblendvps_avx(auVar255,auVar176,auVar284);
        auVar176 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar132._0_4_ = auVar120._0_4_ ^ auVar176._0_4_;
        auVar132._4_4_ = auVar120._4_4_ ^ auVar176._4_4_;
        auVar132._8_4_ = auVar120._8_4_ ^ auVar176._8_4_;
        auVar132._12_4_ = auVar120._12_4_ ^ auVar176._12_4_;
        auVar132._16_4_ = auVar120._16_4_ ^ auVar176._16_4_;
        auVar132._20_4_ = auVar120._20_4_ ^ auVar176._20_4_;
        auVar132._24_4_ = auVar120._24_4_ ^ auVar176._24_4_;
        auVar132._28_4_ = auVar120._28_4_ ^ auVar176._28_4_;
        auVar120 = vorps_avx(auVar36,auVar132);
        auVar120 = vandps_avx(auVar351,auVar120);
      }
    }
    auVar344 = ZEXT3264(CONCAT428(fStack_684,
                                  CONCAT424(fStack_688,
                                            CONCAT420(fStack_68c,
                                                      CONCAT416(fStack_690,
                                                                CONCAT412(fStack_694,
                                                                          CONCAT48(fStack_698,
                                                                                   CONCAT44(
                                                  fStack_69c,local_6a0))))))));
    auVar176 = local_380 & auVar120;
    auVar355 = ZEXT3264(local_8e0);
    local_880 = uVar93;
    if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar176 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar176 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar176 >> 0x7f,0) == '\0') &&
          (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar176 >> 0xbf,0) == '\0') &&
        (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar176[0x1f])
    {
      auVar434 = ZEXT3264(local_9c0);
      auVar386 = ZEXT3264(local_9e0);
      auVar436 = ZEXT3264(local_900);
      auVar377 = ZEXT3264(local_9a0);
      auVar402 = ZEXT3264(local_920);
    }
    else {
      fStack_584 = auVar35._28_4_ + auVar203._28_4_;
      auVar226 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_730._0_4_));
      auVar226 = vshufps_avx(auVar226,auVar226,0);
      auVar277._16_16_ = auVar226;
      auVar277._0_16_ = auVar226;
      auVar36 = vmaxps_avx(auVar277,auVar414);
      auVar226 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_730._0_4_));
      auVar226 = vshufps_avx(auVar226,auVar226,0);
      auVar278._16_16_ = auVar226;
      auVar278._0_16_ = auVar226;
      auVar351 = vminps_avx(auVar278,auVar255);
      auVar174._0_4_ = local_6a0 * fVar395 + local_6c0 * fVar378 + local_4a0 * fVar410;
      auVar174._4_4_ = fStack_69c * fVar403 + fStack_6bc * fVar387 + fStack_49c * fVar415;
      auVar174._8_4_ = fStack_698 * fVar404 + fStack_6b8 * fVar388 + fStack_498 * fVar417;
      auVar174._12_4_ = fStack_694 * fVar405 + fStack_6b4 * fVar389 + fStack_494 * fVar419;
      auVar174._16_4_ = fStack_690 * fVar406 + fStack_6b0 * fVar390 + fStack_490 * fVar421;
      auVar174._20_4_ = fStack_68c * fVar407 + fStack_6ac * fVar391 + fStack_48c * fVar424;
      auVar174._24_4_ = fStack_688 * fVar408 + fStack_6a8 * fVar392 + fStack_488 * fVar427;
      auVar174._28_4_ = fVar137 + auVar384._28_4_ + fVar137;
      auVar176 = vrcpps_avx(auVar174);
      fVar141 = auVar176._0_4_;
      fVar394 = auVar176._4_4_;
      auVar66._4_4_ = auVar174._4_4_ * fVar394;
      auVar66._0_4_ = auVar174._0_4_ * fVar141;
      fVar302 = auVar176._8_4_;
      auVar66._8_4_ = auVar174._8_4_ * fVar302;
      fVar286 = auVar176._12_4_;
      auVar66._12_4_ = auVar174._12_4_ * fVar286;
      fVar289 = auVar176._16_4_;
      auVar66._16_4_ = auVar174._16_4_ * fVar289;
      fVar292 = auVar176._20_4_;
      auVar66._20_4_ = auVar174._20_4_ * fVar292;
      fVar295 = auVar176._24_4_;
      auVar66._24_4_ = auVar174._24_4_ * fVar295;
      auVar66._28_4_ = fVar409;
      auVar375._8_4_ = 0x3f800000;
      auVar375._0_8_ = 0x3f8000003f800000;
      auVar375._12_4_ = 0x3f800000;
      auVar375._16_4_ = 0x3f800000;
      auVar375._20_4_ = 0x3f800000;
      auVar375._24_4_ = 0x3f800000;
      auVar375._28_4_ = 0x3f800000;
      auVar35 = vsubps_avx(auVar375,auVar66);
      auVar341._8_4_ = 0x7fffffff;
      auVar341._0_8_ = 0x7fffffff7fffffff;
      auVar341._12_4_ = 0x7fffffff;
      auVar341._16_4_ = 0x7fffffff;
      auVar341._20_4_ = 0x7fffffff;
      auVar341._24_4_ = 0x7fffffff;
      auVar341._28_4_ = 0x7fffffff;
      auVar176 = vandps_avx(auVar174,auVar341);
      auVar364._8_4_ = 0x219392ef;
      auVar364._0_8_ = 0x219392ef219392ef;
      auVar364._12_4_ = 0x219392ef;
      auVar364._16_4_ = 0x219392ef;
      auVar364._20_4_ = 0x219392ef;
      auVar364._24_4_ = 0x219392ef;
      auVar364._28_4_ = 0x219392ef;
      auVar176 = vcmpps_avx(auVar176,auVar364,1);
      auVar67._4_4_ =
           (fVar394 + fVar394 * auVar35._4_4_) *
           -(fVar260 * fVar403 + fVar387 * fVar243 + fVar415 * fVar242);
      auVar67._0_4_ =
           (fVar141 + fVar141 * auVar35._0_4_) *
           -(fVar239 * fVar395 + fVar378 * fVar105 + fVar410 * fVar211);
      auVar67._8_4_ =
           (fVar302 + fVar302 * auVar35._8_4_) *
           -(fVar266 * fVar404 + fVar388 * fVar265 + fVar417 * fVar264);
      auVar67._12_4_ =
           (fVar286 + fVar286 * auVar35._12_4_) *
           -(fVar299 * fVar405 + fVar389 * fVar296 + fVar419 * fVar293);
      auVar67._16_4_ =
           (fVar289 + fVar289 * auVar35._16_4_) *
           -(fVar303 * fVar406 + fVar390 * fVar300 + fVar421 * fVar297);
      auVar67._20_4_ =
           (fVar292 + fVar292 * auVar35._20_4_) *
           -(fVar328 * fVar407 + fVar391 * fVar326 + fVar424 * fVar324);
      auVar67._24_4_ =
           (fVar295 + fVar295 * auVar35._24_4_) *
           -(fVar429 * fVar408 + fVar392 * fVar426 + fVar427 * fVar423);
      auVar67._28_4_ = -(fVar137 + local_360._28_4_ + fVar137);
      auVar352 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar35 = vcmpps_avx(auVar174,auVar352,1);
      auVar376 = vorps_avx(auVar176,auVar35);
      auVar35 = vcmpps_avx(auVar174,auVar352,6);
      auVar35 = vorps_avx(auVar176,auVar35);
      auVar353._8_4_ = 0xff800000;
      auVar353._0_8_ = 0xff800000ff800000;
      auVar353._12_4_ = 0xff800000;
      auVar353._16_4_ = 0xff800000;
      auVar353._20_4_ = 0xff800000;
      auVar353._24_4_ = 0xff800000;
      auVar353._28_4_ = 0xff800000;
      auVar176 = vblendvps_avx(auVar67,auVar353,auVar376);
      auVar385._8_4_ = 0x7f800000;
      auVar385._0_8_ = 0x7f8000007f800000;
      auVar385._12_4_ = 0x7f800000;
      auVar385._16_4_ = 0x7f800000;
      auVar385._20_4_ = 0x7f800000;
      auVar385._24_4_ = 0x7f800000;
      auVar385._28_4_ = 0x7f800000;
      auVar35 = vblendvps_avx(auVar67,auVar385,auVar35);
      auVar36 = vmaxps_avx(auVar36,auVar176);
      auVar35 = vminps_avx(auVar351,auVar35);
      auVar376 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar176 = vsubps_avx(auVar376,_local_940);
      auVar351 = vsubps_avx(auVar376,local_840);
      auVar68._4_4_ = auVar351._4_4_ * -fVar136;
      auVar68._0_4_ = auVar351._0_4_ * -fVar106;
      auVar68._8_4_ = auVar351._8_4_ * -fVar140;
      auVar68._12_4_ = auVar351._12_4_ * -fVar144;
      auVar68._16_4_ = auVar351._16_4_ * -fVar146;
      auVar68._20_4_ = auVar351._20_4_ * -fVar149;
      auVar68._24_4_ = auVar351._24_4_ * -fVar152;
      auVar68._28_4_ = auVar351._28_4_;
      auVar69._4_4_ = fVar183 * auVar176._4_4_;
      auVar69._0_4_ = fVar156 * auVar176._0_4_;
      auVar69._8_4_ = fVar185 * auVar176._8_4_;
      auVar69._12_4_ = fVar189 * auVar176._12_4_;
      auVar69._16_4_ = fVar190 * auVar176._16_4_;
      auVar69._20_4_ = fVar191 * auVar176._20_4_;
      auVar69._24_4_ = fVar192 * auVar176._24_4_;
      auVar69._28_4_ = auVar176._28_4_;
      auVar176 = vsubps_avx(auVar68,auVar69);
      auVar351 = vsubps_avx(auVar376,local_a20);
      auVar70._4_4_ = fVar416 * auVar351._4_4_;
      auVar70._0_4_ = fVar411 * auVar351._0_4_;
      auVar70._8_4_ = fVar418 * auVar351._8_4_;
      auVar70._12_4_ = fVar420 * auVar351._12_4_;
      auVar70._16_4_ = fVar422 * auVar351._16_4_;
      auVar70._20_4_ = fVar425 * auVar351._20_4_;
      uVar8 = auVar351._28_4_;
      auVar70._24_4_ = fVar428 * auVar351._24_4_;
      auVar70._28_4_ = uVar8;
      auVar351 = vsubps_avx(auVar176,auVar70);
      auVar71._4_4_ = fStack_49c * -fVar136;
      auVar71._0_4_ = local_4a0 * -fVar106;
      auVar71._8_4_ = fStack_498 * -fVar140;
      auVar71._12_4_ = fStack_494 * -fVar144;
      auVar71._16_4_ = fStack_490 * -fVar146;
      auVar71._20_4_ = fStack_48c * -fVar149;
      auVar71._24_4_ = fStack_488 * -fVar152;
      auVar71._28_4_ = local_780._28_4_ ^ 0x80000000;
      auVar432._8_4_ = 0x3f800000;
      auVar432._0_8_ = 0x3f8000003f800000;
      auVar432._12_4_ = 0x3f800000;
      auVar432._16_4_ = 0x3f800000;
      auVar432._20_4_ = 0x3f800000;
      auVar432._24_4_ = 0x3f800000;
      auVar432._28_4_ = 0x3f800000;
      auVar72._4_4_ = fStack_6bc * fVar183;
      auVar72._0_4_ = local_6c0 * fVar156;
      auVar72._8_4_ = fStack_6b8 * fVar185;
      auVar72._12_4_ = fStack_6b4 * fVar189;
      auVar72._16_4_ = fStack_6b0 * fVar190;
      auVar72._20_4_ = fStack_6ac * fVar191;
      auVar72._24_4_ = fStack_6a8 * fVar192;
      auVar72._28_4_ = uVar8;
      auVar176 = vsubps_avx(auVar71,auVar72);
      auVar73._4_4_ = fVar416 * fStack_69c;
      auVar73._0_4_ = fVar411 * local_6a0;
      auVar73._8_4_ = fVar418 * fStack_698;
      auVar73._12_4_ = fVar420 * fStack_694;
      auVar73._16_4_ = fVar422 * fStack_690;
      auVar73._20_4_ = fVar425 * fStack_68c;
      auVar73._24_4_ = fVar428 * fStack_688;
      auVar73._28_4_ = uVar8;
      auVar376 = vsubps_avx(auVar176,auVar73);
      auVar176 = vrcpps_avx(auVar376);
      fVar211 = auVar176._0_4_;
      fVar105 = auVar176._4_4_;
      auVar74._4_4_ = auVar376._4_4_ * fVar105;
      auVar74._0_4_ = auVar376._0_4_ * fVar211;
      fVar239 = auVar176._8_4_;
      auVar74._8_4_ = auVar376._8_4_ * fVar239;
      fVar242 = auVar176._12_4_;
      auVar74._12_4_ = auVar376._12_4_ * fVar242;
      fVar243 = auVar176._16_4_;
      auVar74._16_4_ = auVar376._16_4_ * fVar243;
      fVar260 = auVar176._20_4_;
      auVar74._20_4_ = auVar376._20_4_ * fVar260;
      fVar264 = auVar176._24_4_;
      auVar74._24_4_ = auVar376._24_4_ * fVar264;
      auVar74._28_4_ = fStack_684;
      auVar352 = vsubps_avx(auVar432,auVar74);
      auVar176 = vandps_avx(auVar376,auVar341);
      auVar316 = vcmpps_avx(auVar176,auVar364,1);
      auVar75._4_4_ = (fVar105 + fVar105 * auVar352._4_4_) * -auVar351._4_4_;
      auVar75._0_4_ = (fVar211 + fVar211 * auVar352._0_4_) * -auVar351._0_4_;
      auVar75._8_4_ = (fVar239 + fVar239 * auVar352._8_4_) * -auVar351._8_4_;
      auVar75._12_4_ = (fVar242 + fVar242 * auVar352._12_4_) * -auVar351._12_4_;
      auVar75._16_4_ = (fVar243 + fVar243 * auVar352._16_4_) * -auVar351._16_4_;
      auVar75._20_4_ = (fVar260 + fVar260 * auVar352._20_4_) * -auVar351._20_4_;
      auVar75._24_4_ = (fVar264 + fVar264 * auVar352._24_4_) * -auVar351._24_4_;
      auVar75._28_4_ = auVar351._28_4_ ^ 0x80000000;
      auVar176 = vcmpps_avx(auVar376,ZEXT832(0) << 0x20,1);
      auVar176 = vorps_avx(auVar316,auVar176);
      auVar176 = vblendvps_avx(auVar75,auVar353,auVar176);
      local_400 = vmaxps_avx(auVar36,auVar176);
      auVar176 = vcmpps_avx(auVar376,ZEXT832(0) << 0x20,6);
      auVar176 = vorps_avx(auVar316,auVar176);
      auVar176 = vblendvps_avx(auVar75,auVar385,auVar176);
      auVar120 = vandps_avx(auVar120,local_380);
      local_420 = vminps_avx(auVar35,auVar176);
      auVar35 = vcmpps_avx(local_400,local_420,2);
      auVar36 = auVar120 & auVar35;
      auVar176 = local_400;
      if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar36 >> 0x7f,0) != '\0') ||
            (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar36 >> 0xbf,0) != '\0') ||
          (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar36[0x1f] < '\0') {
        auVar176 = vminps_avx(local_640,_local_680);
        auVar36 = vminps_avx(local_660,local_7e0);
        auVar176 = vminps_avx(auVar176,auVar36);
        auVar36 = vsubps_avx(auVar176,_local_560);
        auVar120 = vandps_avx(auVar35,auVar120);
        auVar176 = vminps_avx(_local_520,auVar432);
        auVar176 = vmaxps_avx(auVar176,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar103 + fVar155 * (auVar176._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar134 + fVar182 * (auVar176._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar138 + fVar184 * (auVar176._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar142 + fVar188 * (auVar176._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar103 + fVar155 * (auVar176._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar134 + fVar182 * (auVar176._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar138 + fVar184 * (auVar176._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar142 + auVar176._28_4_ + 7.0;
        auVar176 = vminps_avx(_local_540,auVar432);
        auVar176 = vmaxps_avx(auVar176,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar103 + fVar155 * (auVar176._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar134 + fVar182 * (auVar176._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar138 + fVar184 * (auVar176._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar142 + fVar188 * (auVar176._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar103 + fVar155 * (auVar176._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar134 + fVar182 * (auVar176._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar138 + fVar184 * (auVar176._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar142 + auVar176._28_4_ + 7.0;
        auVar76._4_4_ = auVar36._4_4_ * 0.99999976;
        auVar76._0_4_ = auVar36._0_4_ * 0.99999976;
        auVar76._8_4_ = auVar36._8_4_ * 0.99999976;
        auVar76._12_4_ = auVar36._12_4_ * 0.99999976;
        auVar76._16_4_ = auVar36._16_4_ * 0.99999976;
        auVar76._20_4_ = auVar36._20_4_ * 0.99999976;
        auVar76._24_4_ = auVar36._24_4_ * 0.99999976;
        auVar76._28_4_ = 0x3f7ffffc;
        auVar176 = vmaxps_avx(ZEXT832(0) << 0x20,auVar76);
        auVar77._4_4_ = auVar176._4_4_ * auVar176._4_4_;
        auVar77._0_4_ = auVar176._0_4_ * auVar176._0_4_;
        auVar77._8_4_ = auVar176._8_4_ * auVar176._8_4_;
        auVar77._12_4_ = auVar176._12_4_ * auVar176._12_4_;
        auVar77._16_4_ = auVar176._16_4_ * auVar176._16_4_;
        auVar77._20_4_ = auVar176._20_4_ * auVar176._20_4_;
        auVar77._24_4_ = auVar176._24_4_ * auVar176._24_4_;
        auVar77._28_4_ = auVar176._28_4_;
        auVar36 = vsubps_avx(auVar37,auVar77);
        auVar78._4_4_ = auVar36._4_4_ * (float)local_6e0._4_4_;
        auVar78._0_4_ = auVar36._0_4_ * (float)local_6e0._0_4_;
        auVar78._8_4_ = auVar36._8_4_ * fStack_6d8;
        auVar78._12_4_ = auVar36._12_4_ * fStack_6d4;
        auVar78._16_4_ = auVar36._16_4_ * fStack_6d0;
        auVar78._20_4_ = auVar36._20_4_ * fStack_6cc;
        auVar78._24_4_ = auVar36._24_4_ * fStack_6c8;
        auVar78._28_4_ = auVar176._28_4_;
        auVar176 = vsubps_avx(_local_800,auVar78);
        auVar35 = vcmpps_avx(auVar176,ZEXT832(0) << 0x20,5);
        _local_800 = local_400;
        auVar351 = _local_800;
        if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar35 >> 0x7f,0) == '\0') &&
              (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar35 >> 0xbf,0) == '\0') &&
            (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar35[0x1f]) {
          _local_560 = ZEXT832(0) << 0x20;
          _local_700 = ZEXT832(0) << 0x20;
          _local_ae0 = SUB3228(ZEXT832(0) << 0x20,0);
          _local_720 = ZEXT832(0) << 0x20;
          auVar229 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar358 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar256._8_4_ = 0x7f800000;
          auVar256._0_8_ = 0x7f8000007f800000;
          auVar256._12_4_ = 0x7f800000;
          auVar256._16_4_ = 0x7f800000;
          auVar256._20_4_ = 0x7f800000;
          auVar256._24_4_ = 0x7f800000;
          auVar256._28_4_ = 0x7f800000;
          auVar279._8_4_ = 0xff800000;
          auVar279._0_8_ = 0xff800000ff800000;
          auVar279._12_4_ = 0xff800000;
          auVar279._16_4_ = 0xff800000;
          auVar279._20_4_ = 0xff800000;
          auVar279._24_4_ = 0xff800000;
          auVar279._28_4_ = 0xff800000;
        }
        else {
          local_a00 = auVar36;
          _local_820 = auVar35;
          auVar376 = vsqrtps_avx(auVar176);
          auVar235._0_4_ = fVar147 + fVar147;
          auVar235._4_4_ = fVar150 + fVar150;
          auVar235._8_4_ = fVar153 + fVar153;
          auVar235._12_4_ = fVar365 + fVar365;
          auVar235._16_4_ = fVar366 + fVar366;
          auVar235._20_4_ = fVar367 + fVar367;
          auVar235._24_4_ = fVar368 + fVar368;
          auVar235._28_4_ = fVar212 + fVar212;
          auVar37 = vrcpps_avx(auVar235);
          fVar212 = auVar37._0_4_;
          fVar211 = auVar37._4_4_;
          auVar79._4_4_ = auVar235._4_4_ * fVar211;
          auVar79._0_4_ = auVar235._0_4_ * fVar212;
          fVar105 = auVar37._8_4_;
          auVar79._8_4_ = auVar235._8_4_ * fVar105;
          fVar239 = auVar37._12_4_;
          auVar79._12_4_ = auVar235._12_4_ * fVar239;
          fVar242 = auVar37._16_4_;
          auVar79._16_4_ = auVar235._16_4_ * fVar242;
          fVar243 = auVar37._20_4_;
          auVar79._20_4_ = auVar235._20_4_ * fVar243;
          fVar260 = auVar37._24_4_;
          auVar79._24_4_ = auVar235._24_4_ * fVar260;
          auVar79._28_4_ = auVar235._28_4_;
          auVar352 = vsubps_avx(auVar432,auVar79);
          fVar212 = fVar212 + fVar212 * auVar352._0_4_;
          fVar211 = fVar211 + fVar211 * auVar352._4_4_;
          fVar105 = fVar105 + fVar105 * auVar352._8_4_;
          fVar239 = fVar239 + fVar239 * auVar352._12_4_;
          fVar242 = fVar242 + fVar242 * auVar352._16_4_;
          fVar243 = fVar243 + fVar243 * auVar352._20_4_;
          fVar260 = fVar260 + fVar260 * auVar352._24_4_;
          fVar264 = auVar37._28_4_ + auVar352._28_4_;
          auVar280._0_8_ = local_360._0_8_ ^ 0x8000000080000000;
          auVar280._8_4_ = -local_360._8_4_;
          auVar280._12_4_ = -local_360._12_4_;
          auVar280._16_4_ = -local_360._16_4_;
          auVar280._20_4_ = -local_360._20_4_;
          auVar280._24_4_ = -local_360._24_4_;
          auVar280._28_4_ = -local_360._28_4_;
          auVar37 = vsubps_avx(auVar280,auVar376);
          fVar303 = auVar37._0_4_ * fVar212;
          fVar324 = auVar37._4_4_ * fVar211;
          auVar80._4_4_ = fVar324;
          auVar80._0_4_ = fVar303;
          fVar326 = auVar37._8_4_ * fVar105;
          auVar80._8_4_ = fVar326;
          fVar328 = auVar37._12_4_ * fVar239;
          auVar80._12_4_ = fVar328;
          fVar423 = auVar37._16_4_ * fVar242;
          auVar80._16_4_ = fVar423;
          fVar426 = auVar37._20_4_ * fVar243;
          auVar80._20_4_ = fVar426;
          fVar429 = auVar37._24_4_ * fVar260;
          auVar80._24_4_ = fVar429;
          auVar80._28_4_ = 0x80000000;
          auVar376 = vsubps_avx(auVar376,local_360);
          fVar212 = auVar376._0_4_ * fVar212;
          fVar211 = auVar376._4_4_ * fVar211;
          auVar81._4_4_ = fVar211;
          auVar81._0_4_ = fVar212;
          fVar105 = auVar376._8_4_ * fVar105;
          auVar81._8_4_ = fVar105;
          fVar239 = auVar376._12_4_ * fVar239;
          auVar81._12_4_ = fVar239;
          fVar242 = auVar376._16_4_ * fVar242;
          auVar81._16_4_ = fVar242;
          fVar243 = auVar376._20_4_ * fVar243;
          auVar81._20_4_ = fVar243;
          fVar260 = auVar376._24_4_ * fVar260;
          auVar81._24_4_ = fVar260;
          auVar81._28_4_ = local_360._28_4_;
          fVar265 = (fVar303 * (float)local_720._0_4_ + fVar304) * (float)local_5a0._0_4_;
          fVar266 = (fVar324 * (float)local_720._4_4_ + fVar319) * (float)local_5a0._4_4_;
          fVar293 = (fVar326 * fStack_718 + fStack_878) * fStack_598;
          fVar296 = (fVar328 * fStack_714 + fStack_874) * fStack_594;
          fVar299 = (fVar423 * fStack_710 + fStack_870) * fStack_590;
          fVar297 = (fVar426 * fStack_70c + fStack_86c) * fStack_58c;
          fVar300 = (fVar429 * fStack_708 + fStack_868) * fStack_588;
          auVar204._0_4_ = fVar104 + fVar265 * fVar107;
          auVar204._4_4_ = fVar135 + fVar266 * fVar241;
          auVar204._8_4_ = fVar139 + fVar293 * fVar263;
          auVar204._12_4_ = fVar143 + fVar296 * fVar290;
          auVar204._16_4_ = fVar145 + fVar299 * fVar294;
          auVar204._20_4_ = fVar148 + fVar297 * fVar322;
          auVar204._24_4_ = fVar151 + fVar300 * fVar430;
          auVar204._28_4_ = fVar154 + auVar376._28_4_ + fStack_864;
          auVar82._4_4_ = fVar324 * fStack_69c;
          auVar82._0_4_ = fVar303 * local_6a0;
          auVar82._8_4_ = fVar326 * fStack_698;
          auVar82._12_4_ = fVar328 * fStack_694;
          auVar82._16_4_ = fVar423 * fStack_690;
          auVar82._20_4_ = fVar426 * fStack_68c;
          auVar82._24_4_ = fVar429 * fStack_688;
          auVar82._28_4_ = fVar264;
          _local_940 = vsubps_avx(auVar82,auVar204);
          auVar236._0_4_ = local_4e0._0_4_ + fVar108 * fVar265;
          auVar236._4_4_ = local_4e0._4_4_ + fVar186 * fVar266;
          auVar236._8_4_ = local_4e0._8_4_ + fVar261 * fVar293;
          auVar236._12_4_ = local_4e0._12_4_ + fVar285 * fVar296;
          auVar236._16_4_ = local_4e0._16_4_ + fVar288 * fVar299;
          auVar236._20_4_ = local_4e0._20_4_ + fVar318 * fVar297;
          auVar236._24_4_ = local_4e0._24_4_ + fVar356 * fVar300;
          auVar236._28_4_ = local_4e0._28_4_ + fVar264;
          auVar83._4_4_ = fStack_6bc * fVar324;
          auVar83._0_4_ = local_6c0 * fVar303;
          auVar83._8_4_ = fStack_6b8 * fVar326;
          auVar83._12_4_ = fStack_6b4 * fVar328;
          auVar83._16_4_ = fStack_6b0 * fVar423;
          auVar83._20_4_ = fStack_6ac * fVar426;
          auVar83._24_4_ = fStack_6a8 * fVar429;
          auVar83._28_4_ = fVar142;
          local_840 = vsubps_avx(auVar83,auVar236);
          auVar281._0_4_ = local_4c0._0_4_ + fVar238 * fVar265;
          auVar281._4_4_ = local_4c0._4_4_ + fVar240 * fVar266;
          auVar281._8_4_ = local_4c0._8_4_ + fVar262 * fVar293;
          auVar281._12_4_ = local_4c0._12_4_ + fVar287 * fVar296;
          auVar281._16_4_ = local_4c0._16_4_ + fVar291 * fVar299;
          auVar281._20_4_ = local_4c0._20_4_ + fVar320 * fVar297;
          auVar281._24_4_ = local_4c0._24_4_ + fVar393 * fVar300;
          auVar281._28_4_ = local_4c0._28_4_ + auVar37._28_4_;
          auVar84._4_4_ = fVar324 * fStack_49c;
          auVar84._0_4_ = fVar303 * local_4a0;
          auVar84._8_4_ = fVar326 * fStack_498;
          auVar84._12_4_ = fVar328 * fStack_494;
          auVar84._16_4_ = fVar423 * fStack_490;
          auVar84._20_4_ = fVar426 * fStack_48c;
          auVar84._24_4_ = fVar429 * fStack_488;
          auVar84._28_4_ = fVar142;
          auVar37 = vsubps_avx(auVar84,auVar281);
          _local_ae0 = auVar37._0_28_;
          local_5a0._0_4_ = (fVar212 * (float)local_720._0_4_ + fVar304) * (float)local_5a0._0_4_;
          local_5a0._4_4_ = (fVar211 * (float)local_720._4_4_ + fVar319) * (float)local_5a0._4_4_;
          fStack_598 = (fVar105 * fStack_718 + fStack_878) * fStack_598;
          fStack_594 = (fVar239 * fStack_714 + fStack_874) * fStack_594;
          fStack_590 = (fVar242 * fStack_710 + fStack_870) * fStack_590;
          fStack_58c = (fVar243 * fStack_70c + fStack_86c) * fStack_58c;
          fStack_588 = (fVar260 * fStack_708 + fStack_868) * fStack_588;
          auVar314._0_4_ = fVar104 + (float)local_5a0._0_4_ * fVar107;
          auVar314._4_4_ = fVar135 + (float)local_5a0._4_4_ * fVar241;
          auVar314._8_4_ = fVar139 + fStack_598 * fVar263;
          auVar314._12_4_ = fVar143 + fStack_594 * fVar290;
          auVar314._16_4_ = fVar145 + fStack_590 * fVar294;
          auVar314._20_4_ = fVar148 + fStack_58c * fVar322;
          auVar314._24_4_ = fVar151 + fStack_588 * fVar430;
          auVar314._28_4_ = fVar154 + fVar142;
          auVar85._4_4_ = fStack_69c * fVar211;
          auVar85._0_4_ = local_6a0 * fVar212;
          auVar85._8_4_ = fStack_698 * fVar105;
          auVar85._12_4_ = fStack_694 * fVar239;
          auVar85._16_4_ = fStack_690 * fVar242;
          auVar85._20_4_ = fStack_68c * fVar243;
          auVar85._24_4_ = fStack_688 * fVar260;
          auVar85._28_4_ = fStack_684;
          _local_560 = vsubps_avx(auVar85,auVar314);
          auVar315._0_4_ = local_4e0._0_4_ + fVar108 * (float)local_5a0._0_4_;
          auVar315._4_4_ = local_4e0._4_4_ + fVar186 * (float)local_5a0._4_4_;
          auVar315._8_4_ = local_4e0._8_4_ + fVar261 * fStack_598;
          auVar315._12_4_ = local_4e0._12_4_ + fVar285 * fStack_594;
          auVar315._16_4_ = local_4e0._16_4_ + fVar288 * fStack_590;
          auVar315._20_4_ = local_4e0._20_4_ + fVar318 * fStack_58c;
          auVar315._24_4_ = local_4e0._24_4_ + fVar356 * fStack_588;
          auVar315._28_4_ = local_4e0._28_4_ + local_560._28_4_;
          auVar86._4_4_ = fStack_6bc * fVar211;
          auVar86._0_4_ = local_6c0 * fVar212;
          auVar86._8_4_ = fStack_6b8 * fVar105;
          auVar86._12_4_ = fStack_6b4 * fVar239;
          auVar86._16_4_ = fStack_6b0 * fVar242;
          auVar86._20_4_ = fStack_6ac * fVar243;
          auVar86._24_4_ = fStack_6a8 * fVar260;
          auVar86._28_4_ = fStack_684;
          _local_700 = vsubps_avx(auVar86,auVar315);
          auVar282._0_4_ = local_4c0._0_4_ + fVar238 * (float)local_5a0._0_4_;
          auVar282._4_4_ = local_4c0._4_4_ + fVar240 * (float)local_5a0._4_4_;
          auVar282._8_4_ = local_4c0._8_4_ + fVar262 * fStack_598;
          auVar282._12_4_ = local_4c0._12_4_ + fVar287 * fStack_594;
          auVar282._16_4_ = local_4c0._16_4_ + fVar291 * fStack_590;
          auVar282._20_4_ = local_4c0._20_4_ + fVar320 * fStack_58c;
          auVar282._24_4_ = local_4c0._24_4_ + fVar393 * fStack_588;
          auVar282._28_4_ = local_4c0._28_4_ + auVar37._28_4_ + fStack_864;
          auVar87._4_4_ = fStack_49c * fVar211;
          auVar87._0_4_ = local_4a0 * fVar212;
          auVar87._8_4_ = fStack_498 * fVar105;
          auVar87._12_4_ = fStack_494 * fVar239;
          auVar87._16_4_ = fStack_490 * fVar242;
          auVar87._20_4_ = fStack_48c * fVar243;
          auVar87._24_4_ = fStack_488 * fVar260;
          auVar87._28_4_ = local_700._28_4_;
          _local_720 = vsubps_avx(auVar87,auVar282);
          auVar37 = vcmpps_avx(auVar176,ZEXT832(0) << 0x20,5);
          auVar257._8_4_ = 0x7f800000;
          auVar257._0_8_ = 0x7f8000007f800000;
          auVar257._12_4_ = 0x7f800000;
          auVar257._16_4_ = 0x7f800000;
          auVar257._20_4_ = 0x7f800000;
          auVar257._24_4_ = 0x7f800000;
          auVar257._28_4_ = 0x7f800000;
          auVar256 = vblendvps_avx(auVar257,auVar80,auVar37);
          auVar342._8_4_ = 0x7fffffff;
          auVar342._0_8_ = 0x7fffffff7fffffff;
          auVar342._12_4_ = 0x7fffffff;
          auVar342._16_4_ = 0x7fffffff;
          auVar342._20_4_ = 0x7fffffff;
          auVar342._24_4_ = 0x7fffffff;
          auVar342._28_4_ = 0x7fffffff;
          auVar176 = vandps_avx(auVar342,local_340);
          auVar176 = vmaxps_avx(local_3c0,auVar176);
          auVar88._4_4_ = auVar176._4_4_ * 1.9073486e-06;
          auVar88._0_4_ = auVar176._0_4_ * 1.9073486e-06;
          auVar88._8_4_ = auVar176._8_4_ * 1.9073486e-06;
          auVar88._12_4_ = auVar176._12_4_ * 1.9073486e-06;
          auVar88._16_4_ = auVar176._16_4_ * 1.9073486e-06;
          auVar88._20_4_ = auVar176._20_4_ * 1.9073486e-06;
          auVar88._24_4_ = auVar176._24_4_ * 1.9073486e-06;
          auVar88._28_4_ = auVar176._28_4_;
          auVar176 = vandps_avx(auVar342,local_5c0);
          auVar176 = vcmpps_avx(auVar176,auVar88,1);
          auVar283._8_4_ = 0xff800000;
          auVar283._0_8_ = 0xff800000ff800000;
          auVar283._12_4_ = 0xff800000;
          auVar283._16_4_ = 0xff800000;
          auVar283._20_4_ = 0xff800000;
          auVar283._24_4_ = 0xff800000;
          auVar283._28_4_ = 0xff800000;
          auVar279 = vblendvps_avx(auVar283,auVar81,auVar37);
          auVar376 = auVar37 & auVar176;
          if ((((((((auVar376 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar376 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar376 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar376 >> 0x7f,0) != '\0') ||
                (auVar376 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar376 >> 0xbf,0) != '\0') ||
              (auVar376 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar376[0x1f] < '\0') {
            auVar176 = vandps_avx(auVar176,auVar37);
            auVar226 = vpackssdw_avx(auVar176._0_16_,auVar176._16_16_);
            auVar376 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar36 = vcmpps_avx(auVar36,auVar376,2);
            auVar433._8_4_ = 0xff800000;
            auVar433._0_8_ = 0xff800000ff800000;
            auVar433._12_4_ = 0xff800000;
            auVar433._16_4_ = 0xff800000;
            auVar433._20_4_ = 0xff800000;
            auVar433._24_4_ = 0xff800000;
            auVar433._28_4_ = 0xff800000;
            auVar435._8_4_ = 0x7f800000;
            auVar435._0_8_ = 0x7f8000007f800000;
            auVar435._12_4_ = 0x7f800000;
            auVar435._16_4_ = 0x7f800000;
            auVar435._20_4_ = 0x7f800000;
            auVar435._24_4_ = 0x7f800000;
            auVar435._28_4_ = 0x7f800000;
            auVar35 = vblendvps_avx(auVar435,auVar433,auVar36);
            auVar39 = vpmovsxwd_avx(auVar226);
            auVar226 = vpunpckhwd_avx(auVar226,auVar226);
            auVar343._16_16_ = auVar226;
            auVar343._0_16_ = auVar39;
            auVar256 = vblendvps_avx(auVar256,auVar35,auVar343);
            auVar35 = vblendvps_avx(auVar433,auVar435,auVar36);
            auVar279 = vblendvps_avx(auVar279,auVar35,auVar343);
            auVar35 = vcmpps_avx(auVar376,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar133._0_4_ = auVar176._0_4_ ^ auVar35._0_4_;
            auVar133._4_4_ = auVar176._4_4_ ^ auVar35._4_4_;
            auVar133._8_4_ = auVar176._8_4_ ^ auVar35._8_4_;
            auVar133._12_4_ = auVar176._12_4_ ^ auVar35._12_4_;
            auVar133._16_4_ = auVar176._16_4_ ^ auVar35._16_4_;
            auVar133._20_4_ = auVar176._20_4_ ^ auVar35._20_4_;
            auVar133._24_4_ = auVar176._24_4_ ^ auVar35._24_4_;
            auVar133._28_4_ = auVar176._28_4_ ^ auVar35._28_4_;
            auVar176 = vorps_avx(auVar36,auVar133);
            auVar35 = vandps_avx(auVar37,auVar176);
          }
          auVar229 = local_940._0_28_;
          auVar358 = local_840._0_28_;
        }
        auVar436 = ZEXT3264(local_900);
        auVar386 = ZEXT3264(local_9e0);
        auVar377 = ZEXT3264(local_9a0);
        local_500._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar212 = (ray->super_RayK<1>).dir.field_0.m128[1];
        auVar309._4_4_ = fVar212;
        auVar309._0_4_ = fVar212;
        auVar309._8_4_ = fVar212;
        auVar309._12_4_ = fVar212;
        auVar309._16_4_ = fVar212;
        auVar309._20_4_ = fVar212;
        auVar309._24_4_ = fVar212;
        auVar316._28_4_ = fVar212;
        auVar316._0_28_ = auVar309;
        fVar108 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_3e0 = vminps_avx(local_420,auVar256);
        _local_440 = vmaxps_avx(local_400,auVar279);
        auVar176 = vcmpps_avx(local_400,local_3e0,2);
        local_4c0 = vandps_avx(auVar120,auVar176);
        auVar176 = vcmpps_avx(_local_440,local_420,2);
        auVar176 = vandps_avx(auVar120,auVar176);
        auVar120 = vorps_avx(auVar176,local_4c0);
        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0x7f,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar120 >> 0xbf,0) != '\0') ||
            (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar120[0x1f] < '\0') {
          _local_520 = auVar176;
          _local_580 = _local_440;
          auVar176 = _local_580;
          auVar120 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_540._0_4_ = auVar35._0_4_ ^ auVar120._0_4_;
          local_540._4_4_ = auVar35._4_4_ ^ auVar120._4_4_;
          fStack_538 = (float)(auVar35._8_4_ ^ auVar120._8_4_);
          fStack_534 = (float)(auVar35._12_4_ ^ auVar120._12_4_);
          fStack_530 = (float)(auVar35._16_4_ ^ auVar120._16_4_);
          fStack_52c = (float)(auVar35._20_4_ ^ auVar120._20_4_);
          fStack_528 = (float)(auVar35._24_4_ ^ auVar120._24_4_);
          fStack_524 = (float)((uint)auVar35._28_4_ ^ (uint)auVar120._28_4_);
          local_500._0_4_ = local_500._4_4_;
          fStack_4f8 = (float)local_500._4_4_;
          fStack_4f4 = (float)local_500._4_4_;
          fStack_4f0 = (float)local_500._4_4_;
          fStack_4ec = (float)local_500._4_4_;
          fStack_4e8 = (float)local_500._4_4_;
          fStack_4e4 = (float)local_500._4_4_;
          auVar128._0_4_ =
               auVar229._0_4_ * (float)local_500._4_4_ +
               auVar358._0_4_ * fVar212 + fVar108 * (float)local_ae0._0_4_;
          auVar128._4_4_ =
               auVar229._4_4_ * (float)local_500._4_4_ +
               auVar358._4_4_ * fVar212 + fVar108 * (float)local_ae0._4_4_;
          auVar128._8_4_ =
               auVar229._8_4_ * (float)local_500._4_4_ +
               auVar358._8_4_ * fVar212 + fVar108 * fStack_ad8;
          auVar128._12_4_ =
               auVar229._12_4_ * (float)local_500._4_4_ +
               auVar358._12_4_ * fVar212 + fVar108 * fStack_ad4;
          auVar128._16_4_ =
               auVar229._16_4_ * (float)local_500._4_4_ +
               auVar358._16_4_ * fVar212 + fVar108 * fStack_ad0;
          auVar128._20_4_ =
               auVar229._20_4_ * (float)local_500._4_4_ +
               auVar358._20_4_ * fVar212 + fVar108 * fStack_acc;
          auVar128._24_4_ =
               auVar229._24_4_ * (float)local_500._4_4_ +
               auVar358._24_4_ * fVar212 + fVar108 * fStack_ac8;
          auVar128._28_4_ = auVar35._28_4_ + auVar120._28_4_ + (float)local_500._4_4_;
          auVar177._8_4_ = 0x7fffffff;
          auVar177._0_8_ = 0x7fffffff7fffffff;
          auVar177._12_4_ = 0x7fffffff;
          auVar177._16_4_ = 0x7fffffff;
          auVar177._20_4_ = 0x7fffffff;
          auVar177._24_4_ = 0x7fffffff;
          auVar177._28_4_ = 0x7fffffff;
          auVar120 = vandps_avx(auVar128,auVar177);
          auVar178._8_4_ = 0x3e99999a;
          auVar178._0_8_ = 0x3e99999a3e99999a;
          auVar178._12_4_ = 0x3e99999a;
          auVar178._16_4_ = 0x3e99999a;
          auVar178._20_4_ = 0x3e99999a;
          auVar178._24_4_ = 0x3e99999a;
          auVar178._28_4_ = 0x3e99999a;
          auVar120 = vcmpps_avx(auVar120,auVar178,1);
          auVar120 = vorps_avx(auVar120,_local_540);
          auVar179._8_4_ = 3;
          auVar179._0_8_ = 0x300000003;
          auVar179._12_4_ = 3;
          auVar179._16_4_ = 3;
          auVar179._20_4_ = 3;
          auVar179._24_4_ = 3;
          auVar179._28_4_ = 3;
          auVar205._8_4_ = 2;
          auVar205._0_8_ = 0x200000002;
          auVar205._12_4_ = 2;
          auVar205._16_4_ = 2;
          auVar205._20_4_ = 2;
          auVar205._24_4_ = 2;
          auVar205._28_4_ = 2;
          auVar120 = vblendvps_avx(auVar205,auVar179,auVar120);
          _local_5a0 = ZEXT432(local_aec);
          auVar39 = vpshufd_avx(ZEXT416(local_aec),0);
          fVar212 = 0.0;
          auVar226 = vpcmpgtd_avx(auVar120._16_16_,auVar39);
          local_5c0._0_16_ = auVar39;
          auVar39 = vpcmpgtd_avx(auVar120._0_16_,auVar39);
          auVar180._16_16_ = auVar226;
          auVar180._0_16_ = auVar39;
          local_4e0 = vblendps_avx(ZEXT1632(auVar39),auVar180,0xf0);
          local_480 = vandnps_avx(local_4e0,local_4c0);
          auVar317 = ZEXT3264(local_480);
          auVar120 = local_4c0 & ~local_4e0;
          auVar355 = ZEXT3264(local_8e0);
          local_780 = auVar38;
          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar120 >> 0x7f,0) == '\0') &&
                (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar120 >> 0xbf,0) == '\0') &&
              (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar120[0x1f]) {
            fVar238 = (ray->super_RayK<1>).tfar;
            auVar129._4_4_ = fVar238;
            auVar129._0_4_ = fVar238;
            auVar129._8_4_ = fVar238;
            auVar129._12_4_ = fVar238;
            auVar129._16_4_ = fVar238;
            auVar129._20_4_ = fVar238;
            auVar129._24_4_ = fVar238;
            auVar129._28_4_ = fVar238;
            local_580._0_4_ = local_440._0_4_;
            local_580._4_4_ = local_440._4_4_;
            fStack_578 = local_440._8_4_;
            fStack_574 = local_440._12_4_;
            fStack_570 = local_440._16_4_;
            fStack_56c = local_440._20_4_;
            fStack_568 = local_440._24_4_;
            fStack_564 = local_440._28_4_;
            local_7e0 = _local_440;
            auVar402 = ZEXT3264(local_920);
            fVar240 = (float)local_580._0_4_;
            fVar241 = (float)local_580._4_4_;
            fVar242 = fStack_578;
            fVar243 = fStack_574;
            fVar260 = fStack_570;
            fVar261 = fStack_56c;
            fVar262 = fStack_568;
            fVar263 = fStack_564;
            fVar238 = fVar108;
            fVar107 = fVar108;
            fVar211 = fVar108;
            fVar105 = fVar108;
            fVar239 = fVar108;
            fVar186 = fVar108;
            _local_580 = auVar176;
          }
          else {
            local_800._0_4_ = local_400._0_4_;
            local_800._4_4_ = local_400._4_4_;
            fStack_7f8 = local_400._8_4_;
            fStack_7f4 = local_400._12_4_;
            fStack_7f0 = local_400._16_4_;
            fStack_7ec = local_400._20_4_;
            fStack_7e8 = local_400._24_4_;
            fStack_7e4 = local_400._28_4_;
            local_6e0._4_4_ = (float)local_800._4_4_ + (float)local_620._4_4_;
            local_6e0._0_4_ = (float)local_800._0_4_ + (float)local_620._0_4_;
            fStack_6d8 = fStack_7f8 + fStack_618;
            fStack_6d4 = fStack_7f4 + fStack_614;
            fStack_6d0 = fStack_7f0 + fStack_610;
            fStack_6cc = fStack_7ec + fStack_60c;
            fStack_6c8 = fStack_7e8 + fStack_608;
            fStack_6c4 = fStack_7e4 + fStack_604;
            local_860 = auVar316;
            local_7c0._4_4_ = fVar108;
            local_7c0._0_4_ = fVar108;
            fStack_7b8 = fVar108;
            fStack_7b4 = fVar108;
            fStack_7b0 = fVar108;
            fStack_7ac = fVar108;
            fStack_7a8 = fVar108;
            fStack_7a4 = fVar108;
            _local_800 = auVar351;
            do {
              auVar130._8_4_ = 0x7f800000;
              auVar130._0_8_ = 0x7f8000007f800000;
              auVar130._12_4_ = 0x7f800000;
              auVar130._16_4_ = 0x7f800000;
              auVar130._20_4_ = 0x7f800000;
              auVar130._24_4_ = 0x7f800000;
              auVar130._28_4_ = 0x7f800000;
              auVar120 = auVar317._0_32_;
              auVar176 = vblendvps_avx(auVar130,_local_800,auVar120);
              auVar35 = vshufps_avx(auVar176,auVar176,0xb1);
              auVar35 = vminps_avx(auVar176,auVar35);
              auVar36 = vshufpd_avx(auVar35,auVar35,5);
              auVar35 = vminps_avx(auVar35,auVar36);
              auVar36 = vperm2f128_avx(auVar35,auVar35,1);
              auVar35 = vminps_avx(auVar35,auVar36);
              auVar176 = vcmpps_avx(auVar176,auVar35,0);
              auVar35 = auVar120 & auVar176;
              if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar35 >> 0x7f,0) != '\0') ||
                    (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar35 >> 0xbf,0) != '\0') ||
                  (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar35[0x1f] < '\0') {
                auVar120 = vandps_avx(auVar176,auVar120);
              }
              uVar92 = vmovmskps_avx(auVar120);
              uVar95 = 0;
              if (uVar92 != 0) {
                for (; (uVar92 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
                }
              }
              uVar93 = (ulong)uVar95;
              *(undefined4 *)(local_480 + uVar93 * 4) = 0;
              aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
              auVar226 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
              fVar212 = local_1a0[uVar93];
              uVar95 = *(uint *)(local_400 + uVar93 * 4);
              if (auVar226._0_4_ < 0.0) {
                fVar108 = sqrtf(auVar226._0_4_);
              }
              else {
                auVar226 = vsqrtss_avx(auVar226,auVar226);
                fVar108 = auVar226._0_4_;
              }
              auVar39 = vminps_avx(_local_950,_local_970);
              auVar226 = vmaxps_avx(_local_950,_local_970);
              auVar113 = vminps_avx(_local_960,_local_980);
              auVar117 = vminps_avx(auVar39,auVar113);
              auVar39 = vmaxps_avx(_local_960,_local_980);
              auVar113 = vmaxps_avx(auVar226,auVar39);
              auVar215._8_4_ = 0x7fffffff;
              auVar215._0_8_ = 0x7fffffff7fffffff;
              auVar215._12_4_ = 0x7fffffff;
              auVar226 = vandps_avx(auVar117,auVar215);
              auVar39 = vandps_avx(auVar113,auVar215);
              auVar226 = vmaxps_avx(auVar226,auVar39);
              auVar39 = vmovshdup_avx(auVar226);
              auVar39 = vmaxss_avx(auVar39,auVar226);
              auVar226 = vshufpd_avx(auVar226,auVar226,1);
              auVar226 = vmaxss_avx(auVar226,auVar39);
              local_940._0_4_ = auVar226._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar108 * 1.9073486e-06;
              _local_680 = vshufps_avx(auVar113,auVar113,0xff);
              auVar226 = vinsertps_avx(ZEXT416(uVar95),ZEXT416((uint)fVar212),0x10);
              lVar98 = 5;
              do {
                auVar39 = vmovshdup_avx(auVar226);
                fVar260 = auVar39._0_4_;
                local_a00._0_4_ = 1.0 - fVar260;
                auVar39 = vshufps_avx(auVar226,auVar226,0x55);
                fVar212 = auVar39._0_4_;
                fVar108 = auVar39._4_4_;
                fVar238 = auVar39._8_4_;
                fVar107 = auVar39._12_4_;
                auVar39 = vshufps_avx(ZEXT416((uint)local_a00._0_4_),ZEXT416((uint)local_a00._0_4_),
                                      0);
                fVar211 = auVar39._0_4_;
                fVar105 = auVar39._4_4_;
                fVar239 = auVar39._8_4_;
                fVar186 = auVar39._12_4_;
                fVar240 = (float)local_960._0_4_ * fVar212 + (float)local_970._0_4_ * fVar211;
                fVar241 = (float)local_960._4_4_ * fVar108 + (float)local_970._4_4_ * fVar105;
                fVar242 = fStack_958 * fVar238 + fStack_968 * fVar239;
                fVar243 = fStack_954 * fVar107 + fStack_964 * fVar186;
                auVar269._0_4_ =
                     fVar211 * ((float)local_970._0_4_ * fVar212 + fVar211 * (float)local_950._0_4_)
                     + fVar212 * fVar240;
                auVar269._4_4_ =
                     fVar105 * ((float)local_970._4_4_ * fVar108 + fVar105 * (float)local_950._4_4_)
                     + fVar108 * fVar241;
                auVar269._8_4_ =
                     fVar239 * (fStack_968 * fVar238 + fVar239 * fStack_948) + fVar238 * fVar242;
                auVar269._12_4_ =
                     fVar186 * (fStack_964 * fVar107 + fVar186 * fStack_944) + fVar107 * fVar243;
                auVar216._0_4_ =
                     fVar211 * fVar240 +
                     fVar212 * (fVar212 * (float)local_980._0_4_ + (float)local_960._0_4_ * fVar211)
                ;
                auVar216._4_4_ =
                     fVar105 * fVar241 +
                     fVar108 * (fVar108 * (float)local_980._4_4_ + (float)local_960._4_4_ * fVar105)
                ;
                auVar216._8_4_ =
                     fVar239 * fVar242 + fVar238 * (fVar238 * fStack_978 + fStack_958 * fVar239);
                auVar216._12_4_ =
                     fVar186 * fVar243 + fVar107 * (fVar107 * fStack_974 + fStack_954 * fVar186);
                auVar39 = vshufps_avx(auVar226,auVar226,0);
                local_aa0 = aVar10.x;
                fStack_a9c = aVar10.y;
                fStack_a98 = aVar10.z;
                aStack_a94 = aVar10.field_3;
                auVar160._0_4_ = auVar39._0_4_ * local_aa0 + 0.0;
                auVar160._4_4_ = auVar39._4_4_ * fStack_a9c + 0.0;
                auVar160._8_4_ = auVar39._8_4_ * fStack_a98 + 0.0;
                auVar160._12_4_ = auVar39._12_4_ * aStack_a94.w + 0.0;
                auVar112._0_4_ = fVar211 * auVar269._0_4_ + fVar212 * auVar216._0_4_;
                auVar112._4_4_ = fVar105 * auVar269._4_4_ + fVar108 * auVar216._4_4_;
                auVar112._8_4_ = fVar239 * auVar269._8_4_ + fVar238 * auVar216._8_4_;
                auVar112._12_4_ = fVar186 * auVar269._12_4_ + fVar107 * auVar216._12_4_;
                local_600._0_16_ = auVar112;
                auVar39 = vsubps_avx(auVar160,auVar112);
                _local_820 = auVar39;
                auVar39 = vdpps_avx(auVar39,auVar39,0x7f);
                local_840._0_16_ = auVar39;
                if (auVar39._0_4_ < 0.0) {
                  local_a00._0_16_ = ZEXT416((uint)local_a00._0_4_);
                  local_a20._0_16_ = auVar269;
                  local_a40._0_16_ = auVar216;
                  fVar212 = sqrtf(auVar39._0_4_);
                  auVar216 = local_a40._0_16_;
                  auVar269 = local_a20._0_16_;
                }
                else {
                  auVar39 = vsqrtss_avx(auVar39,auVar39);
                  fVar212 = auVar39._0_4_;
                }
                auVar39 = vsubps_avx(auVar216,auVar269);
                auVar307._0_4_ = auVar39._0_4_ * 3.0;
                auVar307._4_4_ = auVar39._4_4_ * 3.0;
                auVar307._8_4_ = auVar39._8_4_ * 3.0;
                auVar307._12_4_ = auVar39._12_4_ * 3.0;
                auVar39 = vshufps_avx(ZEXT416((uint)(fVar260 * 6.0)),ZEXT416((uint)(fVar260 * 6.0)),
                                      0);
                auVar113 = ZEXT416((uint)(((float)local_a00._0_4_ - (fVar260 + fVar260)) * 6.0));
                auVar117 = vshufps_avx(auVar113,auVar113,0);
                auVar113 = ZEXT416((uint)((fVar260 -
                                          ((float)local_a00._0_4_ + (float)local_a00._0_4_)) * 6.0))
                ;
                auVar197 = vshufps_avx(auVar113,auVar113,0);
                auVar223 = vshufps_avx(ZEXT416((uint)((float)local_a00._0_4_ * 6.0)),
                                       ZEXT416((uint)((float)local_a00._0_4_ * 6.0)),0);
                auVar113 = vdpps_avx(auVar307,auVar307,0x7f);
                auVar161._0_4_ =
                     auVar223._0_4_ * (float)local_950._0_4_ +
                     auVar197._0_4_ * (float)local_970._0_4_ +
                     auVar39._0_4_ * (float)local_980._0_4_ +
                     auVar117._0_4_ * (float)local_960._0_4_;
                auVar161._4_4_ =
                     auVar223._4_4_ * (float)local_950._4_4_ +
                     auVar197._4_4_ * (float)local_970._4_4_ +
                     auVar39._4_4_ * (float)local_980._4_4_ +
                     auVar117._4_4_ * (float)local_960._4_4_;
                auVar161._8_4_ =
                     auVar223._8_4_ * fStack_948 +
                     auVar197._8_4_ * fStack_968 +
                     auVar39._8_4_ * fStack_978 + auVar117._8_4_ * fStack_958;
                auVar161._12_4_ =
                     auVar223._12_4_ * fStack_944 +
                     auVar197._12_4_ * fStack_964 +
                     auVar39._12_4_ * fStack_974 + auVar117._12_4_ * fStack_954;
                auVar39 = vblendps_avx(auVar113,_DAT_01f7aa10,0xe);
                auVar117 = vrsqrtss_avx(auVar39,auVar39);
                fVar238 = auVar117._0_4_;
                fVar108 = auVar113._0_4_;
                auVar117 = vdpps_avx(auVar307,auVar161,0x7f);
                auVar197 = vshufps_avx(auVar113,auVar113,0);
                auVar162._0_4_ = auVar161._0_4_ * auVar197._0_4_;
                auVar162._4_4_ = auVar161._4_4_ * auVar197._4_4_;
                auVar162._8_4_ = auVar161._8_4_ * auVar197._8_4_;
                auVar162._12_4_ = auVar161._12_4_ * auVar197._12_4_;
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar246._0_4_ = auVar307._0_4_ * auVar117._0_4_;
                auVar246._4_4_ = auVar307._4_4_ * auVar117._4_4_;
                auVar246._8_4_ = auVar307._8_4_ * auVar117._8_4_;
                auVar246._12_4_ = auVar307._12_4_ * auVar117._12_4_;
                auVar223 = vsubps_avx(auVar162,auVar246);
                auVar117 = vrcpss_avx(auVar39,auVar39);
                auVar39 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                     ZEXT416((uint)(auVar226._0_4_ * (float)local_780._0_4_)));
                auVar117 = ZEXT416((uint)(auVar117._0_4_ * (2.0 - fVar108 * auVar117._0_4_)));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                uVar93 = CONCAT44(auVar307._4_4_,auVar307._0_4_);
                auVar330._0_8_ = uVar93 ^ 0x8000000080000000;
                auVar330._8_4_ = -auVar307._8_4_;
                auVar330._12_4_ = -auVar307._12_4_;
                auVar197 = ZEXT416((uint)(fVar238 * 1.5 +
                                         fVar108 * -0.5 * fVar238 * fVar238 * fVar238));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar217._0_4_ = auVar197._0_4_ * auVar223._0_4_ * auVar117._0_4_;
                auVar217._4_4_ = auVar197._4_4_ * auVar223._4_4_ * auVar117._4_4_;
                auVar217._8_4_ = auVar197._8_4_ * auVar223._8_4_ * auVar117._8_4_;
                auVar217._12_4_ = auVar197._12_4_ * auVar223._12_4_ * auVar117._12_4_;
                local_a00._0_16_ = auVar307;
                local_760._0_4_ = auVar307._0_4_ * auVar197._0_4_;
                local_760._4_4_ = auVar307._4_4_ * auVar197._4_4_;
                local_760._8_4_ = auVar307._8_4_ * auVar197._8_4_;
                local_760._12_4_ = auVar307._12_4_ * auVar197._12_4_;
                if (fVar108 < 0.0) {
                  local_a20._0_4_ = fVar212;
                  local_a40._0_16_ = auVar330;
                  local_7a0._0_16_ = auVar217;
                  fVar108 = sqrtf(fVar108);
                  auVar217 = local_7a0._0_16_;
                  auVar330 = local_a40._0_16_;
                }
                else {
                  auVar113 = vsqrtss_avx(auVar113,auVar113);
                  fVar108 = auVar113._0_4_;
                  local_a20._0_4_ = fVar212;
                }
                auVar113 = vdpps_avx(_local_820,local_760._0_16_,0x7f);
                local_a40._0_4_ =
                     ((float)local_940._0_4_ / fVar108) * ((float)local_a20._0_4_ + 1.0) +
                     (float)local_a20._0_4_ * (float)local_940._0_4_ + auVar39._0_4_;
                auVar117 = vdpps_avx(auVar330,local_760._0_16_,0x7f);
                auVar197 = vdpps_avx(_local_820,auVar217,0x7f);
                auVar223 = vdpps_avx((undefined1  [16])aVar10,local_760._0_16_,0x7f);
                auVar115 = vdpps_avx(_local_820,auVar330,0x7f);
                fVar212 = auVar117._0_4_ + auVar197._0_4_;
                fVar108 = auVar113._0_4_;
                auVar114._0_4_ = fVar108 * fVar108;
                auVar114._4_4_ = auVar113._4_4_ * auVar113._4_4_;
                auVar114._8_4_ = auVar113._8_4_ * auVar113._8_4_;
                auVar114._12_4_ = auVar113._12_4_ * auVar113._12_4_;
                auVar197 = vsubps_avx(local_840._0_16_,auVar114);
                local_760._0_16_ = ZEXT416((uint)fVar212);
                auVar117 = vdpps_avx(_local_820,(undefined1  [16])aVar10,0x7f);
                fVar238 = auVar115._0_4_ - fVar108 * fVar212;
                local_a20._0_16_ = auVar113;
                fVar108 = auVar117._0_4_ - fVar108 * auVar223._0_4_;
                auVar113 = vrsqrtss_avx(auVar197,auVar197);
                fVar107 = auVar197._0_4_;
                fVar212 = auVar113._0_4_;
                fVar212 = fVar212 * 1.5 + fVar107 * -0.5 * fVar212 * fVar212 * fVar212;
                if (fVar107 < 0.0) {
                  local_7a0._0_16_ = auVar223;
                  local_640._0_4_ = fVar238;
                  local_660._0_4_ = fVar108;
                  local_7e0._0_4_ = fVar212;
                  fVar107 = sqrtf(fVar107);
                  fVar212 = (float)local_7e0._0_4_;
                  fVar238 = (float)local_640._0_4_;
                  fVar108 = (float)local_660._0_4_;
                  auVar223 = local_7a0._0_16_;
                }
                else {
                  auVar113 = vsqrtss_avx(auVar197,auVar197);
                  fVar107 = auVar113._0_4_;
                }
                auVar386 = ZEXT3264(local_9e0);
                auVar377 = ZEXT3264(local_9a0);
                auVar402 = ZEXT3264(local_920);
                auVar355 = ZEXT3264(local_8e0);
                auVar115 = vpermilps_avx(local_600._0_16_,0xff);
                auVar13 = vpermilps_avx(local_a00._0_16_,0xff);
                fVar238 = fVar238 * fVar212 - auVar13._0_4_;
                auVar247._0_8_ = auVar223._0_8_ ^ 0x8000000080000000;
                auVar247._8_4_ = auVar223._8_4_ ^ 0x80000000;
                auVar247._12_4_ = auVar223._12_4_ ^ 0x80000000;
                auVar270._0_4_ = -fVar238;
                auVar270._4_4_ = 0x80000000;
                auVar270._8_4_ = 0x80000000;
                auVar270._12_4_ = 0x80000000;
                auVar113 = vinsertps_avx(auVar270,ZEXT416((uint)(fVar108 * fVar212)),0x1c);
                auVar197 = vmovsldup_avx(ZEXT416((uint)(local_760._0_4_ * fVar108 * fVar212 -
                                                       auVar223._0_4_ * fVar238)));
                auVar113 = vdivps_avx(auVar113,auVar197);
                auVar117 = vinsertps_avx(local_760._0_16_,auVar247,0x10);
                auVar117 = vdivps_avx(auVar117,auVar197);
                auVar197 = vmovsldup_avx(local_a20._0_16_);
                auVar115 = ZEXT416((uint)(fVar107 - auVar115._0_4_));
                auVar223 = vmovsldup_avx(auVar115);
                auVar195._0_4_ = auVar197._0_4_ * auVar113._0_4_ + auVar223._0_4_ * auVar117._0_4_;
                auVar195._4_4_ = auVar197._4_4_ * auVar113._4_4_ + auVar223._4_4_ * auVar117._4_4_;
                auVar195._8_4_ = auVar197._8_4_ * auVar113._8_4_ + auVar223._8_4_ * auVar117._8_4_;
                auVar195._12_4_ =
                     auVar197._12_4_ * auVar113._12_4_ + auVar223._12_4_ * auVar117._12_4_;
                auVar226 = vsubps_avx(auVar226,auVar195);
                auVar196._8_4_ = 0x7fffffff;
                auVar196._0_8_ = 0x7fffffff7fffffff;
                auVar196._12_4_ = 0x7fffffff;
                auVar113 = vandps_avx(local_a20._0_16_,auVar196);
                auVar309 = local_860._0_28_;
                fVar238 = (float)local_7c0._4_4_;
                fVar107 = fStack_7b8;
                fVar211 = fStack_7b4;
                fVar105 = fStack_7b0;
                fVar239 = fStack_7ac;
                fVar186 = fStack_7a8;
                fVar108 = (float)local_7c0._0_4_;
                if (auVar113._0_4_ < (float)local_a40._0_4_) {
                  auVar218._8_4_ = 0x7fffffff;
                  auVar218._0_8_ = 0x7fffffff7fffffff;
                  auVar218._12_4_ = 0x7fffffff;
                  auVar113 = vandps_avx(auVar115,auVar218);
                  if (auVar113._0_4_ <
                      (float)local_680._0_4_ * 1.9073486e-06 +
                      (float)local_a40._0_4_ + auVar39._0_4_) {
                    fVar212 = auVar226._0_4_ + (float)local_730._0_4_;
                    auVar436 = ZEXT3264(local_900);
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar212) &&
                       (fVar240 = (ray->super_RayK<1>).tfar, fVar212 <= fVar240)) {
                      auVar226 = vmovshdup_avx(auVar226);
                      fVar241 = auVar226._0_4_;
                      if ((0.0 <= fVar241) && (fVar241 <= 1.0)) {
                        auVar226 = vrsqrtss_avx(local_840._0_16_,local_840._0_16_);
                        fVar242 = auVar226._0_4_;
                        pGVar30 = (context->scene->geometries).items[uVar97].ptr;
                        if ((pGVar30->mask & (ray->super_RayK<1>).mask) != 0) {
                          auVar226 = ZEXT416((uint)(fVar242 * 1.5 +
                                                   local_840._0_4_ * -0.5 * fVar242 *
                                                   fVar242 * fVar242));
                          auVar226 = vshufps_avx(auVar226,auVar226,0);
                          auVar219._0_4_ = auVar226._0_4_ * (float)local_820._0_4_;
                          auVar219._4_4_ = auVar226._4_4_ * (float)local_820._4_4_;
                          auVar219._8_4_ = auVar226._8_4_ * fStack_818;
                          auVar219._12_4_ = auVar226._12_4_ * fStack_814;
                          auVar163._0_4_ = local_a00._0_4_ + auVar13._0_4_ * auVar219._0_4_;
                          auVar163._4_4_ = local_a00._4_4_ + auVar13._4_4_ * auVar219._4_4_;
                          auVar163._8_4_ = local_a00._8_4_ + auVar13._8_4_ * auVar219._8_4_;
                          auVar163._12_4_ = local_a00._12_4_ + auVar13._12_4_ * auVar219._12_4_;
                          auVar226 = vshufps_avx(auVar219,auVar219,0xc9);
                          auVar39 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                          auVar220._0_4_ = auVar39._0_4_ * auVar219._0_4_;
                          auVar220._4_4_ = auVar39._4_4_ * auVar219._4_4_;
                          auVar220._8_4_ = auVar39._8_4_ * auVar219._8_4_;
                          auVar220._12_4_ = auVar39._12_4_ * auVar219._12_4_;
                          auVar248._0_4_ = local_a00._0_4_ * auVar226._0_4_;
                          auVar248._4_4_ = local_a00._4_4_ * auVar226._4_4_;
                          auVar248._8_4_ = local_a00._8_4_ * auVar226._8_4_;
                          auVar248._12_4_ = local_a00._12_4_ * auVar226._12_4_;
                          auVar113 = vsubps_avx(auVar248,auVar220);
                          auVar226 = vshufps_avx(auVar113,auVar113,0xc9);
                          auVar39 = vshufps_avx(auVar163,auVar163,0xc9);
                          auVar249._0_4_ = auVar39._0_4_ * auVar226._0_4_;
                          auVar249._4_4_ = auVar39._4_4_ * auVar226._4_4_;
                          auVar249._8_4_ = auVar39._8_4_ * auVar226._8_4_;
                          auVar249._12_4_ = auVar39._12_4_ * auVar226._12_4_;
                          auVar226 = vshufps_avx(auVar113,auVar113,0xd2);
                          auVar164._0_4_ = auVar163._0_4_ * auVar226._0_4_;
                          auVar164._4_4_ = auVar163._4_4_ * auVar226._4_4_;
                          auVar164._8_4_ = auVar163._8_4_ * auVar226._8_4_;
                          auVar164._12_4_ = auVar163._12_4_ * auVar226._12_4_;
                          auVar226 = vsubps_avx(auVar249,auVar164);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar212;
                            auVar39 = vshufps_avx(auVar226,auVar226,0xe9);
                            uVar9 = vmovlps_avx(auVar39);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                            (ray->Ng).field_0.field_0.z = auVar226._0_4_;
                            ray->u = fVar241;
                            ray->v = 0.0;
                            ray->primID = (uint)local_880;
                            ray->geomID = uVar97;
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            auVar39 = vshufps_avx(auVar226,auVar226,0xe9);
                            local_8b0 = vmovlps_avx(auVar39);
                            local_8a8 = auVar226._0_4_;
                            local_8a4 = fVar241;
                            local_8a0 = 0;
                            local_89c = (uint)local_880;
                            local_898 = uVar97;
                            local_894 = context->user->instID[0];
                            local_890 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar212;
                            local_5e0._0_4_ = 0xffffffff;
                            local_a78.valid = (int *)local_5e0;
                            local_a78.geometryUserPtr = pGVar30->userPtr;
                            local_a78.context = context->user;
                            local_a78.hit = (RTCHitN *)&local_8b0;
                            local_a78.N = 1;
                            local_a78.ray = (RTCRayN *)ray;
                            if ((pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                               ((*pGVar30->intersectionFilterN)(&local_a78), *local_a78.valid != 0))
                            {
                              p_Var34 = context->args->filter;
                              if ((p_Var34 != (RTCFilterFunctionN)0x0) &&
                                 ((((context->args->flags &
                                    RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                    RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                   (((pGVar30->field_8).field_0x2 & 0x40) != 0)) &&
                                  ((*p_Var34)(&local_a78), *local_a78.valid == 0))))
                              goto LAB_0110a6ae;
                              (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_a78.hit;
                              (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_a78.hit + 4);
                              (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_a78.hit + 8);
                              *(float *)((long)local_a78.ray + 0x3c) =
                                   *(float *)(local_a78.hit + 0xc);
                              *(float *)((long)local_a78.ray + 0x40) =
                                   *(float *)(local_a78.hit + 0x10);
                              *(float *)((long)local_a78.ray + 0x44) =
                                   *(float *)(local_a78.hit + 0x14);
                              *(float *)((long)local_a78.ray + 0x48) =
                                   *(float *)(local_a78.hit + 0x18);
                              *(float *)((long)local_a78.ray + 0x4c) =
                                   *(float *)(local_a78.hit + 0x1c);
                              *(float *)((long)local_a78.ray + 0x50) =
                                   *(float *)(local_a78.hit + 0x20);
                            }
                            else {
LAB_0110a6ae:
                              (ray->super_RayK<1>).tfar = fVar240;
                            }
                            auVar386 = ZEXT3264(local_9e0);
                            auVar436 = ZEXT3264(local_900);
                            auVar377 = ZEXT3264(local_9a0);
                            auVar402 = ZEXT3264(local_920);
                            auVar355 = ZEXT3264(local_8e0);
                            auVar309 = local_860._0_28_;
                            fVar108 = (float)local_7c0._0_4_;
                            fVar238 = (float)local_7c0._4_4_;
                            fVar107 = fStack_7b8;
                            fVar211 = fStack_7b4;
                            fVar105 = fStack_7b0;
                            fVar239 = fStack_7ac;
                            fVar186 = fStack_7a8;
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar98 = lVar98 + -1;
                auVar436 = ZEXT3264(local_900);
              } while (lVar98 != 0);
              auVar176 = local_480;
              fVar212 = (ray->super_RayK<1>).tfar;
              auVar129._4_4_ = fVar212;
              auVar129._0_4_ = fVar212;
              auVar129._8_4_ = fVar212;
              auVar129._12_4_ = fVar212;
              auVar129._16_4_ = fVar212;
              auVar129._20_4_ = fVar212;
              auVar129._24_4_ = fVar212;
              auVar129._28_4_ = fVar212;
              auVar120 = vcmpps_avx(_local_6e0,auVar129,2);
              fVar212 = auVar120._28_4_;
              local_480 = vandps_avx(auVar120,local_480);
              auVar317 = ZEXT3264(local_480);
              auVar176 = auVar176 & auVar120;
            } while ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar176 >> 0x7f,0) != '\0') ||
                       (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar176 >> 0xbf,0) != '\0') ||
                     (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar176[0x1f] < '\0');
            auVar317 = ZEXT3264(_local_440);
            local_7e0 = _local_440;
            fVar240 = (float)local_580._0_4_;
            fVar241 = (float)local_580._4_4_;
            fVar242 = fStack_578;
            fVar243 = fStack_574;
            fVar260 = fStack_570;
            fVar261 = fStack_56c;
            fVar262 = fStack_568;
            fVar263 = fStack_564;
          }
          auVar434 = ZEXT3264(local_9c0);
          auVar181._0_4_ =
               (float)local_500._0_4_ * (float)local_560._0_4_ +
               auVar309._0_4_ * (float)local_700._0_4_ + fVar108 * (float)local_720._0_4_;
          auVar181._4_4_ =
               (float)local_500._4_4_ * (float)local_560._4_4_ +
               auVar309._4_4_ * (float)local_700._4_4_ + fVar238 * (float)local_720._4_4_;
          auVar181._8_4_ =
               fStack_4f8 * fStack_558 + auVar309._8_4_ * fStack_6f8 + fVar107 * fStack_718;
          auVar181._12_4_ =
               fStack_4f4 * fStack_554 + auVar309._12_4_ * fStack_6f4 + fVar211 * fStack_714;
          auVar181._16_4_ =
               fStack_4f0 * fStack_550 + auVar309._16_4_ * fStack_6f0 + fVar105 * fStack_710;
          auVar181._20_4_ =
               fStack_4ec * fStack_54c + auVar309._20_4_ * fStack_6ec + fVar239 * fStack_70c;
          auVar181._24_4_ =
               fStack_4e8 * fStack_548 + auVar309._24_4_ * fStack_6e8 + fVar186 * fStack_708;
          auVar181._28_4_ = fStack_4e4 + fVar212 + auVar317._28_4_;
          auVar206._8_4_ = 0x7fffffff;
          auVar206._0_8_ = 0x7fffffff7fffffff;
          auVar206._12_4_ = 0x7fffffff;
          auVar206._16_4_ = 0x7fffffff;
          auVar206._20_4_ = 0x7fffffff;
          auVar206._24_4_ = 0x7fffffff;
          auVar206._28_4_ = 0x7fffffff;
          auVar120 = vandps_avx(auVar181,auVar206);
          auVar207._8_4_ = 0x3e99999a;
          auVar207._0_8_ = 0x3e99999a3e99999a;
          auVar207._12_4_ = 0x3e99999a;
          auVar207._16_4_ = 0x3e99999a;
          auVar207._20_4_ = 0x3e99999a;
          auVar207._24_4_ = 0x3e99999a;
          auVar207._28_4_ = 0x3e99999a;
          auVar120 = vcmpps_avx(auVar120,auVar207,1);
          auVar176 = vorps_avx(auVar120,_local_540);
          auVar208._0_4_ = (float)local_620._0_4_ + fVar240;
          auVar208._4_4_ = (float)local_620._4_4_ + fVar241;
          auVar208._8_4_ = fStack_618 + fVar242;
          auVar208._12_4_ = fStack_614 + fVar243;
          auVar208._16_4_ = fStack_610 + fVar260;
          auVar208._20_4_ = fStack_60c + fVar261;
          auVar208._24_4_ = fStack_608 + fVar262;
          auVar208._28_4_ = fStack_604 + fVar263;
          auVar120 = vcmpps_avx(auVar208,auVar129,2);
          _local_6e0 = vandps_avx(auVar120,_local_520);
          auVar209._8_4_ = 3;
          auVar209._0_8_ = 0x300000003;
          auVar209._12_4_ = 3;
          auVar209._16_4_ = 3;
          auVar209._20_4_ = 3;
          auVar209._24_4_ = 3;
          auVar209._28_4_ = 3;
          auVar237._8_4_ = 2;
          auVar237._0_8_ = 0x200000002;
          auVar237._12_4_ = 2;
          auVar237._16_4_ = 2;
          auVar237._20_4_ = 2;
          auVar237._24_4_ = 2;
          auVar237._28_4_ = 2;
          auVar120 = vblendvps_avx(auVar237,auVar209,auVar176);
          auVar226 = vpcmpgtd_avx(auVar120._16_16_,local_5c0._0_16_);
          auVar39 = vpshufd_avx(_local_5a0,0);
          auVar39 = vpcmpgtd_avx(auVar120._0_16_,auVar39);
          auVar210._16_16_ = auVar226;
          auVar210._0_16_ = auVar129._0_16_;
          _local_800 = vblendps_avx(ZEXT1632(auVar39),auVar210,0xf0);
          local_5e0 = vandnps_avx(_local_800,_local_6e0);
          auVar120 = _local_6e0 & ~_local_800;
          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar120 >> 0x7f,0) != '\0') ||
                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0xbf,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar120[0x1f] < '\0') {
            local_680._4_4_ = (float)local_620._4_4_ + local_440._4_4_;
            local_680._0_4_ = (float)local_620._0_4_ + local_440._0_4_;
            fStack_678 = fStack_618 + local_440._8_4_;
            fStack_674 = fStack_614 + local_440._12_4_;
            fStack_670 = fStack_610 + local_440._16_4_;
            fStack_66c = fStack_60c + local_440._20_4_;
            fStack_668 = fStack_608 + local_440._24_4_;
            fStack_664 = fStack_604 + local_440._28_4_;
            local_7e0 = _local_440;
            do {
              auVar131._8_4_ = 0x7f800000;
              auVar131._0_8_ = 0x7f8000007f800000;
              auVar131._12_4_ = 0x7f800000;
              auVar131._16_4_ = 0x7f800000;
              auVar131._20_4_ = 0x7f800000;
              auVar131._24_4_ = 0x7f800000;
              auVar131._28_4_ = 0x7f800000;
              auVar120 = vblendvps_avx(auVar131,local_7e0,local_5e0);
              auVar176 = vshufps_avx(auVar120,auVar120,0xb1);
              auVar176 = vminps_avx(auVar120,auVar176);
              auVar35 = vshufpd_avx(auVar176,auVar176,5);
              auVar176 = vminps_avx(auVar176,auVar35);
              auVar35 = vperm2f128_avx(auVar176,auVar176,1);
              auVar176 = vminps_avx(auVar176,auVar35);
              auVar176 = vcmpps_avx(auVar120,auVar176,0);
              auVar35 = local_5e0 & auVar176;
              auVar120 = local_5e0;
              if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar35 >> 0x7f,0) != '\0') ||
                    (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar35 >> 0xbf,0) != '\0') ||
                  (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar35[0x1f] < '\0') {
                auVar120 = vandps_avx(auVar176,local_5e0);
              }
              uVar92 = vmovmskps_avx(auVar120);
              uVar95 = 0;
              if (uVar92 != 0) {
                for (; (uVar92 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
                }
              }
              uVar93 = (ulong)uVar95;
              *(undefined4 *)(local_5e0 + uVar93 * 4) = 0;
              aVar12 = (ray->super_RayK<1>).dir.field_0;
              _local_940 = (undefined1  [16])aVar12;
              auVar226 = vdpps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0x7f);
              fVar212 = local_1c0[uVar93];
              uVar95 = *(uint *)(local_420 + uVar93 * 4);
              if (auVar226._0_4_ < 0.0) {
                fVar108 = sqrtf(auVar226._0_4_);
              }
              else {
                auVar226 = vsqrtss_avx(auVar226,auVar226);
                fVar108 = auVar226._0_4_;
              }
              auVar39 = vminps_avx(_local_950,_local_970);
              auVar226 = vmaxps_avx(_local_950,_local_970);
              auVar113 = vminps_avx(_local_960,_local_980);
              auVar117 = vminps_avx(auVar39,auVar113);
              auVar39 = vmaxps_avx(_local_960,_local_980);
              auVar113 = vmaxps_avx(auVar226,auVar39);
              auVar221._8_4_ = 0x7fffffff;
              auVar221._0_8_ = 0x7fffffff7fffffff;
              auVar221._12_4_ = 0x7fffffff;
              auVar226 = vandps_avx(auVar117,auVar221);
              auVar39 = vandps_avx(auVar113,auVar221);
              auVar226 = vmaxps_avx(auVar226,auVar39);
              auVar39 = vmovshdup_avx(auVar226);
              auVar39 = vmaxss_avx(auVar39,auVar226);
              auVar226 = vshufpd_avx(auVar226,auVar226,1);
              auVar226 = vmaxss_avx(auVar226,auVar39);
              local_840._0_4_ = auVar226._0_4_ * 1.9073486e-06;
              local_760._0_4_ = fVar108 * 1.9073486e-06;
              local_660._0_16_ = vshufps_avx(auVar113,auVar113,0xff);
              auVar226 = vinsertps_avx(ZEXT416(uVar95),ZEXT416((uint)fVar212),0x10);
              lVar98 = 5;
              do {
                auVar39 = vmovshdup_avx(auVar226);
                fVar260 = auVar39._0_4_;
                local_a00._0_4_ = 1.0 - fVar260;
                auVar39 = vshufps_avx(auVar226,auVar226,0x55);
                fVar212 = auVar39._0_4_;
                fVar108 = auVar39._4_4_;
                fVar238 = auVar39._8_4_;
                fVar107 = auVar39._12_4_;
                auVar39 = vshufps_avx(ZEXT416((uint)local_a00._0_4_),ZEXT416((uint)local_a00._0_4_),
                                      0);
                fVar211 = auVar39._0_4_;
                fVar105 = auVar39._4_4_;
                fVar239 = auVar39._8_4_;
                fVar186 = auVar39._12_4_;
                fVar240 = (float)local_960._0_4_ * fVar212 + (float)local_970._0_4_ * fVar211;
                fVar241 = (float)local_960._4_4_ * fVar108 + (float)local_970._4_4_ * fVar105;
                fVar242 = fStack_958 * fVar238 + fStack_968 * fVar239;
                fVar243 = fStack_954 * fVar107 + fStack_964 * fVar186;
                auVar271._0_4_ =
                     fVar211 * ((float)local_970._0_4_ * fVar212 + fVar211 * (float)local_950._0_4_)
                     + fVar212 * fVar240;
                auVar271._4_4_ =
                     fVar105 * ((float)local_970._4_4_ * fVar108 + fVar105 * (float)local_950._4_4_)
                     + fVar108 * fVar241;
                auVar271._8_4_ =
                     fVar239 * (fStack_968 * fVar238 + fVar239 * fStack_948) + fVar238 * fVar242;
                auVar271._12_4_ =
                     fVar186 * (fStack_964 * fVar107 + fVar186 * fStack_944) + fVar107 * fVar243;
                auVar222._0_4_ =
                     fVar211 * fVar240 +
                     fVar212 * (fVar212 * (float)local_980._0_4_ + (float)local_960._0_4_ * fVar211)
                ;
                auVar222._4_4_ =
                     fVar105 * fVar241 +
                     fVar108 * (fVar108 * (float)local_980._4_4_ + (float)local_960._4_4_ * fVar105)
                ;
                auVar222._8_4_ =
                     fVar239 * fVar242 + fVar238 * (fVar238 * fStack_978 + fStack_958 * fVar239);
                auVar222._12_4_ =
                     fVar186 * fVar243 + fVar107 * (fVar107 * fStack_974 + fStack_954 * fVar186);
                auVar39 = vshufps_avx(auVar226,auVar226,0);
                auVar165._0_4_ = auVar39._0_4_ * (float)local_940._0_4_ + 0.0;
                auVar165._4_4_ = auVar39._4_4_ * (float)local_940._4_4_ + 0.0;
                auVar165._8_4_ = auVar39._8_4_ * fStack_938 + 0.0;
                auVar165._12_4_ = auVar39._12_4_ * fStack_934 + 0.0;
                auVar116._0_4_ = fVar211 * auVar271._0_4_ + fVar212 * auVar222._0_4_;
                auVar116._4_4_ = fVar105 * auVar271._4_4_ + fVar108 * auVar222._4_4_;
                auVar116._8_4_ = fVar239 * auVar271._8_4_ + fVar238 * auVar222._8_4_;
                auVar116._12_4_ = fVar186 * auVar271._12_4_ + fVar107 * auVar222._12_4_;
                local_600._0_16_ = auVar116;
                auVar39 = vsubps_avx(auVar165,auVar116);
                _local_820 = auVar39;
                auVar39 = vdpps_avx(auVar39,auVar39,0x7f);
                fVar212 = auVar39._0_4_;
                if (fVar212 < 0.0) {
                  local_a00._0_16_ = ZEXT416((uint)local_a00._0_4_);
                  local_a20._0_16_ = auVar271;
                  local_a40._0_16_ = auVar222;
                  fVar108 = sqrtf(fVar212);
                  auVar222 = local_a40._0_16_;
                  auVar271 = local_a20._0_16_;
                }
                else {
                  auVar113 = vsqrtss_avx(auVar39,auVar39);
                  fVar108 = auVar113._0_4_;
                }
                auVar113 = vsubps_avx(auVar222,auVar271);
                auVar331._0_4_ = auVar113._0_4_ * 3.0;
                auVar331._4_4_ = auVar113._4_4_ * 3.0;
                auVar331._8_4_ = auVar113._8_4_ * 3.0;
                auVar331._12_4_ = auVar113._12_4_ * 3.0;
                auVar113 = vshufps_avx(ZEXT416((uint)(fVar260 * 6.0)),ZEXT416((uint)(fVar260 * 6.0))
                                       ,0);
                auVar117 = ZEXT416((uint)(((float)local_a00._0_4_ - (fVar260 + fVar260)) * 6.0));
                auVar197 = vshufps_avx(auVar117,auVar117,0);
                auVar117 = ZEXT416((uint)((fVar260 -
                                          ((float)local_a00._0_4_ + (float)local_a00._0_4_)) * 6.0))
                ;
                auVar223 = vshufps_avx(auVar117,auVar117,0);
                auVar115 = vshufps_avx(ZEXT416((uint)((float)local_a00._0_4_ * 6.0)),
                                       ZEXT416((uint)((float)local_a00._0_4_ * 6.0)),0);
                auVar117 = vdpps_avx(auVar331,auVar331,0x7f);
                auVar166._0_4_ =
                     auVar115._0_4_ * (float)local_950._0_4_ +
                     auVar223._0_4_ * (float)local_970._0_4_ +
                     auVar113._0_4_ * (float)local_980._0_4_ +
                     auVar197._0_4_ * (float)local_960._0_4_;
                auVar166._4_4_ =
                     auVar115._4_4_ * (float)local_950._4_4_ +
                     auVar223._4_4_ * (float)local_970._4_4_ +
                     auVar113._4_4_ * (float)local_980._4_4_ +
                     auVar197._4_4_ * (float)local_960._4_4_;
                auVar166._8_4_ =
                     auVar115._8_4_ * fStack_948 +
                     auVar223._8_4_ * fStack_968 +
                     auVar113._8_4_ * fStack_978 + auVar197._8_4_ * fStack_958;
                auVar166._12_4_ =
                     auVar115._12_4_ * fStack_944 +
                     auVar223._12_4_ * fStack_964 +
                     auVar113._12_4_ * fStack_974 + auVar197._12_4_ * fStack_954;
                auVar113 = vblendps_avx(auVar117,_DAT_01f7aa10,0xe);
                auVar197 = vrsqrtss_avx(auVar113,auVar113);
                fVar107 = auVar197._0_4_;
                fVar238 = auVar117._0_4_;
                auVar197 = vdpps_avx(auVar331,auVar166,0x7f);
                auVar223 = vshufps_avx(auVar117,auVar117,0);
                auVar167._0_4_ = auVar166._0_4_ * auVar223._0_4_;
                auVar167._4_4_ = auVar166._4_4_ * auVar223._4_4_;
                auVar167._8_4_ = auVar166._8_4_ * auVar223._8_4_;
                auVar167._12_4_ = auVar166._12_4_ * auVar223._12_4_;
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar250._0_4_ = auVar331._0_4_ * auVar197._0_4_;
                auVar250._4_4_ = auVar331._4_4_ * auVar197._4_4_;
                auVar250._8_4_ = auVar331._8_4_ * auVar197._8_4_;
                auVar250._12_4_ = auVar331._12_4_ * auVar197._12_4_;
                auVar115 = vsubps_avx(auVar167,auVar250);
                auVar197 = vrcpss_avx(auVar113,auVar113);
                auVar113 = vmaxss_avx(ZEXT416((uint)local_840._0_4_),
                                      ZEXT416((uint)(auVar226._0_4_ * (float)local_760._0_4_)));
                auVar197 = ZEXT416((uint)(auVar197._0_4_ * (2.0 - fVar238 * auVar197._0_4_)));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                uVar93 = CONCAT44(auVar331._4_4_,auVar331._0_4_);
                auVar357._0_8_ = uVar93 ^ 0x8000000080000000;
                auVar357._8_4_ = -auVar331._8_4_;
                auVar357._12_4_ = -auVar331._12_4_;
                auVar223 = ZEXT416((uint)(fVar107 * 1.5 +
                                         fVar238 * -0.5 * fVar107 * fVar107 * fVar107));
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                auVar224._0_4_ = auVar223._0_4_ * auVar115._0_4_ * auVar197._0_4_;
                auVar224._4_4_ = auVar223._4_4_ * auVar115._4_4_ * auVar197._4_4_;
                auVar224._8_4_ = auVar223._8_4_ * auVar115._8_4_ * auVar197._8_4_;
                auVar224._12_4_ = auVar223._12_4_ * auVar115._12_4_ * auVar197._12_4_;
                auVar308._0_4_ = auVar331._0_4_ * auVar223._0_4_;
                auVar308._4_4_ = auVar331._4_4_ * auVar223._4_4_;
                auVar308._8_4_ = auVar331._8_4_ * auVar223._8_4_;
                auVar308._12_4_ = auVar331._12_4_ * auVar223._12_4_;
                local_a00._0_16_ = auVar331;
                if (fVar238 < 0.0) {
                  local_a20._0_4_ = fVar108;
                  local_a40._0_16_ = auVar357;
                  local_780._0_16_ = auVar308;
                  local_860._0_16_ = auVar224;
                  fVar238 = sqrtf(fVar238);
                  auVar224 = local_860._0_16_;
                  auVar308 = local_780._0_16_;
                  auVar357 = local_a40._0_16_;
                }
                else {
                  auVar117 = vsqrtss_avx(auVar117,auVar117);
                  fVar238 = auVar117._0_4_;
                  local_a20._0_4_ = fVar108;
                }
                auVar117 = vdpps_avx(_local_820,auVar308,0x7f);
                local_a40._0_4_ =
                     ((float)local_840._0_4_ / fVar238) * ((float)local_a20._0_4_ + 1.0) +
                     (float)local_a20._0_4_ * (float)local_840._0_4_ + auVar113._0_4_;
                auVar197 = vdpps_avx(auVar357,auVar308,0x7f);
                auVar223 = vdpps_avx(_local_820,auVar224,0x7f);
                auVar115 = vdpps_avx(_local_940,auVar308,0x7f);
                auVar13 = vdpps_avx(_local_820,auVar357,0x7f);
                fVar108 = auVar197._0_4_ + auVar223._0_4_;
                fVar238 = auVar117._0_4_;
                auVar118._0_4_ = fVar238 * fVar238;
                auVar118._4_4_ = auVar117._4_4_ * auVar117._4_4_;
                auVar118._8_4_ = auVar117._8_4_ * auVar117._8_4_;
                auVar118._12_4_ = auVar117._12_4_ * auVar117._12_4_;
                auVar223 = vsubps_avx(auVar39,auVar118);
                auVar197 = vdpps_avx(_local_820,_local_940,0x7f);
                fVar107 = auVar13._0_4_ - fVar108 * fVar238;
                local_a20._0_16_ = auVar117;
                fVar211 = auVar197._0_4_ - fVar238 * auVar115._0_4_;
                auVar117 = vrsqrtss_avx(auVar223,auVar223);
                fVar105 = auVar223._0_4_;
                fVar238 = auVar117._0_4_;
                fVar238 = fVar238 * 1.5 + fVar105 * -0.5 * fVar238 * fVar238 * fVar238;
                if (fVar105 < 0.0) {
                  local_780._0_16_ = auVar115;
                  local_860._0_16_ = ZEXT416((uint)fVar108);
                  local_7c0._0_4_ = fVar107;
                  local_7a0._0_4_ = fVar211;
                  local_640._0_4_ = fVar238;
                  fVar105 = sqrtf(fVar105);
                  fVar238 = (float)local_640._0_4_;
                  fVar107 = (float)local_7c0._0_4_;
                  fVar211 = (float)local_7a0._0_4_;
                  auVar115 = local_780._0_16_;
                  auVar117 = local_860._0_16_;
                }
                else {
                  auVar117 = vsqrtss_avx(auVar223,auVar223);
                  fVar105 = auVar117._0_4_;
                  auVar117 = ZEXT416((uint)fVar108);
                }
                auVar434 = ZEXT3264(local_9c0);
                auVar386 = ZEXT3264(local_9e0);
                auVar436 = ZEXT3264(local_900);
                auVar377 = ZEXT3264(local_9a0);
                auVar402 = ZEXT3264(local_920);
                auVar355 = ZEXT3264(local_8e0);
                auVar119 = vpermilps_avx(local_600._0_16_,0xff);
                auVar13 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
                fVar108 = fVar107 * fVar238 - auVar13._0_4_;
                auVar251._0_8_ = auVar115._0_8_ ^ 0x8000000080000000;
                auVar251._8_4_ = auVar115._8_4_ ^ 0x80000000;
                auVar251._12_4_ = auVar115._12_4_ ^ 0x80000000;
                auVar272._0_4_ = -fVar108;
                auVar272._4_4_ = 0x80000000;
                auVar272._8_4_ = 0x80000000;
                auVar272._12_4_ = 0x80000000;
                auVar197 = vinsertps_avx(auVar272,ZEXT416((uint)(fVar211 * fVar238)),0x1c);
                auVar223 = vmovsldup_avx(ZEXT416((uint)(auVar117._0_4_ * fVar211 * fVar238 -
                                                       auVar115._0_4_ * fVar108)));
                auVar197 = vdivps_avx(auVar197,auVar223);
                auVar117 = vinsertps_avx(auVar117,auVar251,0x10);
                auVar117 = vdivps_avx(auVar117,auVar223);
                auVar223 = vmovsldup_avx(local_a20._0_16_);
                auVar119 = ZEXT416((uint)(fVar105 - auVar119._0_4_));
                auVar115 = vmovsldup_avx(auVar119);
                auVar198._0_4_ = auVar223._0_4_ * auVar197._0_4_ + auVar115._0_4_ * auVar117._0_4_;
                auVar198._4_4_ = auVar223._4_4_ * auVar197._4_4_ + auVar115._4_4_ * auVar117._4_4_;
                auVar198._8_4_ = auVar223._8_4_ * auVar197._8_4_ + auVar115._8_4_ * auVar117._8_4_;
                auVar198._12_4_ =
                     auVar223._12_4_ * auVar197._12_4_ + auVar115._12_4_ * auVar117._12_4_;
                auVar226 = vsubps_avx(auVar226,auVar198);
                auVar199._8_4_ = 0x7fffffff;
                auVar199._0_8_ = 0x7fffffff7fffffff;
                auVar199._12_4_ = 0x7fffffff;
                auVar117 = vandps_avx(local_a20._0_16_,auVar199);
                if (auVar117._0_4_ < (float)local_a40._0_4_) {
                  auVar225._8_4_ = 0x7fffffff;
                  auVar225._0_8_ = 0x7fffffff7fffffff;
                  auVar225._12_4_ = 0x7fffffff;
                  auVar117 = vandps_avx(auVar119,auVar225);
                  if (auVar117._0_4_ <
                      (float)local_660._0_4_ * 1.9073486e-06 +
                      (float)local_a40._0_4_ + auVar113._0_4_) {
                    fVar108 = auVar226._0_4_ + (float)local_730._0_4_;
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar108) &&
                       (fVar238 = (ray->super_RayK<1>).tfar, fVar108 <= fVar238)) {
                      auVar226 = vmovshdup_avx(auVar226);
                      fVar107 = auVar226._0_4_;
                      if ((0.0 <= fVar107) && (fVar107 <= 1.0)) {
                        auVar226 = vrsqrtss_avx(auVar39,auVar39);
                        fVar211 = auVar226._0_4_;
                        pGVar30 = (context->scene->geometries).items[uVar97].ptr;
                        if ((pGVar30->mask & (ray->super_RayK<1>).mask) != 0) {
                          auVar226 = ZEXT416((uint)(fVar211 * 1.5 +
                                                   fVar212 * -0.5 * fVar211 * fVar211 * fVar211));
                          auVar226 = vshufps_avx(auVar226,auVar226,0);
                          auVar227._0_4_ = auVar226._0_4_ * (float)local_820._0_4_;
                          auVar227._4_4_ = auVar226._4_4_ * (float)local_820._4_4_;
                          auVar227._8_4_ = auVar226._8_4_ * fStack_818;
                          auVar227._12_4_ = auVar226._12_4_ * fStack_814;
                          auVar168._0_4_ = local_a00._0_4_ + auVar13._0_4_ * auVar227._0_4_;
                          auVar168._4_4_ = local_a00._4_4_ + auVar13._4_4_ * auVar227._4_4_;
                          auVar168._8_4_ = local_a00._8_4_ + auVar13._8_4_ * auVar227._8_4_;
                          auVar168._12_4_ = local_a00._12_4_ + auVar13._12_4_ * auVar227._12_4_;
                          auVar226 = vshufps_avx(auVar227,auVar227,0xc9);
                          auVar39 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                          auVar228._0_4_ = auVar39._0_4_ * auVar227._0_4_;
                          auVar228._4_4_ = auVar39._4_4_ * auVar227._4_4_;
                          auVar228._8_4_ = auVar39._8_4_ * auVar227._8_4_;
                          auVar228._12_4_ = auVar39._12_4_ * auVar227._12_4_;
                          auVar252._0_4_ = local_a00._0_4_ * auVar226._0_4_;
                          auVar252._4_4_ = local_a00._4_4_ * auVar226._4_4_;
                          auVar252._8_4_ = local_a00._8_4_ * auVar226._8_4_;
                          auVar252._12_4_ = local_a00._12_4_ * auVar226._12_4_;
                          auVar113 = vsubps_avx(auVar252,auVar228);
                          auVar226 = vshufps_avx(auVar113,auVar113,0xc9);
                          auVar39 = vshufps_avx(auVar168,auVar168,0xc9);
                          auVar253._0_4_ = auVar39._0_4_ * auVar226._0_4_;
                          auVar253._4_4_ = auVar39._4_4_ * auVar226._4_4_;
                          auVar253._8_4_ = auVar39._8_4_ * auVar226._8_4_;
                          auVar253._12_4_ = auVar39._12_4_ * auVar226._12_4_;
                          auVar226 = vshufps_avx(auVar113,auVar113,0xd2);
                          auVar169._0_4_ = auVar168._0_4_ * auVar226._0_4_;
                          auVar169._4_4_ = auVar168._4_4_ * auVar226._4_4_;
                          auVar169._8_4_ = auVar168._8_4_ * auVar226._8_4_;
                          auVar169._12_4_ = auVar168._12_4_ * auVar226._12_4_;
                          auVar226 = vsubps_avx(auVar253,auVar169);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar108;
                            auVar39 = vshufps_avx(auVar226,auVar226,0xe9);
                            uVar9 = vmovlps_avx(auVar39);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                            (ray->Ng).field_0.field_0.z = auVar226._0_4_;
                            ray->u = fVar107;
                            ray->v = 0.0;
                            ray->primID = (uint)local_880;
                            ray->geomID = uVar97;
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            auVar39 = vshufps_avx(auVar226,auVar226,0xe9);
                            local_8b0 = vmovlps_avx(auVar39);
                            local_8a8 = auVar226._0_4_;
                            local_8a4 = fVar107;
                            local_8a0 = 0;
                            local_89c = (uint)local_880;
                            local_898 = uVar97;
                            local_894 = context->user->instID[0];
                            local_890 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar108;
                            local_a44 = -1;
                            local_a78.valid = &local_a44;
                            local_a78.geometryUserPtr = pGVar30->userPtr;
                            local_a78.context = context->user;
                            local_a78.hit = (RTCHitN *)&local_8b0;
                            local_a78.N = 1;
                            local_a78.ray = (RTCRayN *)ray;
                            if ((pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                               ((*pGVar30->intersectionFilterN)(&local_a78), *local_a78.valid != 0))
                            {
                              p_Var34 = context->args->filter;
                              if ((p_Var34 != (RTCFilterFunctionN)0x0) &&
                                 ((((context->args->flags &
                                    RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                    RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                   (((pGVar30->field_8).field_0x2 & 0x40) != 0)) &&
                                  ((*p_Var34)(&local_a78), *local_a78.valid == 0))))
                              goto LAB_0110b16a;
                              (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_a78.hit;
                              (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_a78.hit + 4);
                              (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_a78.hit + 8);
                              *(float *)((long)local_a78.ray + 0x3c) =
                                   *(float *)(local_a78.hit + 0xc);
                              *(float *)((long)local_a78.ray + 0x40) =
                                   *(float *)(local_a78.hit + 0x10);
                              *(float *)((long)local_a78.ray + 0x44) =
                                   *(float *)(local_a78.hit + 0x14);
                              *(float *)((long)local_a78.ray + 0x48) =
                                   *(float *)(local_a78.hit + 0x18);
                              *(float *)((long)local_a78.ray + 0x4c) =
                                   *(float *)(local_a78.hit + 0x1c);
                              *(float *)((long)local_a78.ray + 0x50) =
                                   *(float *)(local_a78.hit + 0x20);
                            }
                            else {
LAB_0110b16a:
                              (ray->super_RayK<1>).tfar = fVar238;
                            }
                            auVar434 = ZEXT3264(local_9c0);
                            auVar386 = ZEXT3264(local_9e0);
                            auVar436 = ZEXT3264(local_900);
                            auVar377 = ZEXT3264(local_9a0);
                            auVar402 = ZEXT3264(local_920);
                            auVar355 = ZEXT3264(local_8e0);
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar98 = lVar98 + -1;
              } while (lVar98 != 0);
              auVar176 = local_5e0;
              fVar212 = (ray->super_RayK<1>).tfar;
              auVar129._4_4_ = fVar212;
              auVar129._0_4_ = fVar212;
              auVar129._8_4_ = fVar212;
              auVar129._12_4_ = fVar212;
              auVar129._16_4_ = fVar212;
              auVar129._20_4_ = fVar212;
              auVar129._24_4_ = fVar212;
              auVar129._28_4_ = fVar212;
              auVar120 = vcmpps_avx(_local_680,auVar129,2);
              local_5e0 = vandps_avx(auVar120,local_5e0);
              auVar176 = auVar176 & auVar120;
            } while ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar176 >> 0x7f,0) != '\0') ||
                       (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar176 >> 0xbf,0) != '\0') ||
                     (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar176[0x1f] < '\0');
          }
          auVar344 = ZEXT3264(_local_440);
          auVar120 = vandps_avx(local_4e0,local_4c0);
          auVar176 = vandps_avx(_local_6e0,_local_800);
          auVar317 = ZEXT3264(_local_620);
          auVar258._0_4_ = local_620._0_4_ + local_400._0_4_;
          auVar258._4_4_ = local_620._4_4_ + local_400._4_4_;
          auVar258._8_4_ = local_620._8_4_ + local_400._8_4_;
          auVar258._12_4_ = local_620._12_4_ + local_400._12_4_;
          auVar258._16_4_ = local_620._16_4_ + local_400._16_4_;
          auVar258._20_4_ = local_620._20_4_ + local_400._20_4_;
          auVar258._24_4_ = local_620._24_4_ + local_400._24_4_;
          auVar258._28_4_ = local_620._28_4_ + local_400._28_4_;
          auVar35 = vcmpps_avx(auVar258,auVar129,2);
          auVar120 = vandps_avx(auVar35,auVar120);
          auVar259._0_4_ = local_620._0_4_ + local_440._0_4_;
          auVar259._4_4_ = local_620._4_4_ + local_440._4_4_;
          auVar259._8_4_ = local_620._8_4_ + local_440._8_4_;
          auVar259._12_4_ = local_620._12_4_ + local_440._12_4_;
          auVar259._16_4_ = local_620._16_4_ + local_440._16_4_;
          auVar259._20_4_ = local_620._20_4_ + local_440._20_4_;
          auVar259._24_4_ = local_620._24_4_ + local_440._24_4_;
          auVar259._28_4_ = local_620._28_4_ + local_440._28_4_;
          auVar35 = vcmpps_avx(auVar259,auVar129,2);
          auVar176 = vandps_avx(auVar35,auVar176);
          auVar176 = vorps_avx(auVar120,auVar176);
          if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar176 >> 0x7f,0) != '\0') ||
                (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar176 >> 0xbf,0) != '\0') ||
              (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar176[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar102 * 0x60) = auVar176;
            auVar120 = vblendvps_avx(_local_440,local_400,auVar120);
            *(undefined1 (*) [32])(auStack_160 + uVar102 * 0x60) = auVar120;
            uVar9 = vmovlps_avx(local_450);
            (&uStack_140)[uVar102 * 0xc] = uVar9;
            aiStack_138[uVar102 * 0x18] = local_aec + 1;
            iVar101 = iVar101 + 1;
          }
          goto LAB_01109adb;
        }
      }
      auVar436 = ZEXT3264(local_900);
      auVar434 = ZEXT3264(local_9c0);
      auVar386 = ZEXT3264(local_9e0);
      auVar377 = ZEXT3264(local_9a0);
      auVar317 = ZEXT3264(auVar316);
      auVar344 = ZEXT3264(auVar176);
      auVar402 = ZEXT3264(local_920);
      auVar355 = ZEXT3264(local_8e0);
    }
LAB_01109adb:
    auVar311 = local_3a0;
    fVar212 = (ray->super_RayK<1>).tfar;
    auVar126._4_4_ = fVar212;
    auVar126._0_4_ = fVar212;
    auVar126._8_4_ = fVar212;
    auVar126._12_4_ = fVar212;
    auVar126._16_4_ = fVar212;
    auVar126._20_4_ = fVar212;
    auVar126._24_4_ = fVar212;
    auVar126._28_4_ = fVar212;
    if (iVar101 == 0) break;
    uVar95 = -iVar101;
    pauVar94 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar101 - 1) * 0x60);
    while( true ) {
      auVar120 = pauVar94[1];
      auVar175._0_4_ = auVar120._0_4_ + (float)local_620._0_4_;
      auVar175._4_4_ = auVar120._4_4_ + (float)local_620._4_4_;
      auVar175._8_4_ = auVar120._8_4_ + fStack_618;
      auVar175._12_4_ = auVar120._12_4_ + fStack_614;
      auVar175._16_4_ = auVar120._16_4_ + fStack_610;
      auVar175._20_4_ = auVar120._20_4_ + fStack_60c;
      auVar175._24_4_ = auVar120._24_4_ + fStack_608;
      auVar175._28_4_ = auVar120._28_4_ + fStack_604;
      auVar35 = vcmpps_avx(auVar175,auVar126,2);
      auVar176 = vandps_avx(auVar35,*pauVar94);
      local_400 = auVar176;
      auVar35 = *pauVar94 & auVar35;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0x7f,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0xbf,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar35[0x1f] < '\0') break;
      pauVar94 = pauVar94 + -3;
      uVar95 = uVar95 + 1;
      if (uVar95 == 0) goto LAB_0110b37a;
    }
    auVar127._8_4_ = 0x7f800000;
    auVar127._0_8_ = 0x7f8000007f800000;
    auVar127._12_4_ = 0x7f800000;
    auVar127._16_4_ = 0x7f800000;
    auVar127._20_4_ = 0x7f800000;
    auVar127._24_4_ = 0x7f800000;
    auVar127._28_4_ = 0x7f800000;
    auVar120 = vblendvps_avx(auVar127,auVar120,auVar176);
    auVar35 = vshufps_avx(auVar120,auVar120,0xb1);
    auVar35 = vminps_avx(auVar120,auVar35);
    auVar36 = vshufpd_avx(auVar35,auVar35,5);
    auVar35 = vminps_avx(auVar35,auVar36);
    auVar36 = vperm2f128_avx(auVar35,auVar35,1);
    auVar35 = vminps_avx(auVar35,auVar36);
    auVar120 = vcmpps_avx(auVar120,auVar35,0);
    auVar35 = auVar176 & auVar120;
    if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0x7f,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar35 >> 0xbf,0) != '\0') ||
        (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar35[0x1f] < '\0')
    {
      auVar176 = vandps_avx(auVar120,auVar176);
    }
    auVar111._8_8_ = 0;
    auVar111._0_8_ = *(ulong *)pauVar94[2];
    local_aec = *(uint *)(pauVar94[2] + 8);
    uVar96 = vmovmskps_avx(auVar176);
    uVar92 = 0;
    if (uVar96 != 0) {
      for (; (uVar96 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
      }
    }
    *(undefined4 *)(local_400 + (ulong)uVar92 * 4) = 0;
    *pauVar94 = local_400;
    uVar96 = ~uVar95;
    if ((((((((local_400 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_400 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_400 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_400 >> 0x7f,0) != '\0') ||
          (local_400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_400 >> 0xbf,0) != '\0') ||
        (local_400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_400[0x1f] < '\0') {
      uVar96 = -uVar95;
    }
    uVar102 = (ulong)uVar96;
    auVar226 = vshufps_avx(auVar111,auVar111,0);
    auVar39 = vshufps_avx(auVar111,auVar111,0x55);
    auVar39 = vsubps_avx(auVar39,auVar226);
    local_440._4_4_ = auVar226._4_4_ + auVar39._4_4_ * 0.14285715;
    local_440._0_4_ = auVar226._0_4_ + auVar39._0_4_ * 0.0;
    fStack_438 = auVar226._8_4_ + auVar39._8_4_ * 0.2857143;
    fStack_434 = auVar226._12_4_ + auVar39._12_4_ * 0.42857146;
    fStack_430 = auVar226._0_4_ + auVar39._0_4_ * 0.5714286;
    fStack_42c = auVar226._4_4_ + auVar39._4_4_ * 0.71428573;
    fStack_428 = auVar226._8_4_ + auVar39._8_4_ * 0.8571429;
    fStack_424 = auVar226._12_4_ + auVar39._12_4_;
    local_450._8_8_ = 0;
    local_450._0_8_ = *(ulong *)(local_440 + (ulong)uVar92 * 4);
    uVar93 = local_880;
  } while( true );
LAB_0110b37a:
  auVar120 = vcmpps_avx(local_320,auVar126,2);
  uVar97 = vmovmskps_avx(auVar120);
  uVar91 = uVar91 - 1 & uVar91 & uVar97;
  if (uVar91 == 0) {
    return;
  }
  goto LAB_011089cd;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }